

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1P3L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float *pfVar1;
  float *pfVar2;
  iterator __position;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  SrcEvaluatorType srcEvaluator;
  CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *pCVar15;
  ostream *poVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  Scalar SVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float tx;
  DstEvaluatorType dstEvaluator_2;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_4,_4,_0,_4,_4> transOut;
  float b;
  float a;
  float ty;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_6,_1,_0,_6,_1> L32;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Matrix<float,_6,_6,_0,_6,_6> TK;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  Matrix<float,_6,_6,_0,_6,_6> TL;
  Matrix<float,_4,_4,_0,_4,_4> TV;
  float local_19ec;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  undefined1 local_19c8 [8];
  float fStack_19c0;
  float fStack_19bc;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float local_19a8;
  float fStack_19a4;
  float fStack_19a0;
  float fStack_199c;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  float local_1988;
  float fStack_1984;
  float fStack_1980;
  float fStack_197c;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  float local_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float local_1928;
  float fStack_1924;
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float local_18e8;
  float fStack_18e4;
  float fStack_18e0;
  float fStack_18dc;
  float local_18cc;
  float local_18c8;
  undefined4 uStack_18c4;
  undefined4 uStack_18c0;
  undefined4 uStack_18bc;
  undefined1 local_18b8 [8];
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [8];
  float fStack_18a0;
  float fStack_189c;
  undefined1 local_1898 [8];
  float fStack_1890;
  float fStack_188c;
  undefined1 local_1888 [8];
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  undefined1 local_1858 [8];
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_1808;
  float fStack_1804;
  float fStack_1800;
  float fStack_17fc;
  float local_17f8;
  undefined4 uStack_17f4;
  undefined4 uStack_17f0;
  undefined4 uStack_17ec;
  float local_17e8;
  float fStack_17e4;
  float fStack_17e0;
  float fStack_17dc;
  float local_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_17a8;
  float fStack_17a4;
  float fStack_17a0;
  float fStack_179c;
  undefined1 local_1798 [8];
  float fStack_1790;
  float fStack_178c;
  vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>> *local_1788;
  float local_1780;
  float local_177c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  undefined4 uStack_16f4;
  undefined4 uStack_16f0;
  undefined4 uStack_16ec;
  undefined1 local_16e8 [8];
  float fStack_16e0;
  float fStack_16dc;
  undefined1 local_16d8 [8];
  float fStack_16d0;
  float fStack_16cc;
  plainobjectbase_evaluator_data<float,_3> local_16c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_16c0;
  undefined1 local_16b8 [16];
  float local_16a8;
  float fStack_16a4;
  float fStack_16a0;
  float fStack_169c;
  float local_1698;
  undefined1 local_1688 [8];
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  float fStack_1650;
  float fStack_164c;
  float local_1648;
  float fStack_1644;
  float fStack_1640;
  float fStack_163c;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float local_1628;
  float fStack_1624;
  float fStack_1620;
  float fStack_161c;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float local_1608;
  float fStack_1604;
  float fStack_1600;
  float fStack_15fc;
  float local_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  float local_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  undefined1 local_15b8 [8];
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_1578;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_1570;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *pgStack_1568;
  undefined8 local_1560;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_1558;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_1550;
  undefined8 local_1540;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float local_1528;
  undefined4 uStack_1524;
  undefined4 uStack_1520;
  undefined4 uStack_151c;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_1508;
  float fStack_1504;
  float fStack_1500;
  float fStack_14fc;
  float local_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float local_14e8;
  float fStack_14e4;
  float fStack_14e0;
  float fStack_14dc;
  float local_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float local_14c8;
  float fStack_14c4;
  float fStack_14c0;
  float fStack_14bc;
  float local_14b8;
  undefined4 uStack_14b4;
  undefined4 uStack_14b0;
  undefined4 uStack_14ac;
  float local_14a8;
  float fStack_14a4;
  float fStack_14a0;
  float fStack_149c;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float local_1488;
  float fStack_1484;
  float fStack_1480;
  float fStack_147c;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float local_1468;
  undefined1 auStack_1464 [12];
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_1428;
  float fStack_1424;
  float fStack_1420;
  float fStack_141c;
  float local_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float local_1408;
  undefined4 uStack_1404;
  undefined4 uStack_1400;
  undefined4 uStack_13fc;
  float local_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  undefined4 uStack_1374;
  undefined4 uStack_1370;
  undefined4 uStack_136c;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  undefined4 uStack_1304;
  undefined4 uStack_1300;
  undefined4 uStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  Scalar local_1288;
  Scalar local_1284;
  Scalar local_1280;
  Scalar local_127c;
  Scalar local_1278;
  Scalar local_1274;
  Scalar local_1270;
  Scalar local_126c;
  Scalar local_1268;
  float local_1264;
  float local_1260;
  float local_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined1 local_1058 [8];
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float local_f48;
  float fStack_f44;
  float fStack_f40;
  float fStack_f3c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float local_ee8;
  float fStack_ee4;
  float fStack_ee0;
  float fStack_edc;
  float local_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float local_ec8;
  float fStack_ec4;
  float fStack_ec0;
  float fStack_ebc;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  undefined1 local_e48 [8];
  float fStack_e40;
  float fStack_e3c;
  float local_e38;
  float local_e34;
  undefined1 local_e28 [8];
  float fStack_e20;
  float fStack_e1c;
  float local_e18;
  float local_e14;
  undefined1 local_e08 [8];
  float fStack_e00;
  float fStack_dfc;
  float local_df8;
  float local_df4;
  undefined1 local_de8 [8];
  float fStack_de0;
  float fStack_ddc;
  float local_dd8;
  float local_dd4;
  undefined1 local_dc8 [8];
  float fStack_dc0;
  float fStack_dbc;
  float local_db8;
  float local_db4;
  undefined1 local_da8 [8];
  float fStack_da0;
  float fStack_d9c;
  float local_d98;
  float local_d94;
  float local_d88;
  undefined4 uStack_d84;
  undefined4 uStack_d80;
  undefined4 uStack_d7c;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float local_d68;
  float fStack_d64;
  float fStack_d60;
  float fStack_d5c;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  float local_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float local_c48;
  undefined4 uStack_c44;
  undefined4 uStack_c40;
  undefined4 uStack_c3c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float local_bc8;
  float fStack_bc4;
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b78;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  undefined4 uStack_b44;
  undefined4 uStack_b40;
  undefined4 uStack_b3c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined1 local_798 [8];
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined8 local_768;
  float fStack_760;
  float fStack_75c;
  undefined1 *local_758;
  assign_op<float,_float> *local_750;
  undefined1 *local_748;
  undefined8 local_740;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_730;
  undefined1 local_718 [12];
  float fStack_70c;
  float local_708;
  float local_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float local_6f0;
  float local_6ec;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_6d8;
  float local_6d4;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float local_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_6a8;
  float local_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_690;
  float local_68c;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined1 local_568 [8];
  undefined8 local_560;
  assign_op<float,_float> *local_558;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  *local_550;
  undefined1 local_548 [12];
  float fStack_53c;
  float local_538;
  float local_534;
  undefined8 local_530;
  undefined8 uStack_528;
  float local_520;
  float local_51c;
  undefined8 local_518;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float local_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float local_4f0;
  float local_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float local_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float local_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  Matrix<float,_3,_1,_0,_3,_1> local_70;
  Matrix<float,_3,_1,_0,_3,_1> local_64;
  Matrix<float,_4,_1,_0,_4,_1> local_58;
  Matrix<float,_4,_1,_0,_4,_1> local_48;
  
  pfVar1 = *(float **)plPair;
  local_1788 = (vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>
                *)__return_storage_ptr__;
  if ((*(float **)(plPair + 8) == pfVar1) ||
     (pfVar2 = *(float **)lPair, (ulong)(*(long *)(lPair + 8) - (long)pfVar2) < 0x81)) {
    poVar16 = std::operator<<((ostream *)&std::cerr,
                              "Solver 3L1Q requires at least 1 plane, and 3 line pairs!");
    std::endl<char,std::char_traits<char>>(poVar16);
    exit(-1);
  }
  fVar40 = pfVar2[3];
  fVar19 = pfVar2[7];
  fStack_1934 = pfVar2[9];
  fStack_1930 = pfVar2[10];
  fStack_192c = pfVar2[0xb];
  fStack_19b4 = pfVar2[0xd];
  fStack_1970 = pfVar2[0xe];
  fStack_1974 = pfVar2[0xf];
  fStack_18e4 = pfVar2[0x11];
  fStack_17b0 = pfVar2[0x12];
  fStack_17ac = pfVar2[0x13];
  fVar78 = *pfVar2 / fVar40;
  fVar86 = pfVar2[1] / fVar40;
  fVar40 = pfVar2[2] / fVar40;
  fVar109 = pfVar2[4] / fVar19;
  fVar123 = pfVar2[5] / fVar19;
  fVar19 = pfVar2[6] / fVar19;
  local_1938 = pfVar2[8] / fStack_192c;
  local_1798._4_4_ = fStack_1934;
  local_1798._0_4_ = fStack_1934 / fStack_192c;
  fStack_1790 = fStack_1934;
  fStack_178c = fStack_1934;
  local_18b8._4_4_ = fStack_192c;
  local_18b8._0_4_ = fStack_1930 / fStack_192c;
  fStack_18b0 = fStack_1930;
  fStack_18ac = fStack_192c;
  local_1848 = pfVar2[0xc] / fStack_1974;
  local_19b8 = fStack_19b4 / fStack_1974;
  local_1978 = fStack_1970 / fStack_1974;
  local_17b8 = pfVar2[0x10] / fStack_17ac;
  local_18e8 = fStack_18e4 / fStack_17ac;
  local_1888._4_4_ = fStack_17ac;
  local_1888._0_4_ = fStack_17b0 / fStack_17ac;
  fStack_1880 = fStack_17b0;
  fStack_187c = fStack_17ac;
  local_1298._4_4_ = pfVar2[0x15];
  fStack_1940 = pfVar2[0x16];
  fStack_1944 = pfVar2[0x17];
  local_1298._0_4_ = pfVar2[0x14] / fStack_1944;
  fStack_1290 = fStack_1940;
  fStack_128c = fStack_1944;
  local_16e8._4_4_ = local_1298._4_4_;
  local_16e8._0_4_ = (float)local_1298._4_4_ / fStack_1944;
  fStack_16e0 = (float)local_1298._4_4_;
  fStack_16dc = (float)local_1298._4_4_;
  local_1948 = fStack_1940 / fStack_1944;
  fStack_19a4 = pfVar2[0x19];
  fStack_19a0 = pfVar2[0x1a];
  fStack_199c = pfVar2[0x1b];
  local_19a8 = pfVar2[0x18] / fStack_199c;
  local_1918 = fStack_19a4 / fStack_199c;
  local_1898._4_4_ = fStack_199c;
  local_1898._0_4_ = fStack_19a0 / fStack_199c;
  fStack_1890 = fStack_19a0;
  fStack_188c = fStack_199c;
  fStack_17a4 = pfVar2[0x1d];
  fStack_17a0 = pfVar2[0x1e];
  fStack_179c = pfVar2[0x1f];
  local_17a8 = pfVar2[0x1c] / fStack_179c;
  local_18a8._4_4_ = fStack_17a4;
  local_18a8._0_4_ = fStack_17a4 / fStack_179c;
  fStack_18a0 = fStack_17a4;
  fStack_189c = fStack_17a4;
  local_1738 = fStack_17a0 / fStack_179c;
  fStack_1984 = pfVar2[0x21];
  fStack_19c0 = pfVar2[0x22];
  fStack_19bc = pfVar2[0x23];
  local_19c8._4_4_ = fStack_1984;
  local_19c8._0_4_ = pfVar2[0x20] / fStack_19bc;
  local_1988 = fStack_1984 / fStack_19bc;
  local_16d8._4_4_ = fStack_19bc;
  local_16d8._0_4_ = fStack_19c0 / fStack_19bc;
  fStack_16d0 = fStack_19c0;
  fStack_16cc = fStack_19bc;
  fStack_18f4 = pfVar2[0x25];
  fStack_18f0 = pfVar2[0x26];
  fStack_18ec = pfVar2[0x27];
  local_18f8 = pfVar2[0x24] / fStack_18ec;
  local_1858._4_4_ = fStack_18f4;
  local_1858._0_4_ = fStack_18f4 / fStack_18ec;
  fStack_1850 = fStack_18f4;
  fStack_184c = fStack_18f4;
  local_17c8._4_4_ = fStack_18ec;
  local_17c8._0_4_ = fStack_18f0 / fStack_18ec;
  fStack_17c0 = fStack_18f0;
  fStack_17bc = fStack_18ec;
  fStack_19d4 = pfVar2[0x29];
  fStack_19d0 = pfVar2[0x2a];
  fStack_19cc = pfVar2[0x2b];
  local_19d8 = pfVar2[0x28] / fStack_19cc;
  local_1998 = fStack_19d4 / fStack_19cc;
  fVar135 = fStack_19d0 / fStack_19cc;
  fStack_1964 = pfVar2[0x2d];
  fStack_1920 = pfVar2[0x2e];
  fStack_191c = pfVar2[0x2f];
  local_1928 = pfVar2[0x2c] / fStack_191c;
  local_1968 = fStack_1964 / fStack_191c;
  local_1878 = fStack_1920 / fStack_191c;
  unique0x00005300 = (long)local_da8;
  _local_19e8 = *(undefined8 *)pfVar1;
  _fStack_19e0 = *(undefined8 *)(pfVar1 + 2);
  _local_1958 = *(undefined8 *)(pfVar1 + 4);
  _fStack_1950 = *(undefined8 *)(pfVar1 + 6);
  local_da8._4_4_ = fVar123 - fVar86;
  local_da8._0_4_ = fVar109 - fVar78;
  fStack_da0 = fVar19 - fVar40;
  local_d98 = fVar19 * fVar78 - fVar40 * fVar109;
  local_d94 = fVar109 * fVar86 - fVar123 * fVar78;
  fStack_d9c = fVar123 * fVar40 - fVar86 * fVar19;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  fStack_19b0 = fStack_19b4;
  fStack_19ac = fStack_19b4;
  fStack_1994 = fStack_19d4;
  fStack_1990 = fStack_19d4;
  fStack_198c = fStack_19d4;
  fStack_1980 = fStack_1984;
  fStack_197c = fStack_1984;
  fStack_196c = fStack_1974;
  fStack_1960 = fStack_1964;
  fStack_195c = fStack_1964;
  fStack_193c = fStack_1944;
  fStack_1924 = fStack_1964;
  fStack_1914 = fStack_19a4;
  fStack_1910 = fStack_19a4;
  fStack_190c = fStack_19a4;
  fStack_18e0 = fStack_18e4;
  fStack_18dc = fStack_18e4;
  fStack_1874 = fStack_191c;
  fStack_1870 = fStack_1920;
  fStack_186c = fStack_191c;
  fStack_1844 = fStack_19b4;
  fStack_1840 = fStack_1970;
  fStack_183c = fStack_1974;
  fStack_17b4 = fStack_18e4;
  fStack_1734 = fStack_179c;
  fStack_1730 = fStack_17a0;
  fStack_172c = fStack_179c;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar3._4_4_ = fVar40;
  auVar3._0_4_ = fVar40;
  auVar3._8_4_ = fVar40;
  auVar3._12_4_ = fVar40;
  _local_da8 = divps(_local_da8,auVar3);
  local_d98 = local_d98 / fVar40;
  local_d94 = local_d94 / fVar40;
  unique0x00005300 = (long)local_dc8;
  local_dc8._4_4_ = (float)local_16e8._0_4_ - local_18e8;
  local_dc8._0_4_ = (float)local_1298._0_4_ - local_17b8;
  fStack_dc0 = local_1948 - (float)local_1888._0_4_;
  local_db8 = local_1948 * local_17b8 - (float)local_1888._0_4_ * (float)local_1298._0_4_;
  local_db4 = (float)local_1298._0_4_ * local_18e8 - (float)local_16e8._0_4_ * local_17b8;
  fStack_dbc = (float)local_16e8._0_4_ * (float)local_1888._0_4_ - local_18e8 * local_1948;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar4._4_4_ = fVar40;
  auVar4._0_4_ = fVar40;
  auVar4._8_4_ = fVar40;
  auVar4._12_4_ = fVar40;
  _local_dc8 = divps(_local_dc8,auVar4);
  local_db8 = local_db8 / fVar40;
  local_db4 = local_db4 / fVar40;
  unique0x00005300 = (long)local_de8;
  local_de8._4_4_ = (float)local_1858._0_4_ - local_1988;
  local_de8._0_4_ = local_18f8 - (float)local_19c8._0_4_;
  fStack_de0 = (float)local_17c8._0_4_ - (float)local_16d8._0_4_;
  local_dd8 = (float)local_17c8._0_4_ * (float)local_19c8._0_4_ -
              (float)local_16d8._0_4_ * local_18f8;
  local_dd4 = local_18f8 * local_1988 - (float)local_1858._0_4_ * (float)local_19c8._0_4_;
  fStack_ddc = (float)local_1858._0_4_ * (float)local_16d8._0_4_ -
               local_1988 * (float)local_17c8._0_4_;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar5._4_4_ = fVar40;
  auVar5._0_4_ = fVar40;
  auVar5._8_4_ = fVar40;
  auVar5._12_4_ = fVar40;
  _local_de8 = divps(_local_de8,auVar5);
  local_dd8 = local_dd8 / fVar40;
  local_dd4 = local_dd4 / fVar40;
  unique0x00005300 = (long)local_e08;
  local_e08._4_4_ = local_19b8 - (float)local_1798._0_4_;
  local_e08._0_4_ = local_1848 - local_1938;
  fStack_e00 = local_1978 - (float)local_18b8._0_4_;
  local_df8 = local_1978 * local_1938 - (float)local_18b8._0_4_ * local_1848;
  local_df4 = local_1848 * (float)local_1798._0_4_ - local_19b8 * local_1938;
  fStack_dfc = local_19b8 * (float)local_18b8._0_4_ - (float)local_1798._0_4_ * local_1978;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar6._4_4_ = fVar40;
  auVar6._0_4_ = fVar40;
  auVar6._8_4_ = fVar40;
  auVar6._12_4_ = fVar40;
  _local_e08 = divps(_local_e08,auVar6);
  local_df8 = local_df8 / fVar40;
  local_df4 = local_df4 / fVar40;
  unique0x00005300 = (long)local_e28;
  local_e28._4_4_ = (float)local_18a8._0_4_ - local_1918;
  local_e28._0_4_ = local_17a8 - local_19a8;
  fStack_e20 = local_1738 - (float)local_1898._0_4_;
  local_e18 = local_1738 * local_19a8 - (float)local_1898._0_4_ * local_17a8;
  local_e14 = local_17a8 * local_1918 - (float)local_18a8._0_4_ * local_19a8;
  fStack_e1c = (float)local_18a8._0_4_ * (float)local_1898._0_4_ - local_1918 * local_1738;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar7._4_4_ = fVar40;
  auVar7._0_4_ = fVar40;
  auVar7._8_4_ = fVar40;
  auVar7._12_4_ = fVar40;
  _local_e28 = divps(_local_e28,auVar7);
  local_e18 = local_e18 / fVar40;
  local_e14 = local_e14 / fVar40;
  unique0x00005300 = (long)local_e48;
  local_e48._4_4_ = local_1968 - local_1998;
  local_e48._0_4_ = local_1928 - local_19d8;
  fStack_e40 = local_1878 - fVar135;
  local_e38 = local_1878 * local_19d8 - fVar135 * local_1928;
  local_e34 = local_1928 * local_1998 - local_1968 * local_19d8;
  fStack_e3c = local_1968 * fVar135 - local_1998 * local_1878;
  stack0xfffffffffffffac0 = 3;
  uStack_528 = 0;
  local_518 = 6;
  local_548._0_8_ = unique0x00005300;
  local_530 = (XprTypeNested)unique0x00005300;
  SVar20 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_718,(scalar_sum_op<float,_float> *)local_15b8,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_548);
  fVar40 = SQRT(SVar20);
  auVar8._4_4_ = fVar40;
  auVar8._0_4_ = fVar40;
  auVar8._8_4_ = fVar40;
  auVar8._12_4_ = fVar40;
  _local_e48 = divps(_local_e48,auVar8);
  local_e38 = local_e38 / fVar40;
  local_e34 = local_e34 / fVar40;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_19e8;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       fStack_19e4;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       fStack_19e0;
  local_48.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       fStack_19dc;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_1958;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       fStack_1954;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       fStack_1950;
  local_58.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       fStack_194c;
  getPredefinedTransformations1Plane3Line<float>(&local_730,&local_48,&local_58,false);
  local_b8.m_dst =
       *(DstEvaluatorType **)
        local_730.
        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  local_b8.m_src =
       *(SrcEvaluatorType **)
        (local_730.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 2);
  local_b8.m_functor =
       *(assign_op<float,_float> **)
        (local_730.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 4);
  local_b8.m_dstExpr =
       *(DstXprType **)
        (local_730.
         super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 6);
  local_98 = *(undefined8 *)
              (local_730.
               super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
              8);
  uStack_90 = *(undefined8 *)
               (local_730.
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
               10);
  uVar9 = *(undefined8 *)
           (local_730.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar10 = *(undefined8 *)
            (local_730.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xe);
  local_88 = (float)uVar9;
  fStack_84 = (float)((ulong)uVar9 >> 0x20);
  fStack_80 = (float)uVar10;
  uStack_7c = (undefined4)((ulong)uVar10 >> 0x20);
  local_1058 = *(undefined1 (*) [8])
                local_730.
                super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2].
                super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array;
  uStack_1050 = *(SrcEvaluatorType **)
                 (local_730.
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-2].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 + 2);
  local_1048 = *(assign_op<float,_float> **)
                (local_730.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-2].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 4);
  uStack_1040 = *(DstXprType **)
                 (local_730.
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-2].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 + 6);
  local_1038 = *(undefined8 *)
                (local_730.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-2].
                 super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                + 8);
  uStack_1030 = *(undefined8 *)
                 (local_730.
                  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-2].
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
                 + 10);
  uVar9 = *(undefined8 *)
           (local_730.
            super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-2].
            super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array + 0xc
           );
  uVar10 = *(undefined8 *)
            (local_730.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-2].
             super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array +
            0xe);
  local_1028 = (float)uVar9;
  fStack_1024 = (float)((ulong)uVar9 >> 0x20);
  fStack_1020 = (float)uVar10;
  fStack_101c = (float)((ulong)uVar10 >> 0x20);
  local_730.
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_730.
       super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  memset((XprTypeNested)local_548,0,0x90);
  uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)0x3;
  local_15a8 = (assign_op<float,_float> *)0x3;
  local_1598 = 0;
  uStack_1590 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)0x0;
  local_1588 = 6;
  local_16b8._0_8_ = (XprTypeNested)local_548;
  local_1688 = (undefined1  [8])local_1058;
  local_15b8 = (undefined1  [8])local_548;
  uStack_15a0 = (XprTypeNested)local_548;
  local_798 = (undefined1  [8])local_16b8;
  uStack_790 = (DstXprType *)local_1688;
  local_788 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_568;
  uStack_780 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_15b8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_798);
  local_16b8._0_8_ = &fStack_4f4;
  uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)0x3;
  local_15a8 = (assign_op<float,_float> *)0x3;
  local_1598 = 3;
  uStack_1590 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)0x3;
  local_1588 = 6;
  local_1688 = (undefined1  [8])local_1058;
  local_15b8 = (undefined1  [8])local_16b8._0_8_;
  uStack_15a0 = (XprTypeNested)local_548;
  local_798 = (undefined1  [8])local_16b8;
  uStack_790 = (DstXprType *)local_1688;
  local_788 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_568;
  uStack_780 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_15b8;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_798);
  local_64.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_1028;
  local_64.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fStack_1020;
  local_64.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       fStack_1024;
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_16b8,&local_64);
  local_1688 = (undefined1  [8])&fStack_53c;
  local_1570 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)0x0;
  pgStack_1568 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)0x0;
  uStack_1680 = 3;
  local_1678 = 3;
  local_1668 = 3;
  uStack_1660 = 0;
  local_1658 = 6;
  local_768 = 3;
  local_15b8 = (undefined1  [8])(local_16b8._0_8_ ^ 0x8000000080000000);
  uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)(local_16b8._8_8_ ^ 0x8000000080000000);
  local_15a8 = (assign_op<float,_float> *)(CONCAT44(fStack_16a4,local_16a8) ^ 0x8000000080000000);
  uStack_15a0 = (XprTypeNested)(CONCAT44(fStack_169c,fStack_16a0) ^ 0x8000000080000000);
  local_1598 = CONCAT44(local_1598._4_4_,local_1698) ^ 0x80000000;
  uStack_1590 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_1058;
  local_1588 = 3;
  uStack_1580 = 3;
  local_1560 = 4;
  local_1540 = 3;
  local_558 = (assign_op<float,_float> *)&local_19ec;
  local_16c8.data = (float *)local_798;
  uStack_1670 = (XprTypeNested)local_548;
  local_1578 = uStack_1590;
  local_1558 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                *)local_15b8;
  local_1550 = uStack_1590;
  local_568 = (undefined1  [8])&local_16c8;
  local_560 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_15b8;
  local_550 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
               *)local_798;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_568);
  if ((uStack_1680 == 3) && (local_1678 == local_768)) {
    local_568 = local_1688;
    local_15a8 = (assign_op<float,_float> *)&local_19ec;
    local_16c8.data = (float *)local_798;
    local_15b8 = (undefined1  [8])local_568;
    uStack_15b0 = &local_16c8;
    uStack_15a0 = (XprTypeNested)local_1688;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_15b8);
    memset((DstXprType *)local_718,0,0x90);
    uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)0x3;
    local_15a8 = (assign_op<float,_float> *)0x3;
    local_1598 = 0;
    uStack_1590 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)0x0;
    local_1588 = 6;
    local_16b8._0_8_ = (DstXprType *)local_718;
    local_1688 = (undefined1  [8])&local_b8;
    local_15b8 = (undefined1  [8])local_718;
    uStack_15a0 = (XprTypeNested)local_718;
    local_798 = (undefined1  [8])local_16b8;
    uStack_790 = (DstXprType *)local_1688;
    local_788 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_568;
    uStack_780 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_15b8;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_798);
    local_16b8._0_8_ = &fStack_6c4;
    uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)0x3;
    local_15a8 = (assign_op<float,_float> *)0x3;
    local_1598 = 3;
    uStack_1590 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)0x3;
    local_1588 = 6;
    uStack_790 = (DstXprType *)local_1688;
    local_1688 = (undefined1  [8])&local_b8;
    local_15b8 = (undefined1  [8])local_16b8._0_8_;
    uStack_15a0 = (XprTypeNested)local_718;
    local_798 = (undefined1  [8])local_16b8;
    local_788 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_568;
    uStack_780 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_15b8;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_798);
    local_70.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         local_88;
    local_70.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         fStack_80;
    local_70.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         fStack_84;
    getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)local_16b8,&local_70);
    local_1688 = (undefined1  [8])&fStack_70c;
    local_1570 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)0x0;
    pgStack_1568 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                    *)0x0;
    uStack_1680 = 3;
    local_1678 = 3;
    uStack_1670 = (XprTypeNested)local_718;
    local_1668 = 3;
    uStack_1660 = 0;
    local_1658 = 6;
    local_768 = 3;
    local_15b8 = (undefined1  [8])(local_16b8._0_8_ ^ 0x8000000080000000);
    uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)
                  (local_16b8._8_8_ ^ 0x8000000080000000);
    local_15a8 = (assign_op<float,_float> *)(CONCAT44(fStack_16a4,local_16a8) ^ 0x8000000080000000);
    uStack_15a0 = (XprTypeNested)(CONCAT44(fStack_169c,fStack_16a0) ^ 0x8000000080000000);
    local_1598 = CONCAT44(local_1598._4_4_,local_1698) ^ 0x80000000;
    local_1588 = 3;
    uStack_1580 = 3;
    local_1560 = 4;
    local_1540 = 3;
    local_558 = (assign_op<float,_float> *)&local_19ec;
    local_16c8.data = (float *)local_798;
    uStack_1590 = &local_b8;
    local_1578 = &local_b8;
    local_1558 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                  *)local_15b8;
    local_1550 = &local_b8;
    local_568 = (undefined1  [8])&local_16c8;
    local_560 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_15b8;
    local_550 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                 *)local_798;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_1>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *)local_568);
    if ((uStack_1680 == 3) && (local_1678 == local_768)) {
      local_568 = local_1688;
      local_15a8 = (assign_op<float,_float> *)&local_19ec;
      uStack_15a0 = (XprTypeNested)local_1688;
      local_16c8.data = (float *)local_798;
      local_15b8 = (undefined1  [8])local_568;
      uStack_15b0 = &local_16c8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,_-1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
             *)local_15b8);
      local_1738 = local_d94 * local_4d0 +
                   local_d98 * local_4e8 +
                   fStack_d9c * local_500 +
                   fStack_da0 * (float)local_518 +
                   (float)local_da8._4_4_ * (float)local_530 +
                   (float)local_da8._0_4_ * (float)local_548._0_4_;
      fStack_19b4 = local_d94 * fStack_4cc +
                    local_d98 * fStack_4e4 +
                    fStack_d9c * fStack_4fc +
                    fStack_da0 * local_518._4_4_ +
                    (float)local_da8._4_4_ * local_530._4_4_ +
                    (float)local_da8._0_4_ * (float)local_548._4_4_;
      fStack_19b0 = local_d94 * fStack_4c8 +
                    local_d98 * fStack_4e0 +
                    fStack_d9c * fStack_4f8 +
                    fStack_da0 * fStack_510 +
                    (float)local_da8._4_4_ * (float)uStack_528 +
                    (float)local_da8._0_4_ * (float)local_548._8_4_;
      fStack_19ac = local_d94 * fStack_4c4 +
                    local_d98 * fStack_4dc +
                    fStack_d9c * fStack_4f4 +
                    fStack_da0 * fStack_50c +
                    (float)local_da8._4_4_ * uStack_528._4_4_ + (float)local_da8._0_4_ * fStack_53c;
      fVar141 = local_d94 * local_4c0 + local_d98 * local_4d8 + fStack_d9c * local_4f0 +
                fStack_da0 * local_508 + (float)local_da8._4_4_ * local_520 +
                (float)local_da8._0_4_ * local_538;
      _local_1798 = ZEXT416((uint)fVar141);
      fVar136 = local_d94 * local_4bc + local_d98 * local_4d4 + fStack_d9c * local_4ec +
                fStack_da0 * local_504 + (float)local_da8._4_4_ * local_51c +
                (float)local_da8._0_4_ * local_534;
      _local_1298 = ZEXT416((uint)fVar136);
      local_1918 = local_df4 * local_6a0 +
                   local_df8 * local_6b8 +
                   fStack_dfc * local_6d0 +
                   fStack_e00 * local_6e8 +
                   (float)local_e08._4_4_ * local_700 +
                   (float)local_e08._0_4_ * (float)local_718._0_4_;
      local_1938 = local_df4 * fStack_69c +
                   local_df8 * fStack_6b4 +
                   fStack_dfc * fStack_6cc +
                   fStack_e00 * fStack_6e4 +
                   (float)local_e08._4_4_ * fStack_6fc +
                   (float)local_e08._0_4_ * (float)local_718._4_4_;
      fStack_1910 = local_df4 * fStack_698 +
                    local_df8 * fStack_6b0 +
                    fStack_dfc * fStack_6c8 +
                    fStack_e00 * fStack_6e0 +
                    (float)local_e08._4_4_ * fStack_6f8 +
                    (float)local_e08._0_4_ * (float)local_718._8_4_;
      local_19d8 = local_df4 * fStack_694 +
                   local_df8 * fStack_6ac +
                   fStack_dfc * fStack_6c4 +
                   fStack_e00 * fStack_6dc +
                   (float)local_e08._4_4_ * fStack_6f4 + (float)local_e08._0_4_ * fStack_70c;
      fVar142 = local_df4 * local_690 + local_df8 * local_6a8 + fStack_dfc * local_6c0 +
                fStack_e00 * local_6d8 + (float)local_e08._4_4_ * local_6f0 +
                (float)local_e08._0_4_ * local_708;
      _local_1898 = ZEXT416((uint)fVar142);
      fVar128 = local_df4 * local_68c + local_df8 * local_6a4 + fStack_dfc * local_6bc +
                fStack_e00 * local_6d4 + (float)local_e08._4_4_ * local_6ec +
                (float)local_e08._0_4_ * local_704;
      _local_18a8 = ZEXT416((uint)fVar128);
      local_17a8 = local_db4 * local_4d0 +
                   local_db8 * local_4e8 +
                   fStack_dbc * local_500 +
                   fStack_dc0 * (float)local_518 +
                   (float)local_dc8._4_4_ * (float)local_530 +
                   (float)local_dc8._0_4_ * (float)local_548._0_4_;
      fStack_17a4 = local_db4 * fStack_4cc +
                    local_db8 * fStack_4e4 +
                    fStack_dbc * fStack_4fc +
                    fStack_dc0 * local_518._4_4_ +
                    (float)local_dc8._4_4_ * local_530._4_4_ +
                    (float)local_dc8._0_4_ * (float)local_548._4_4_;
      fStack_17a0 = local_db4 * fStack_4c8 +
                    local_db8 * fStack_4e0 +
                    fStack_dbc * fStack_4f8 +
                    fStack_dc0 * fStack_510 +
                    (float)local_dc8._4_4_ * (float)uStack_528 +
                    (float)local_dc8._0_4_ * (float)local_548._8_4_;
      local_1998 = local_db4 * fStack_4c4 +
                   local_db8 * fStack_4dc +
                   fStack_dbc * fStack_4f4 +
                   fStack_dc0 * fStack_50c +
                   (float)local_dc8._4_4_ * uStack_528._4_4_ + (float)local_dc8._0_4_ * fStack_53c;
      local_1878 = local_4c0 * local_db4 + local_4d8 * local_db8 + local_4f0 * fStack_dbc +
                   local_508 * fStack_dc0 + local_520 * (float)local_dc8._4_4_ +
                   local_538 * (float)local_dc8._0_4_;
      fVar137 = local_db4 * local_4bc + local_db8 * local_4d4 + fStack_dbc * local_4ec +
                fStack_dc0 * local_504 + (float)local_dc8._4_4_ * local_51c +
                (float)local_dc8._0_4_ * local_534;
      _local_16d8 = ZEXT416((uint)fVar137);
      local_1928 = local_e14 * local_6a0 +
                   local_e18 * local_6b8 +
                   fStack_e1c * local_6d0 +
                   fStack_e20 * local_6e8 +
                   (float)local_e28._4_4_ * local_700 +
                   (float)local_e28._0_4_ * (float)local_718._0_4_;
      local_1968 = local_e14 * fStack_69c +
                   local_e18 * fStack_6b4 +
                   fStack_e1c * fStack_6cc +
                   fStack_e20 * fStack_6e4 +
                   (float)local_e28._4_4_ * fStack_6fc +
                   (float)local_e28._0_4_ * (float)local_718._4_4_;
      fStack_1920 = local_e14 * fStack_698 +
                    local_e18 * fStack_6b0 +
                    fStack_e1c * fStack_6c8 +
                    fStack_e20 * fStack_6e0 +
                    (float)local_e28._4_4_ * fStack_6f8 +
                    (float)local_e28._0_4_ * (float)local_718._8_4_;
      fStack_191c = local_e14 * fStack_694 +
                    local_e18 * fStack_6ac +
                    fStack_e1c * fStack_6c4 +
                    fStack_e20 * fStack_6dc +
                    (float)local_e28._4_4_ * fStack_6f4 + (float)local_e28._0_4_ * fStack_70c;
      local_19a8 = local_690 * local_e14 + local_6a8 * local_e18 + local_6c0 * fStack_e1c +
                   local_6d8 * fStack_e20 + local_6f0 * (float)local_e28._4_4_ +
                   local_708 * (float)local_e28._0_4_;
      fVar143 = local_e14 * local_68c + local_e18 * local_6a4 + fStack_e1c * local_6bc +
                fStack_e20 * local_6d4 + (float)local_e28._4_4_ * local_6ec +
                (float)local_e28._0_4_ * local_704;
      _local_18b8 = ZEXT416((uint)fVar143);
      fVar41 = local_dd4 * local_4d0 +
               local_dd8 * local_4e8 +
               fStack_ddc * local_500 +
               fStack_de0 * (float)local_518 +
               (float)local_de8._4_4_ * (float)local_530 +
               (float)local_de8._0_4_ * (float)local_548._0_4_;
      fStack_1644 = local_dd4 * fStack_4cc +
                    local_dd8 * fStack_4e4 +
                    fStack_ddc * fStack_4fc +
                    fStack_de0 * local_518._4_4_ +
                    (float)local_de8._4_4_ * local_530._4_4_ +
                    (float)local_de8._0_4_ * (float)local_548._4_4_;
      fStack_1640 = local_dd4 * fStack_4c8 +
                    local_dd8 * fStack_4e0 +
                    fStack_ddc * fStack_4f8 +
                    fStack_de0 * fStack_510 +
                    (float)local_de8._4_4_ * (float)uStack_528 +
                    (float)local_de8._0_4_ * (float)local_548._8_4_;
      fStack_163c = local_dd4 * fStack_4c4 +
                    local_dd8 * fStack_4dc +
                    fStack_ddc * fStack_4f4 +
                    fStack_de0 * fStack_50c +
                    (float)local_de8._4_4_ * uStack_528._4_4_ + (float)local_de8._0_4_ * fStack_53c;
      fVar40 = local_4c0 * local_dd4 + local_4d8 * local_dd8 + local_4f0 * fStack_ddc +
               local_508 * fStack_de0 + local_520 * (float)local_de8._4_4_ +
               local_538 * (float)local_de8._0_4_;
      fVar155 = local_4bc * local_dd4 + local_4d4 * local_dd8 + local_4ec * fStack_ddc +
                local_504 * fStack_de0 + local_51c * (float)local_de8._4_4_ +
                local_534 * (float)local_de8._0_4_;
      fVar19 = local_e34 * local_6a0 +
               local_e38 * local_6b8 +
               fStack_e3c * local_6d0 +
               fStack_e40 * local_6e8 +
               (float)local_e48._4_4_ * local_700 + (float)local_e48._0_4_ * (float)local_718._0_4_;
      local_b58 = local_e34 * fStack_69c +
                  local_e38 * fStack_6b4 +
                  fStack_e3c * fStack_6cc +
                  fStack_e40 * fStack_6e4 +
                  (float)local_e48._4_4_ * fStack_6fc +
                  (float)local_e48._0_4_ * (float)local_718._4_4_;
      fStack_1210 = local_e34 * fStack_698 +
                    local_e38 * fStack_6b0 +
                    fStack_e3c * fStack_6c8 +
                    fStack_e40 * fStack_6e0 +
                    (float)local_e48._4_4_ * fStack_6f8 +
                    (float)local_e48._0_4_ * (float)local_718._8_4_;
      fStack_120c = local_e34 * fStack_694 +
                    local_e38 * fStack_6ac +
                    fStack_e3c * fStack_6c4 +
                    fStack_e40 * fStack_6dc +
                    (float)local_e48._4_4_ * fStack_6f4 + (float)local_e48._0_4_ * fStack_70c;
      fVar78 = local_690 * local_e34 + local_6a8 * local_e38 + local_6c0 * fStack_e3c +
               local_6d8 * fStack_e40 + local_6f0 * (float)local_e48._4_4_ +
               local_708 * (float)local_e48._0_4_;
      fVar160 = local_68c * local_e34 + local_6a4 * local_e38 + local_6bc * fStack_e3c +
                local_6d4 * fStack_e40 + local_6ec * (float)local_e48._4_4_ +
                local_704 * (float)local_e48._0_4_;
      auVar12._4_4_ = local_1938;
      auVar12._0_4_ = local_1918;
      auVar12._8_4_ = fStack_1910;
      auVar12._12_4_ = local_19d8;
      auVar11._4_4_ = local_1968;
      auVar11._0_4_ = local_1928;
      auVar11._8_4_ = fStack_1920;
      auVar11._12_4_ = fStack_191c;
      fVar42 = local_1738 * 4.0;
      auVar13._4_4_ = fStack_17a4;
      auVar13._0_4_ = local_17a8;
      auVar13._8_4_ = fStack_17a0;
      auVar13._12_4_ = local_1998;
      fVar43 = fVar42 * local_17a8 * fStack_1640;
      fVar159 = local_1738 + local_1738;
      fVar124 = fVar159 * local_17a8 * fStack_1640;
      fVar87 = local_19d8 * fVar124 * fStack_1920;
      _local_19e8 = CONCAT44(fStack_191c,fStack_191c);
      _fStack_19e0 = CONCAT44(fStack_191c,fStack_191c);
      fVar79 = fStack_191c * fStack_1910 * fVar124;
      fStack_1850 = fStack_1920;
      local_1858 = (undefined1  [8])auVar11._8_8_;
      fStack_184c = fStack_191c;
      fVar88 = fVar42 * fStack_17a4 * fStack_1640;
      fVar44 = fVar159 * fStack_17a4;
      fVar89 = fVar44 * fStack_1640;
      local_ed8 = local_19d8 * fVar89 * fStack_1920;
      local_1218._4_4_ = local_b58;
      local_1218._0_4_ = fVar19;
      fVar90 = fVar42 * fStack_17a0;
      fStack_1880 = fStack_1910;
      local_1888 = (undefined1  [8])auVar12._8_8_;
      fStack_187c = local_19d8;
      local_13e8 = fVar159 * fStack_17a0;
      fVar156 = local_13e8 * fVar41;
      fVar86 = fStack_1910 * fVar156 * local_1968;
      auVar14._4_4_ = fStack_19b4;
      auVar14._0_4_ = local_1738;
      auVar14._8_4_ = fStack_19b0;
      auVar14._12_4_ = fStack_19ac;
      fVar153 = local_1738 * fStack_17a4;
      fVar91 = local_1738 * fStack_17a0;
      fStack_8e4 = -fStack_19b4;
      fStack_8e0 = -fStack_19b0;
      fStack_8dc = -fStack_19ac;
      fVar144 = fStack_19b4 * local_17a8;
      fVar109 = fStack_19b4 * fStack_17a0;
      fVar110 = fStack_19b0 * local_17a8;
      fVar123 = fStack_19b0 * fStack_17a4;
      fVar45 = -fVar123;
      fStack_8a4 = -fStack_19ac;
      fStack_8a0 = -fStack_19b0;
      fStack_89c = -fStack_19ac;
      fVar135 = fVar41 * fVar45;
      auVar85._8_4_ = fStack_19b0;
      auVar85._0_8_ = auVar14._8_8_;
      auVar85._12_4_ = fStack_19ac;
      auStack_1464 = auVar85._4_12_;
      local_1468 = fStack_19b0 * fStack_17a0;
      fStack_16e0 = fStack_19b0;
      local_16e8 = (undefined1  [8])auVar14._8_8_;
      fStack_16dc = fStack_19ac;
      fVar111 = fStack_19b0 + fStack_19b0;
      fVar21 = fVar111 * local_17a8;
      fStack_f54 = -fStack_19b4;
      fStack_f50 = -fStack_19b0;
      fStack_f4c = -fStack_19ac;
      fVar80 = fStack_19b4 + fStack_19b4;
      fVar92 = fVar80 * local_17a8;
      fStack_ef4 = -fStack_19b4;
      fStack_ef0 = -fStack_19b4;
      fStack_eec = -fStack_19b4;
      local_17e8 = fVar80 * fStack_17a0;
      fVar22 = fVar111 * fStack_17a4;
      _local_1958 = CONCAT44(fStack_17a4,fStack_17a4);
      _fStack_1950 = CONCAT44(fStack_17a4,fStack_17a4);
      fVar81 = fVar111 * fStack_17a0;
      fStack_17c0 = fStack_17a0;
      local_17c8 = (undefined1  [8])auVar13._8_8_;
      fStack_17bc = local_1998;
      fVar23 = fStack_19b4 * 4.0;
      fVar82 = fVar23 * fStack_17a0;
      fVar138 = fStack_19b0 * 4.0;
      fVar129 = fVar138 * local_17a8;
      fVar139 = fVar138 * fStack_17a4;
      local_248 = local_19d8 * fVar153 * fStack_1640 * fStack_1920 * fVar19;
      local_878 = fVar153 * fStack_163c * fStack_1910 * fStack_1920 * fVar19;
      fVar93 = local_19d8 * fVar91 * fStack_1640;
      local_238 = fVar93 * local_1968 * fVar19;
      local_858 = fStack_163c * -fVar91 * fStack_1910 * local_1968 * fVar19;
      fStack_a24 = -fStack_19b4;
      fStack_a20 = -fStack_19b4;
      fStack_a1c = -fStack_19b4;
      fVar112 = fStack_1910 * -(fVar144 * fStack_1640);
      local_218 = fStack_191c * fVar112 * fVar19;
      local_848 = fVar144 * fStack_163c * fStack_1910 * fStack_1920 * fVar19;
      local_838 = fVar109 * fStack_163c * fStack_1910 * local_1928 * fVar19;
      fStack_224 = -fStack_19b4;
      fStack_220 = -fStack_19b4;
      fStack_21c = -fStack_19b4;
      local_228 = -(fStack_19b4 * local_1998) * fStack_1640 * fStack_1910 * local_1928 * fVar19;
      fVar46 = fVar110 * fStack_1640;
      local_208 = fStack_191c * local_1938 * fVar46 * fVar19;
      local_828 = fVar110 * fStack_163c * local_1938 * fStack_1920 * fVar19;
      local_818 = fStack_163c * fVar45 * local_1918 * fStack_1920 * fVar19;
      local_1f8 = local_1918 * local_1468 * fStack_163c * local_1968 * fVar19;
      local_808 = local_1468 * fStack_163c * local_1938 * local_1928 * fVar19;
      fVar47 = fStack_19b0 * local_1998;
      local_1e8 = fVar47 * fStack_1640 * local_1938 * local_1928 * fVar19;
      local_1d8 = fStack_19ac * fStack_17a4 * fStack_1640 * local_1918 * fStack_1920 * fVar19;
      fVar48 = fStack_19ac * fStack_17a0;
      fVar49 = fVar48 * fStack_1640 * local_1918;
      local_1c8 = fVar49 * local_1968 * fVar19;
      fVar94 = fStack_19b4 * fStack_17a4 * fStack_1640;
      fStack_1b4 = -fStack_19b4;
      fStack_1b0 = -fStack_19b4;
      fStack_1ac = -fStack_19b4;
      local_1b8 = -fVar94 * fStack_1910 * local_19a8 * fVar19;
      local_1a8 = fVar142 * fVar94 * fStack_1920 * fVar19;
      uStack_1a4 = 0;
      uStack_1a0 = 0;
      uStack_19c = 0;
      fVar95 = fVar142 * fVar109 * fStack_1640;
      local_198 = fVar95 * local_1968 * fVar19;
      uStack_194 = 0;
      uStack_190 = 0;
      uStack_18c = 0;
      fStack_184 = -fStack_19b4;
      fStack_180 = -fStack_19b4;
      fStack_17c = -fStack_19b4;
      local_188 = -(fStack_19b4 * local_1878) * fStack_1640 * fStack_1910 * local_1968 * fVar19;
      fVar130 = fVar123 * fStack_1640;
      local_178 = local_1938 * fVar130 * local_19a8 * fVar19;
      fVar96 = fStack_19b0 * local_1878;
      local_168 = fVar96 * fStack_1640 * local_1938 * local_1968 * fVar19;
      local_158 = fVar141 * fStack_17a4 * fStack_1640 * local_1938 * fStack_1920 * fVar19;
      uStack_154 = 0;
      uStack_150 = 0;
      uStack_14c = 0;
      fVar97 = fVar141 * fStack_17a0;
      fVar98 = fVar97 * fStack_1640 * local_1938;
      local_148 = fVar98 * local_1968 * fVar19;
      uStack_144 = 0;
      uStack_140 = 0;
      uStack_13c = 0;
      fVar50 = fVar109 * fStack_1640 * fStack_1910;
      local_138 = fVar50 * fVar143 * fVar19;
      local_128 = fStack_19b4 * fVar137 * fStack_1640 * fStack_1910 * fStack_1920 * fVar19;
      local_118 = fVar130 * fVar128 * fStack_1920 * fVar19;
      fVar125 = local_1468 * fStack_1640;
      local_f8 = fVar143 * local_1938 * fVar125 * fVar19;
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      fStack_104 = -fStack_19ac;
      fStack_100 = -fStack_19b0;
      fStack_fc = -fStack_19ac;
      local_108 = -(fVar125 * fVar128) * local_1968 * fVar19;
      local_688 = fStack_19b0 * fVar137;
      local_e8 = local_1938 * local_688 * fStack_1640 * fStack_1920 * fVar19;
      local_d8 = fVar136 * fStack_17a4 * fStack_1640 * fStack_1910 * fStack_1920 * fVar19;
      uStack_d4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_e58 = fVar136 * fStack_17a0;
      fStack_e54 = 0.0;
      fStack_e50 = 0.0;
      fStack_e4c = 0.0;
      fVar51 = local_e58 * fStack_1640 * fStack_1910;
      uStack_c0 = 0x80000000;
      uStack_bc = 0x80000000;
      local_c8 = -fVar51 * local_1968 * fVar19;
      uStack_c4 = 0x80000000;
      local_e68 = fVar79 * fVar19;
      local_fc8 = fVar87 * fVar19;
      local_f88 = local_13e8 * fStack_163c * fStack_1910;
      local_5d8 = local_1928 * local_f88 * fVar19;
      fVar52 = fVar159 * local_1998 * fStack_1640 * fStack_1910;
      fVar94 = local_1928 * fVar52;
      local_5f8 = fVar94 * fVar19;
      local_5e8 = local_1918 * fVar21 * fStack_163c * fStack_1920 * fVar19;
      fVar53 = fStack_19ac + fStack_19ac;
      fVar54 = fVar53 * local_17a8 * fStack_1640;
      fVar24 = local_1918 * fVar54 * fStack_1920;
      local_608 = fVar24 * fVar19;
      fVar83 = fStack_1910 * fVar89;
      local_1780 = local_19a8 * fVar83 * fVar19;
      local_f68 = fVar89 * fVar142 * fStack_1920 * fVar19;
      local_f58 = -fVar44 * fVar40 * fStack_1910 * fStack_1920 * fVar19;
      fVar55 = fVar142 * local_13e8 * fStack_1640;
      uStack_590 = 0x80000000;
      uStack_58c = 0x80000000;
      local_598 = -fVar55 * local_1968 * fVar19;
      uStack_594 = 0x80000000;
      fVar89 = local_13e8 * fVar40 * fStack_1910;
      fVar25 = fVar89 * local_1968;
      local_5a8 = fVar25 * fVar19;
      fVar26 = fVar159 * local_1878 * fStack_1640 * fStack_1910;
      fVar27 = fVar26 * local_1968;
      local_5b8 = fVar27 * fVar19;
      fVar28 = fVar92 * fStack_1640;
      fVar113 = fStack_1910 * fVar28;
      local_177c = local_19a8 * fVar113 * fVar19;
      fVar29 = fVar28 * fVar142 * fStack_1920;
      local_578 = fVar29 * fVar19;
      local_f18 = fVar92 * fVar40 * fStack_1910 * fStack_1920 * fVar19;
      fVar131 = fVar80 * fStack_17a4 * fStack_1640;
      local_588 = fStack_191c * fStack_1910 * fVar131 * fVar19;
      local_5c8 = local_19d8 * fVar131 * fStack_1920 * fVar19;
      fVar114 = local_19d8 * local_17e8 * fStack_1640;
      local_328 = local_1968 * fVar114 * fVar19;
      fVar56 = local_17e8 * fStack_163c * fStack_1910;
      local_a18 = local_1928 * fVar56;
      local_998 = fVar56 * local_1968 * fVar19;
      fVar57 = local_17e8 * fVar40 * fStack_1910;
      fVar115 = local_1928 * fVar57;
      local_338 = fVar115 * fVar19;
      fVar56 = fVar80 * local_1998 * fStack_1640 * fStack_1910;
      local_a08 = local_1928 * fVar56;
      local_348 = fVar56 * local_1968 * fVar19;
      local_988 = fVar80 * local_1878 * fStack_1640 * fStack_1910;
      local_358 = local_1928 * local_988 * fVar19;
      fVar56 = fVar21 * fStack_1640;
      local_318 = local_1938 * fVar56 * local_19a8 * fVar19;
      fVar30 = fVar21 * fVar40 * local_1938 * fStack_1920;
      local_308 = fVar30 * fVar19;
      fVar58 = fVar22 * fStack_1640;
      fStack_b64 = -fStack_19ac;
      fStack_b60 = -fStack_19b0;
      fStack_b5c = -fStack_19ac;
      local_2e8 = fStack_191c * -fVar58 * local_1938 * fVar19;
      local_968 = fVar22 * fStack_163c * local_1938 * fStack_1920 * fVar19;
      fVar59 = local_1918 * fVar22 * fVar40 * fStack_1920;
      local_2f8 = fVar59 * fVar19;
      fStack_954 = -fStack_19ac;
      fStack_950 = -fStack_19b0;
      fStack_94c = -fStack_19ac;
      local_958 = -(fVar81 * fVar40) * local_1918 * local_1968 * fVar19;
      local_2d8 = local_1938 * fVar81 * fVar40 * local_1928 * fVar19;
      fVar60 = fVar111 * local_1998;
      local_2c8 = local_1938 * fVar60 * fStack_1640 * local_1968 * fVar19;
      fVar61 = fVar111 * local_1878;
      fStack_2b4 = -fStack_19ac;
      fStack_2b0 = -fStack_19b0;
      fStack_2ac = -fStack_19ac;
      local_2b8 = -(fVar61 * fStack_1640) * local_1938 * local_1928 * fVar19;
      fVar99 = fVar53 * fStack_17a4 * fStack_1640;
      local_948 = fVar99 * local_1938 * fStack_1920 * fVar19;
      fVar62 = fVar53 * fStack_17a0;
      fVar63 = fVar62 * fStack_1640 * local_1938;
      fStack_284 = -fStack_19ac;
      fStack_280 = -fStack_19ac;
      fStack_27c = -fStack_19ac;
      local_288 = -fVar63 * local_1968 * fVar19;
      fVar31 = fVar141 + fVar141;
      fVar64 = fVar31 * local_17a8 * fStack_1640;
      fVar65 = fVar64 * local_1938 * fStack_1920;
      local_298 = fVar65 * fVar19;
      uStack_294 = 0;
      uStack_290 = 0;
      uStack_28c = 0;
      fVar66 = fVar31 * fStack_17a4 * fStack_1640;
      local_2a8 = local_1918 * fVar66 * fStack_1920 * fVar19;
      fVar32 = fVar31 * fStack_17a0;
      fVar33 = fVar32 * fStack_1640 * local_1918;
      local_268 = local_1968 * fVar33 * fVar19;
      fVar84 = local_13e8 * fStack_1640 * fStack_1910;
      fStack_914 = -fStack_19b4;
      fStack_910 = -fStack_19b0;
      fStack_90c = -fStack_19ac;
      local_918 = -fVar84 * fVar143 * fVar19;
      fStack_1614 = -fStack_19b4;
      fStack_1610 = -fStack_19b0;
      fStack_160c = -fStack_19ac;
      local_278 = -fVar159 * fVar137 * fStack_1640 * fStack_1910 * fStack_1920 * fVar19;
      local_908 = fVar56 * fVar128 * fStack_1920 * fVar19;
      fVar67 = fVar136 + fVar136;
      local_258 = fVar67 * local_17a8 * fStack_1640 * fStack_1910 * fStack_1920 * fVar19;
      uStack_254 = 0;
      uStack_250 = 0;
      uStack_24c = 0;
      local_f88 = local_f88 * local_1968;
      fVar68 = -fVar23 * local_17a8 * fStack_1640;
      local_9f8 = fVar21 * fStack_163c * local_1938 * fStack_1920;
      local_9d8 = local_1918 * fVar22 * fStack_163c * fStack_1920;
      fVar145 = fStack_19ac * 4.0;
      local_9c8 = local_1918 * fVar99 * fStack_1920;
      fVar69 = fVar141 * 4.0;
      local_9a8 = fStack_1910 * fVar131 * local_19a8;
      local_9b8 = fVar131 * fVar142 * fStack_1920;
      local_988 = local_988 * local_1968;
      local_978 = fVar66 * local_1938 * fStack_1920;
      fVar70 = fVar81 * fStack_1640;
      fVar111 = fVar111 * fVar137;
      fVar71 = fVar67 * fStack_17a0 * fStack_1640 * fStack_1910;
      local_468 = fVar71 * local_1968 * fVar19;
      uStack_464 = 0;
      uStack_460 = 0;
      uStack_45c = 0;
      fVar72 = local_13e8 * fStack_1644;
      fVar157 = local_17e8 * fVar41;
      fVar66 = fStack_1910 * fVar157;
      fVar73 = fVar129 * fVar41 * local_1918;
      fVar116 = local_1918 * fVar21 * fVar41;
      fVar100 = fVar21 * fVar41 * local_1938;
      fVar99 = fVar21 * fStack_1644;
      fVar101 = local_1918 * fVar99;
      fVar102 = fVar22 * fVar41;
      fVar103 = fStack_1920 * local_1918 * fVar102;
      fVar146 = fVar60 * fVar41 * local_1938;
      fVar161 = local_1918 * fVar60 * fStack_1644;
      fVar117 = local_1918 * fVar62 * fVar41;
      fVar154 = local_1918 * fVar62 * fStack_1644;
      fVar131 = fStack_1910 * fVar72;
      fVar132 = fVar23 * fStack_17a4 * fStack_1640;
      fVar74 = local_17e8 * fStack_1644;
      fVar133 = local_1928 * fStack_1910 * fVar74;
      fVar75 = fStack_1920 * local_1938 * fVar99;
      uVar9 = local_1218._8_8_;
      local_1218 = (undefined1  [8])uVar9;
      fVar134 = local_1938 * fVar102;
      fStack_1194 = -fStack_19b4;
      fStack_1190 = -fStack_19b0;
      fStack_118c = -fStack_19ac;
      fVar118 = fVar110 * fStack_1644;
      fVar104 = fVar153 * fStack_1644 * fStack_1910;
      local_3d8 = fStack_1920 * fVar104 * fVar78;
      fVar34 = -(fVar91 * fStack_1644) * fStack_1910;
      local_3c8 = local_1968 * fVar34 * fVar78;
      local_3b8 = fStack_1910 * fVar144 * fStack_1644 * fStack_1920 * fVar78;
      local_3a8 = fStack_1910 * fVar109 * fStack_1644 * local_1928 * fVar78;
      local_398 = local_1938 * fVar118 * fStack_1920 * fVar78;
      fVar105 = fVar123 * fStack_1644 * local_1918;
      fStack_384 = -fStack_19ac;
      fStack_380 = -fStack_19b0;
      fStack_37c = -fStack_19ac;
      local_388 = -fVar105 * fStack_1920 * fVar78;
      fVar158 = local_1468 * fStack_1644;
      local_368 = local_1968 * local_1918 * fVar158 * fVar78;
      local_378 = local_1938 * fVar158 * local_1928 * fVar78;
      local_628 = fStack_1910 * fVar44 * fVar41 * fStack_1920 * fVar78;
      local_e78 = fVar86 * fVar78;
      local_618 = local_1928 * fVar131 * fVar78;
      fVar147 = fVar92 * fVar41 * fStack_1910;
      fStack_674 = -fStack_19b4;
      fStack_670 = -fStack_19b4;
      fStack_66c = -fStack_19b4;
      local_678 = -fVar147 * fStack_1920 * fVar78;
      local_15e8 = local_1928 * fVar66 * fVar78;
      local_1078 = fStack_1920 * fVar100 * fVar78;
      local_10b8 = fStack_1920 * fVar101 * fVar78;
      local_1098 = fVar103 * fVar78;
      fVar151 = local_1918 * fVar22 * fStack_1644;
      fVar35 = local_1918 * fVar81 * fVar41;
      local_488 = local_1968 * fVar35 * fVar78;
      fVar140 = -(fVar81 * fVar41);
      fStack_1814 = -fStack_19ac;
      fStack_1810 = -fStack_19b0;
      fStack_180c = -fStack_19ac;
      local_498 = local_1938 * fVar140 * local_1928 * fVar78;
      local_14c8 = fStack_1910 * fVar74 * local_1968 * fVar78;
      fVar148 = fVar22 * fStack_1644 * local_1938;
      local_478 = fStack_1920 * fVar148 * fVar78;
      fVar76 = local_1468 * fVar41;
      local_458 = fStack_1910 * fVar153 * fVar41 * fStack_1920 * fStack_120c;
      fStack_444 = -fStack_19b4;
      fStack_440 = -fStack_19b0;
      fStack_43c = -fStack_19ac;
      local_448 = -(fVar91 * fVar41) * fStack_1910 * local_1968 * fStack_120c;
      fVar152 = fVar144 * fVar41 * fStack_1910;
      local_438 = fStack_1920 * fVar152 * fStack_120c;
      fVar126 = fStack_1910 * fVar109 * fVar41;
      local_428 = local_1928 * fVar126 * fStack_120c;
      fVar149 = fVar110 * fVar41 * local_1938;
      local_418 = fStack_1920 * fVar149 * fStack_120c;
      local_408 = local_1918 * fVar135 * fStack_1920 * fStack_120c;
      local_3e8 = local_1918 * fVar76 * local_1968 * fStack_120c;
      local_3f8 = local_1928 * local_1938 * fVar76 * fStack_120c;
      local_e88 = local_1928 * fStack_1910 * fVar156 * fStack_120c;
      fStack_e84 = local_1968;
      fStack_e80 = fStack_1920;
      fStack_e7c = fStack_191c;
      local_668 = fStack_1920 * fVar116 * fStack_120c;
      fVar36 = fVar44 * fStack_1644 * fStack_1910;
      fStack_654 = -fStack_19b4;
      fStack_650 = -fStack_19b0;
      fStack_64c = -fStack_19ac;
      local_658 = -fVar36 * fStack_1920 * fStack_120c;
      local_15f8 = local_1968 * fVar131 * fStack_120c;
      local_648 = fStack_1910 * fVar92 * fStack_1644 * fStack_1920 * fStack_120c;
      local_638 = local_1968 * fVar66 * fStack_120c;
      local_10c8 = fVar133 * fStack_120c;
      local_1508 = fVar75 * fStack_120c;
      local_14e8 = fStack_1920 * fVar134 * fStack_120c;
      local_1108 = fStack_1920 * fVar151 * fStack_120c;
      fVar37 = local_1938 * fVar81 * fStack_1644;
      fVar106 = -(fVar81 * fStack_1644);
      fStack_c64 = -fStack_19ac;
      fStack_c60 = -fStack_19b0;
      fStack_c5c = -fStack_19ac;
      local_4b8 = local_1918 * fVar106 * local_1968 * fStack_120c;
      local_4a8 = local_1928 * fVar37 * fStack_120c;
      fVar107 = fVar139 * fStack_1644 * local_1938;
      fVar108 = fVar61 * fVar41 * local_1938;
      fVar77 = local_1918 * fVar61 * fStack_1644;
      fVar38 = local_1738 * local_17a8 * fStack_1640;
      fStack_10d4 = -fStack_19ac;
      fStack_10d0 = -fStack_19ac;
      fStack_10cc = -fStack_19ac;
      uStack_1520 = 0x80000000;
      uStack_151c = 0x80000000;
      fStack_cb4 = -fStack_19b4;
      fStack_cb0 = -fStack_19b4;
      fStack_cac = -fStack_19b4;
      fVar119 = fVar32 * fVar41 * local_1938;
      fVar127 = fVar32 * fStack_1644 * local_1938;
      fVar150 = fVar153 * fStack_1640 * fStack_1910;
      local_a88 = fVar150 * fStack_1920 * fVar160;
      fVar39 = fVar91 * fStack_1640 * fStack_1910;
      local_fe8 = local_1968 * fVar39 * fVar160;
      local_a98 = fVar112 * fStack_1920 * fVar160;
      local_7c8 = local_1928 * fVar50 * fVar160;
      local_aa8 = local_1938 * fVar46 * fStack_1920 * fVar160;
      local_ad8 = local_1918 * fVar130 * fStack_1920 * fVar160;
      local_fd8 = local_1968 * local_1918 * fVar125 * fVar160;
      fStack_ac4 = -local_1938;
      fStack_ac0 = -local_1938;
      fStack_abc = -local_1938;
      local_ac8 = -(local_1938 * fVar125) * local_1928 * fVar160;
      fStack_ba4 = -fStack_19ac;
      fStack_ba0 = -fStack_19b0;
      fStack_b9c = -fStack_19ac;
      local_928 = local_1928 * fVar84 * fVar160;
      local_ba8 = -fVar56 * local_1918 * fStack_1920 * fVar160;
      fVar50 = local_17e8 * fStack_1640 * fStack_1910;
      local_d08 = local_1968 * fVar50 * fVar160;
      local_b68 = -fVar58 * local_1938 * fStack_1920 * fVar160;
      fStack_18f4 = -fStack_19b4;
      fStack_18f0 = -fStack_19b4;
      fStack_18ec = -fStack_19b4;
      local_13e8 = local_13e8 * fVar155;
      fStack_1364 = -fStack_19ac;
      fStack_1360 = -fStack_19b0;
      fStack_135c = -fStack_19ac;
      local_1368 = -fVar21 * fVar155;
      local_17e8 = local_17e8 * fVar155;
      fStack_17d4 = -fStack_19ac;
      fStack_17d0 = -fStack_19b0;
      fStack_17cc = -fStack_19ac;
      local_17d8 = -fVar22 * fVar155;
      fStack_1344 = -fStack_19ac;
      fStack_1340 = -fStack_19b0;
      fStack_133c = -fStack_19ac;
      fVar120 = fStack_19b4 * fStack_17a4 * fVar41;
      fStack_1394 = -fStack_19ac;
      fStack_1390 = -fStack_19b0;
      fStack_138c = -fStack_19ac;
      fStack_13b0 = -0.0;
      fStack_13ac = -0.0;
      fVar121 = fVar80 * fStack_17a4 * fVar41;
      fStack_13d4 = -fStack_19b4;
      fStack_13d0 = -fStack_19b4;
      fStack_13cc = -fStack_19b4;
      fStack_1414 = -fStack_19ac;
      fStack_1410 = -fStack_19ac;
      fStack_140c = -fStack_19ac;
      local_17f8 = fVar67 * fStack_17a4 * fVar41;
      uStack_17f4 = 0;
      uStack_17f0 = 0;
      uStack_17ec = 0;
      fVar84 = local_1738 * local_17a8 * fStack_1644;
      fStack_1334 = -fStack_19ac;
      fStack_1330 = -fStack_19ac;
      fStack_132c = -fStack_19ac;
      uStack_1370 = 0x80000000;
      uStack_136c = 0x80000000;
      fStack_1904 = -fStack_19b4;
      fStack_1900 = -fStack_19b0;
      fStack_18fc = -fStack_19ac;
      fVar112 = fVar159 * local_17a8 * fStack_1644;
      fStack_13a4 = -fStack_19b4;
      fStack_13a0 = -fStack_19b0;
      fStack_139c = -fStack_19ac;
      local_9e8 = fVar53 * local_17a8 * fStack_1644;
      uStack_1400 = 0x80000000;
      uStack_13fc = 0x80000000;
      fVar122 = -(fVar67 * fStack_17a0);
      uStack_c40 = 0x80000000;
      uStack_c3c = 0x80000000;
      local_b18 = fVar111 * fStack_1644;
      local_c48 = fVar122 * fStack_1644;
      uStack_c44 = 0x80000000;
      local_b78 = fVar67 * local_17a8 * fStack_1644 * fStack_1910 * fStack_1920 * fStack_1210 +
                  fVar111 * fStack_1640 * local_1938 * fStack_1920 * fVar19 +
                  (((local_1918 * fVar81 * fVar155 * local_1968 * fStack_1210 +
                    ((local_1928 * fVar70 * fVar128 * local_b58 +
                     local_1938 * fVar70 * fVar143 * fVar19 +
                     (((local_1968 * local_1918 * fVar70 * fVar160 +
                       ((fVar99 * fVar128 * fStack_1920 * fStack_1210 +
                        fVar80 * fVar137 * fVar41 * fStack_1910 * fStack_1920 * fStack_1210 +
                        fVar66 * fVar143 * fStack_1210 +
                        (((-fVar159 * fVar137 * fStack_1644 * fStack_1910 * fStack_1920 *
                           fStack_1210 +
                          ((fVar44 * fVar155 * fStack_1910 * fStack_1920 * fStack_1210 +
                           fVar83 * fStack_1920 * fVar160 +
                           fVar127 * local_1928 * fStack_1210 +
                           fVar69 * fStack_17a0 * fStack_1644 * local_1918 * local_1968 *
                           fStack_1210 +
                           ((((fVar65 * local_b58 +
                              -fVar145 * fStack_17a0 * fStack_1644 * local_1938 * local_1968 *
                              fStack_1210 +
                              fVar145 * fStack_17a4 * fStack_1640 * local_1938 * fStack_1920 *
                              local_b58 +
                              -fVar138 * local_1878 * fStack_1644 * local_1938 * local_1928 *
                              fStack_1210 +
                              ((fVar108 * local_1968 * fStack_1210 +
                               fVar138 * local_1998 * fStack_1644 * local_1938 * local_1968 *
                               fStack_1210 +
                               fVar139 * fVar40 * local_1938 * fStack_1920 * fVar19 +
                               fVar59 * local_b58 +
                               (((fStack_1920 * fVar107 * fStack_120c +
                                 ((fStack_1920 * fVar151 * fVar78 +
                                  fVar134 * local_19a8 * fStack_1210 +
                                  -fVar139 * fVar41 * local_1938 * fStack_1920 * fVar78 +
                                  ((fVar129 * fStack_1644 * local_1938 * local_19a8 * fStack_1210 +
                                   ((local_988 * fVar19 +
                                    fVar23 * local_1878 * fStack_1640 * fStack_1910 * local_1928 *
                                    local_b58 +
                                    ((((fVar82 * fStack_163c * fStack_1910 * local_1968 * local_b58
                                       + fVar74 * fVar142 * local_1928 * fStack_1210 +
                                         fVar82 * fStack_1644 * local_19d8 * local_1968 *
                                         fStack_1210 +
                                         ((((fVar82 * fVar41 * fStack_1910 * local_1968 * fVar78 +
                                            (((local_9a8 * fVar19 +
                                              fStack_1910 * fVar132 * fStack_191c * local_b58 +
                                              fVar29 * local_b58 +
                                              fVar68 * fStack_1910 * local_19a8 * local_b58 +
                                              ((fVar25 * local_b58 +
                                               -fVar90 * fStack_1644 * fVar142 * local_1968 *
                                               fStack_1210 +
                                               local_1968 * fVar131 * fVar78 +
                                               fVar88 * fVar142 * fStack_1920 * local_b58 +
                                               ((fVar69 * fStack_17a0 * fVar41 * local_1918 *
                                                 local_1928 * fStack_1210 +
                                                ((fVar154 * local_1928 * fStack_1210 +
                                                 -fVar145 * fStack_17a0 * fVar41 * local_1938 *
                                                 local_1928 * fStack_1210 +
                                                 (((fVar145 * local_17a8 * fStack_1640 * local_1938
                                                    * fStack_1920 * fVar19 +
                                                   fVar24 * local_b58 +
                                                   -fVar138 * local_1878 * fVar41 * local_1918 *
                                                   local_1928 * fStack_1210 +
                                                   ((fVar146 * local_1928 * fStack_1210 +
                                                    fVar138 * local_1998 * fVar41 * local_1918 *
                                                    local_1968 * fStack_1210 +
                                                    local_9d8 * fVar19 +
                                                    local_1918 * -fVar139 * fVar41 * fStack_191c *
                                                    fStack_1210 +
                                                    fVar103 * fStack_120c +
                                                    fVar129 * fVar40 * local_1918 * fStack_1920 *
                                                    fVar19 + ((((local_1918 * fVar129 * fStack_1644
                                                                 * fStack_1920 * fStack_120c +
                                                                fVar100 * fStack_191c * fStack_1210
                                                                + ((fVar73 * local_19a8 *
                                                                    fStack_1210 +
                                                                   ((local_a08 * fVar19 +
                                                                    ((local_19d8 * fVar82 * fVar41 *
                                                                      local_1928 * fStack_1210 +
                                                                     ((local_19d8 * fVar68 *
                                                                       fStack_1920 * fVar19 +
                                                                      fStack_191c * fVar113 * fVar19
                                                                      + fVar42 * local_1878 *
                                                                        fStack_1640 * fStack_1910 *
                                                                        local_1928 * fVar19 +
                                                                        ((((local_f88 * fVar19 +
                                                                           fVar90 * fStack_163c *
                                                                           fStack_1910 * local_1928
                                                                           * local_b58 +
                                                                           local_19d8 * fVar72 *
                                                                           local_1928 * fStack_1210
                                                                           + fStack_1910 *
                                                                             -fVar90 * fStack_1644 *
                                                                             local_1928 *
                                                                             fStack_120c +
                                                                             (((fVar86 * fStack_120c
                                                                               + fStack_1910 *
                                                                                 fVar90 * fVar41 *
                                                                                 local_1928 * fVar78
                                                                                 + ((fStack_1910 *
                                                                                     fVar88 * 
                                                  fStack_191c * fVar19 +
                                                  fVar43 * fVar142 * fStack_1920 * fVar19 +
                                                  ((fVar87 * local_b58 -
                                                   fStack_1910 * fVar43 * local_19a8 * fVar19) -
                                                  fVar79 * local_b58)) - local_ed8 * fVar19)) -
                                                  local_19d8 * fVar156 * local_1968 * fStack_1210) -
                                                  fVar90 * fVar41 * fVar142 * local_1928 *
                                                  fStack_1210)) -
                                                  fVar40 * fVar90 * fStack_1910 * local_1928 *
                                                  fVar19) - fVar94 * local_b58) -
                                                  local_1998 * fVar42 * fStack_1640 * fStack_1910 *
                                                  local_1968 * fVar19)) -
                                                  local_1928 * fVar66 * fStack_120c)) -
                                                  local_a18 * fVar19)) -
                                                  fStack_1920 * fVar73 * fVar78)) -
                                                  fStack_1920 * fVar100 * fStack_120c)) -
                                                  fVar101 * fStack_191c * fStack_1210) -
                                                  fStack_163c * fVar129 * local_1918 * fStack_1920 *
                                                  local_b58) - local_9f8 * fVar19)) -
                                                  fVar161 * local_1928 * fStack_1210)) -
                                                  local_9c8 * fVar19) -
                                                 fVar117 * local_1968 * fStack_1210)) -
                                                local_17a8 * fVar69 * fStack_1640 * local_1918 *
                                                fStack_1920 * fVar19)) -
                                               local_19a8 * fVar83 * local_b58)) -
                                              fVar27 * local_b58)) -
                                             fVar132 * local_19d8 * fStack_1920 * local_b58) -
                                            local_9b8 * fVar19)) -
                                           fVar157 * fVar142 * local_1968 * fStack_1210) -
                                          fVar133 * fVar78) -
                                         fStack_1910 * fVar82 * fStack_1644 * local_1968 *
                                         fStack_120c)) - fVar115 * local_b58) -
                                     fVar40 * fVar82 * fStack_1910 * local_1968 * fVar19) -
                                    local_1998 * fVar23 * fStack_1640 * fStack_1910 * local_1968 *
                                    local_b58)) - fVar75 * fVar78)) - fVar30 * local_b58)) -
                                 fVar151 * local_19a8 * fStack_1210)) -
                                fVar107 * fStack_191c * fStack_1210) -
                               fStack_163c * fVar139 * local_1938 * fStack_1920 * local_b58)) -
                              fVar77 * local_1968 * fStack_1210)) -
                             fVar69 * fStack_17a4 * fStack_1640 * local_1918 * fStack_1920 *
                             local_b58) - local_978 * fVar19) - fVar119 * local_1968 * fStack_1210))
                          - fVar131 * fVar143 * fStack_1210)) - fVar113 * fStack_1920 * fVar160) -
                        fVar92 * fVar155 * fStack_1910 * fStack_1920 * fStack_1210)) -
                       fVar102 * fVar128 * fStack_1920 * fStack_1210)) -
                      local_1918 * fVar70 * fVar143 * local_b58) -
                     local_1928 * local_1938 * fVar70 * fVar160)) -
                    fVar70 * fVar128 * local_1968 * fVar19)) -
                   fVar81 * fVar155 * local_1938 * local_1928 * fStack_1210) -
                  local_1918 * fVar111 * fStack_1640 * fStack_1920 * local_b58);
      uStack_b74 = 0;
      uStack_b70 = 0;
      uStack_b6c = 0;
      local_d18 = fStack_1910 * fVar38 * fStack_191c * local_b58;
      fStack_11a4 = -fStack_19b4;
      fStack_11a0 = -fStack_19b0;
      fStack_119c = -fStack_19ac;
      local_11a8 = -fVar38 * local_19d8 * fStack_1920 * local_b58;
      local_868 = local_1928 * fVar93 * local_b58;
      local_1128 = local_1738 * local_1998 * fStack_1640 * fStack_1910 * local_1928 * local_b58;
      local_1018 = local_1918 * fVar46 * fStack_191c * local_b58;
      local_a48 = local_1918 * fVar47 * fStack_1640 * local_1928 * local_b58;
      local_10d8 = -(fStack_19ac * local_17a8) * fStack_1640 * local_1918 * fStack_1920 * local_b58;
      local_7f8 = local_1928 * fVar49 * local_b58;
      local_1008 = local_19a8 * fVar150 * local_b58;
      local_8f8 = fVar153 * fVar40 * fStack_1910 * fStack_1920 * local_b58;
      local_8e8 = -fVar91 * fVar40 * fStack_1910 * local_1968 * local_b58;
      local_1238 = local_1738 * local_1878 * fStack_1640 * fStack_1910 * local_1968 * local_b58;
      local_a28 = -(fVar144 * fStack_1640) * fVar142 * fStack_1920 * local_b58;
      local_8d8 = fVar144 * fVar40 * fStack_1910 * fStack_1920 * local_b58;
      local_7e8 = local_1928 * fVar95 * local_b58;
      local_8c8 = fVar109 * fVar40 * fStack_1910 * local_1928 * local_b58;
      local_8b8 = fVar110 * fVar40 * local_1938 * fStack_1920 * local_b58;
      local_15c8 = local_19a8 * local_1918 * fVar130 * local_b58;
      local_8a8 = fVar45 * fVar40 * local_1918 * fStack_1920 * local_b58;
      local_ff8 = local_1918 * local_1468 * fVar40 * local_1968 * local_b58;
      local_898 = local_1468 * fVar40 * local_1938 * local_1928 * local_b58;
      fStack_894 = fStack_19ac;
      fStack_890 = fStack_19b0;
      fStack_88c = fStack_19ac;
      local_a58 = local_1918 * fVar96 * fStack_1640 * local_1968 * local_b58;
      local_1528 = -(fVar141 * local_17a8) * fStack_1640 * local_1938 * fStack_1920 * local_b58;
      uStack_1524 = 0x80000000;
      local_7d8 = local_1928 * fVar98 * local_b58;
      local_1358 = fVar39 * fVar143 * local_b58;
      local_1518 = local_1738 * fVar137 * fStack_1640 * fStack_1910 * fStack_1920 * local_b58;
      local_a38 = fVar46 * fVar128 * fStack_1920 * local_b58;
      fStack_f94 = -local_1938;
      fStack_f90 = -fStack_1910;
      fStack_f8c = -local_19d8;
      local_f98 = -(local_1918 * fVar125) * fVar143 * local_b58;
      local_7b8 = local_1928 * fVar125 * fVar128 * local_b58;
      fStack_a74 = -fStack_19ac;
      fStack_a70 = -fStack_19b0;
      fStack_a6c = -fStack_19ac;
      local_a78 = -(local_688 * fStack_1640) * local_1918 * fStack_1920 * local_b58;
      local_14b8 = fVar136 * local_17a8 * fStack_1640 * fStack_1910 * fStack_1920 * local_b58;
      uStack_14b4 = 0;
      uStack_14b0 = 0;
      uStack_14ac = 0;
      local_7a8 = local_1928 * fVar51 * local_b58;
      local_ec8 = fStack_1910 * fVar124 * local_19a8 * local_b58;
      local_eb8 = fVar124 * fVar142 * fStack_1920 * local_b58;
      local_1728 = fStack_191c * fVar83 * local_b58;
      fStack_1724 = fStack_191c;
      fStack_1720 = fStack_191c;
      fStack_171c = fStack_191c;
      local_ed8 = local_ed8 * local_b58;
      local_f08 = fVar44 * fStack_163c * fStack_1910 * fStack_1920 * local_b58;
      local_f28 = local_1928 * fVar55 * local_b58;
      local_f88 = local_f88 * local_b58;
      local_f38 = local_1928 * fVar89 * local_b58;
      local_fa8 = fVar52 * local_1968 * local_b58;
      local_f48 = local_1928 * fVar26 * local_b58;
      local_f78 = fStack_191c * fVar113 * local_b58;
      local_fb8 = local_19d8 * fVar28 * fStack_1920 * local_b58;
      local_ef8 = -fVar92 * fStack_163c * fStack_1910 * fStack_1920 * local_b58;
      fStack_ab4 = -local_19d8;
      fStack_ab0 = -local_19d8;
      fStack_aac = -local_19d8;
      local_ab8 = -fVar114 * local_1928 * local_b58;
      local_a18 = local_a18 * local_b58;
      local_a08 = local_a08 * local_b58;
      local_1618 = local_19a8 * -fVar56 * local_1918 * local_b58;
      local_9f8 = local_9f8 * local_b58;
      local_ae8 = local_1918 * fVar21 * fVar40 * fStack_1920 * local_b58;
      local_d78 = local_1918 * fVar58 * fStack_191c * local_b58;
      local_9d8 = local_9d8 * local_b58;
      local_d68 = local_1918 * fVar81 * fStack_163c * local_1968 * local_b58;
      fStack_884 = -fStack_19ac;
      fStack_880 = -fStack_19b0;
      fStack_87c = -fStack_19ac;
      local_888 = -(fVar81 * fStack_163c) * local_1938 * local_1928 * local_b58;
      fStack_b04 = -fStack_19ac;
      fStack_b00 = -fStack_19b0;
      fStack_afc = -fStack_19ac;
      local_b08 = -(fVar60 * fStack_1640) * local_1918 * local_1968 * local_b58;
      local_b28 = local_1918 * fVar61 * fStack_1640 * local_1928 * local_b58;
      local_a68 = fVar54 * local_1938 * fStack_1920 * local_b58;
      local_9c8 = local_9c8 * local_b58;
      local_938 = local_1928 * fVar63 * local_b58;
      local_b38 = local_1918 * fVar64 * fStack_1920 * local_b58;
      uStack_b40 = 0x80000000;
      uStack_b3c = 0x80000000;
      local_b48 = -fVar33 * local_1928 * local_b58;
      uStack_b44 = 0x80000000;
      local_9a8 = local_9a8 * local_b58;
      local_9b8 = local_9b8 * local_b58;
      local_1388 = fVar57 * local_1968 * local_b58;
      local_988 = local_988 * local_b58;
      local_ee8 = fVar22 * fVar40 * local_1938 * fStack_1920 * local_b58;
      local_978 = local_978 * local_b58;
      uStack_974 = 0;
      uStack_970 = 0;
      uStack_96c = 0;
      fStack_13f4 = -fStack_19b4;
      fStack_13f0 = -fStack_19b4;
      fStack_13ec = -fStack_19b4;
      local_13f8 = -fVar50 * fVar143 * local_b58;
      local_cb8 = -(fVar80 * fVar137) * fStack_1640 * fStack_1910 * fStack_1920 * local_b58;
      local_af8 = fVar58 * fVar128 * fStack_1920 * local_b58;
      local_11d8 = fVar67 * fStack_17a4 * fStack_1640 * fStack_1910 * fStack_1920 * local_b58;
      uStack_11d4 = 0;
      uStack_11d0 = 0;
      uStack_11cc = 0;
      local_b58 = local_1928 * fVar71 * local_b58;
      local_d58 = fStack_1910 * fVar84 * fStack_191c * fStack_1210;
      fVar40 = fVar84 * local_19d8 * fStack_1920 * fStack_1210;
      local_ca8 = fVar153 * fVar41 * local_19d8 * fStack_1920 * fStack_1210;
      local_c88 = local_19d8 * fVar91 * fVar41 * local_1968 * fStack_1210;
      local_c78 = local_19d8 * -(fVar91 * fStack_1644) * local_1928 * fStack_1210;
      local_1838 = local_1738 * local_1998 * fStack_1644 * fStack_1910 * local_1928 * fStack_1210;
      local_c58 = fVar152 * fStack_191c * fStack_1210;
      local_1318 = fStack_19b4 * local_1998 * fVar41 * fStack_1910 * local_1928 * fStack_1210;
      fStack_c34 = -fStack_19ac;
      fStack_c30 = -fStack_19b0;
      fStack_c2c = -fStack_19ac;
      local_c38 = -fVar149 * fStack_191c * fStack_1210;
      local_d48 = local_1918 * fVar118 * fStack_191c * fStack_1210;
      local_1348 = -fVar47 * fVar41 * local_1938 * local_1928 * fStack_1210;
      local_1328 = fVar47 * fStack_1644 * local_1918 * local_1928 * fStack_1210;
      local_1828 = fStack_19ac * local_17a8 * fStack_1644 * local_1918 * fStack_1920 * fStack_1210;
      local_12c8 = fStack_19ac * fStack_17a4 * fVar41 * local_1918 * fStack_1920 * fStack_1210;
      local_12e8 = fVar48 * fVar41 * local_1918 * local_1968 * fStack_1210;
      local_1338 = -fVar48 * fStack_1644 * local_1918 * local_1928 * fStack_1210;
      local_c18 = fVar104 * local_19a8 * fStack_1210;
      local_bb8 = local_1928 * local_19d8 * fVar156 * fStack_1210;
      local_1868 = local_1738 * local_1878 * fStack_1644 * fStack_1910 * local_1968 * fStack_1210;
      local_be8 = fVar144 * fStack_1644 * fVar142 * fStack_1920 * fStack_1210;
      local_d38 = fStack_1910 * fVar120 * local_19a8 * fStack_1210;
      local_1718 = fVar120 * fVar142 * fStack_1920 * fStack_1210;
      local_1638 = fVar116 * fStack_191c * fStack_1210;
      local_bd8 = fVar109 * fVar41 * fVar142 * local_1968 * fStack_1210;
      fStack_11c4 = -fStack_19b4;
      fStack_11c0 = -fStack_19b4;
      fStack_11bc = -fStack_19b4;
      local_11c8 = -(fVar109 * fStack_1644) * fVar142 * local_1928 * fStack_1210;
      local_1708 = fStack_19b4 * local_1878 * fVar41 * fStack_1910 * local_1968 * fStack_1210;
      local_bc8 = local_1918 * fVar60 * fVar41 * local_1928 * fStack_1210;
      local_bf8 = local_1928 * fVar117 * fStack_1210;
      local_d28 = local_1938 * fVar135 * local_19a8 * fStack_1210;
      local_1478 = local_19a8 * fVar105 * fStack_1210;
      local_1398 = -fVar96 * fVar41 * local_1938 * local_1968 * fStack_1210;
      local_1768 = fVar96 * fStack_1644 * local_1918 * local_1968 * fStack_1210;
      local_18c8 = fVar141 * local_17a8 * fStack_1644 * local_1938 * fStack_1920 * fStack_1210;
      uStack_18c4 = 0;
      uStack_18c0 = 0;
      uStack_18bc = 0;
      local_16f8 = fVar141 * fStack_17a4 * fVar41 * local_1938 * fStack_1920 * fStack_1210;
      uStack_16f4 = 0;
      uStack_16f0 = 0;
      uStack_16ec = 0;
      local_12b8 = fVar97 * fVar41 * local_1938 * local_1968 * fStack_1210;
      uStack_12b4 = 0;
      uStack_12b0 = 0;
      uStack_12ac = 0;
      local_1378 = -fVar97 * fStack_1644 * local_1938 * local_1928 * fStack_1210;
      uStack_1374 = 0x80000000;
      fStack_1744 = -fStack_19b4;
      fStack_1740 = -fStack_19b0;
      fStack_173c = -fStack_19ac;
      local_1748 = -fVar112 * fStack_1910 * local_19a8 * fStack_1210;
      local_d88 = fVar142 * fVar112 * fStack_1920 * fStack_1210;
      uStack_d84 = 0;
      uStack_d80 = 0;
      uStack_d7c = 0;
      local_1988 = fVar153 * fVar155 * fStack_1910 * fStack_1920 * fStack_1210;
      local_1198 = fVar34 * fVar143 * fStack_1210;
      local_19b8 = fVar91 * fVar155 * fStack_1910 * local_1968 * fStack_1210;
      local_1908 = -(local_1738 * fVar137) * fStack_1644 * fStack_1910 * fStack_1920 * fStack_1210;
      local_18f8 = -fVar144 * fVar155 * fStack_1910 * fStack_1920 * fStack_1210;
      local_1178 = fVar126 * fVar143 * fStack_1210;
      local_1978 = fVar109 * fVar155 * fStack_1910 * local_1928 * fStack_1210;
      local_1758 = fStack_19b4 * fVar137 * fVar41 * fStack_1910 * fStack_1920 * fStack_1210;
      local_1628 = fVar118 * fVar128 * fStack_1920 * fStack_1210;
      fStack_cc4 = -fStack_19b4;
      fStack_cc0 = -fStack_19b0;
      fStack_cbc = -fStack_19ac;
      local_cc8 = -(fVar44 * fVar41) * fVar142 * fStack_1920 * fStack_1210;
      local_19c8._0_4_ = fVar110 * fVar155 * local_1938 * fStack_1920 * fStack_1210;
      local_19c8._4_4_ = fStack_19ac;
      fStack_19c0 = fStack_19b0;
      fStack_19bc = fStack_19ac;
      local_ea8 = fVar135 * fVar128 * fStack_1920 * fStack_1210;
      local_18e8 = fVar123 * fVar155 * local_1918 * fStack_1920 * fStack_1210;
      local_cf8 = fStack_191c * fVar36 * fStack_1210;
      local_1138 = local_1938 * fVar76 * fVar143 * fStack_1210;
      local_1148 = fVar76 * fVar128 * local_1968 * fStack_1210;
      local_1158 = local_1918 * fVar158 * fVar143 * fStack_1210;
      local_1168 = fVar158 * fVar128 * local_1928 * fStack_1210;
      local_11f8 = local_1918 * local_1468 * fVar155 * local_1968 * fStack_1210;
      fStack_1604 = -fStack_19ac;
      fStack_1600 = -fStack_19b0;
      fStack_15fc = -fStack_19ac;
      local_1608 = -(local_1468 * fVar155) * local_1938 * local_1928 * fStack_1210;
      local_15d8 = local_688 * fVar41 * local_1938 * fStack_1920 * fStack_1210;
      local_1778 = local_688 * fStack_1644 * local_1918 * fStack_1920 * fStack_1210;
      local_1948 = fVar136 * local_17a8 * fStack_1644 * fStack_1910 * fStack_1920 * fStack_1210;
      fStack_1944 = 0.0;
      fStack_1940 = 0.0;
      fStack_193c = 0.0;
      local_13b8 = -(fVar136 * fStack_17a4) * fVar41 * fStack_1910 * fStack_1920 * fStack_1210;
      fStack_13b4 = -0.0;
      local_1808 = local_e58 * fVar41 * fStack_1910 * local_1968 * fStack_1210;
      fStack_1804 = 0.0;
      fStack_1800 = 0.0;
      fStack_17fc = 0.0;
      fVar19 = local_e58 * fStack_1644 * fStack_1910 * local_1928 * fStack_1210;
      local_e98 = fVar156 * fVar142 * local_1968 * fStack_1210;
      local_b88 = local_1968 * local_19d8 * fVar72 * fStack_1210;
      local_1208 = fVar72 * fVar142 * local_1928 * fStack_1210;
      local_13a8 = -(fVar159 * local_1998) * fStack_1644 * fStack_1910 * local_1968 * fStack_1210;
      local_12a8 = fVar159 * local_1878 * fStack_1644 * fStack_1910 * local_1928 * fStack_1210;
      local_18cc = local_19a8 * fVar147 * fStack_1210;
      fStack_ce4 = -fStack_19b4;
      fStack_ce0 = -fStack_19b4;
      fStack_cdc = -fStack_19b4;
      local_ce8 = -(fVar92 * fStack_1644) * local_19d8 * fStack_1920 * fStack_1210;
      fStack_12d4 = -fStack_19b4;
      fStack_12d0 = -fStack_19b4;
      fStack_12cc = -fStack_19b4;
      local_12d8 = -fVar121 * fStack_1910 * fStack_191c * fStack_1210;
      fVar109 = local_19d8 * fVar121 * fStack_1920 * fStack_1210;
      local_1118 = local_19d8 * fVar157 * local_1968 * fStack_1210;
      local_14f8 = local_1928 * fVar157 * fVar142 * fStack_1210;
      local_1188 = local_19d8 * fVar74 * local_1928 * fStack_1210;
      local_12f8 = fVar80 * local_1998 * fVar41 * fStack_1910 * local_1968 * fStack_1210;
      local_13d8 = -(fVar80 * local_1878) * fVar41 * fStack_1910 * local_1928 * fStack_1210;
      local_1088 = local_19a8 * fVar100 * fStack_1210;
      local_10a8 = local_19a8 * fVar101 * fStack_1210;
      local_11b8 = local_1938 * fVar99 * fStack_191c * fStack_1210;
      local_b98 = local_1918 * fVar102 * local_19a8 * fStack_1210;
      local_14d8 = fStack_191c * fVar134 * fStack_1210;
      local_1228 = fStack_191c * fVar151 * fStack_1210;
      local_1498 = local_1968 * fVar146 * fStack_1210;
      local_1068 = local_1968 * fVar161 * fStack_1210;
      local_1428 = fVar60 * fStack_1644 * local_1938 * local_1928 * fStack_1210;
      local_cd8 = local_1918 * fVar61 * fVar41 * local_1968 * fStack_1210;
      local_10e8 = local_1928 * fVar108 * fStack_1210;
      local_10f8 = local_1928 * fVar77 * fStack_1210;
      fVar86 = local_9e8 * local_1938 * fStack_1920 * fStack_1210;
      local_1418 = -(fVar53 * fStack_17a4) * fVar41 * local_1938 * fStack_1920 * fStack_1210;
      local_1438 = fVar62 * fVar41 * local_1938 * local_1968 * fStack_1210;
      local_1488 = local_1968 * fVar154 * fStack_1210;
      local_1448 = fVar62 * fStack_1644 * local_1938 * local_1928 * fStack_1210;
      local_1408 = -(fVar31 * local_17a8) * fStack_1644 * local_1918 * fStack_1920 * fStack_1210;
      uStack_1404 = 0x80000000;
      local_1308 = fVar31 * fStack_17a4 * fVar41 * local_1918 * fStack_1920 * fStack_1210;
      uStack_1304 = 0;
      uStack_1300 = 0;
      uStack_12fc = 0;
      local_1258 = local_1918 * fVar32 * fVar41 * local_1968 * fStack_1210;
      local_1248 = local_1928 * fVar119 * fStack_1210;
      local_11e8 = local_1918 * fVar32 * fStack_1644 * local_1928 * fStack_1210;
      fVar21 = local_13e8 * fStack_1910 * local_1928 * fStack_1210;
      local_14a8 = local_1968 * fVar74 * fVar142 * fStack_1210;
      fVar23 = local_1368 * local_1918 * fStack_1920 * fStack_1210;
      local_c28 = fVar148 * local_19a8 * fStack_1210;
      local_c08 = fVar35 * fVar143 * fStack_1210;
      local_1818 = fVar140 * fVar128 * local_1928 * fStack_1210;
      local_1458 = fVar61 * fStack_1644 * local_1938 * local_1968 * fStack_1210;
      local_13c8 = fVar111 * fVar41 * local_1918 * fStack_1920 * fStack_1210;
      local_1538 = local_1968 * fVar127 * fStack_1210;
      local_1648 = fVar41 * fVar122 * fStack_1910 * local_1928 * fStack_1210;
      fVar135 = local_17e8 * fStack_1910 * local_1968 * fStack_1210;
      fVar123 = local_17d8 * local_1938 * fStack_1920 * fStack_1210;
      local_c98 = fVar37 * fVar143 * fStack_1210;
      local_c68 = fVar106 * fVar128 * local_1968 * fStack_1210;
      fVar78 = local_b18 * local_1938 * fStack_1920 * fStack_1210;
      fVar22 = local_c48 * fStack_1910 * local_1968 * fStack_1210;
      local_568._4_4_ =
           ((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_e68 -
                                                                                        local_fc8) -
                                                                                       local_e88) +
                                                                                      local_bb8) -
                                                                                     local_5d8) +
                                                                                     local_5f8 +
                                                                                    local_668) -
                                                                                   local_1638) +
                                                                                  local_5e8) -
                                                                                 local_bc8) -
                                                                                local_608) +
                                                                                local_bf8 +
                                                                                local_1748 +
                                                                               local_d88) -
                                                                              local_ec8) + local_eb8
                                                                              + local_628 +
                                                                              local_cc8 + local_658
                                                                              + local_cf8 +
                                                                              local_1728 +
                                                                             local_1780) - local_ed8
                                                                            ) - local_f68) +
                                                                           local_f08 + local_f58 +
                                                                          local_e78) - local_e98) -
                                                                        local_618) - local_15f8) +
                                                                       local_b88 + local_1208 +
                                                                       local_f28 + local_598 +
                                                                      local_f88) - local_f38) -
                                                                    local_5a8) + local_13a8) -
                                                                  local_fa8) + local_12a8 +
                                                                  local_f48 + local_5b8 + local_678
                                                                  + local_18cc + local_648 +
                                                                  local_ce8 + local_f78 + local_177c
                                                                 ) - local_fb8) - local_578) +
                                                               local_ef8 + local_f18 + local_12d8 +
                                                              fVar109) - local_588) + local_5c8) -
                                                           local_15e8) - local_638) + local_1118 +
                                                          local_14f8 + local_10c8) - local_1188) +
                                                        local_ab8 + local_328) - local_a18) -
                                                     local_998) + local_338 + local_12f8 + local_a08
                                                     + local_348 + local_13d8) - local_358) -
                                                  local_1078) + local_1088 + local_10b8) -
                                                local_10a8) + local_1508) - local_11b8) + local_1618
                                             + local_318) - local_9f8) + local_ae8 + local_308 +
                                           local_1098) - local_b98) + local_14e8) - local_14d8) -
                                       local_1108) + local_1228 + local_d78 + local_2e8 + local_9d8
                                      + local_968) - local_2f8) + local_488 + local_498 + local_4b8
                                     + local_4a8 + local_d68 + local_888 + local_958 + local_2d8 +
                                    local_1498) - local_1068) - local_1428) + local_b08 + local_2c8)
                                - local_cd8) - local_10e8) + local_10f8 + local_b28 + local_2b8 +
                               fVar86 + local_a68 + local_1418) - local_9c8) - local_948) -
                           local_1438) + local_1488 + local_1448 + local_938 + local_288 +
                          local_1408) - local_b38) - local_298) + local_1308 + local_2a8 +
                        local_1258 + local_1248) - local_11e8) + local_b48 + local_268 + local_928 +
                      local_918 + fVar21 + local_278 + local_9a8) - local_9b8) - local_14c8) +
                  local_14a8) - local_1388) + local_988 + local_ba8 + local_908 + fVar23 + local_478
                ) - local_c28) + local_ee8 + local_c08 + local_1818) - local_1458) + local_13c8) -
           local_978) + local_1538 + local_258 + local_1648 + local_d08 + local_13f8 + fVar135 +
           local_cb8 + local_b68 + local_af8 + fVar123 + local_c98 + local_c68 + fVar78 + local_11d8
           + fVar22;
      local_568._0_4_ =
           (((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((local_d58 - fVar40) +
                                                                             local_d18 + local_11a8)
                                                                           - local_458) + local_ca8
                                                                          + local_248) - local_878)
                                                                         + local_448 + local_c88 +
                                                                        local_c78) - local_868) +
                                                                       local_238 + local_858 +
                                                                       local_1838 + local_1128 +
                                                                      local_438) - local_c58) +
                                                                     local_218 + local_848 +
                                                                     local_428 + local_838) -
                                                                   local_1318) + local_228 +
                                                                   local_418 + local_c38 + local_d48
                                                                  + local_1018) - local_208) +
                                                                 local_828 + local_408 + local_818)
                                                               - local_3e8) + local_3f8) - local_1f8
                                                             ) + local_808 + local_1348 + local_1328
                                                            + local_a48) - local_1e8) - local_1828)
                                                          + local_10d8 + local_12c8 + local_1d8 +
                                                          local_12e8 + local_1338) - local_7f8) +
                                                       local_1c8) - local_3d8) + local_c18 +
                                                     local_1008) - local_8f8) + local_3c8 +
                                                    local_8e8 + local_1868 + local_1238 + local_3b8)
                                                  - local_be8) + local_a28 + local_8d8) - local_d38)
                                                + local_1718 + local_1b8 + local_1a8 + local_bd8 +
                                                local_3a8 + local_11c8) - local_7e8) + local_198 +
                                             local_8c8) - local_1708) + local_188 + local_398 +
                                            local_8b8 + local_d28 + local_388 + local_1478 +
                                           local_15c8) - local_178) + local_8a8) - local_368) +
                                       local_378) - local_ff8) + local_898 + local_1398 + local_1768
                                     + local_a58) - local_168) - local_18c8) + local_1528 +
                                   local_16f8 + local_158 + local_12b8 + local_1378) - local_7d8) +
                                 local_148 + local_a88 + local_1988 + local_1198 + local_fe8) -
                               local_1358) + local_19b8 + local_1908) - local_1518) + local_a98 +
                             local_18f8 + local_1178) - local_7c8) + local_138) - local_1978) +
                         local_1758 + local_128 + local_1628) - local_aa8) + local_a38) -
                     (float)local_19c8._0_4_) + local_ea8 + local_ad8) - local_118) + local_18e8 +
                  local_1138) - local_1148) - local_1158) + local_1168 + local_fd8 + local_f98 +
                local_ac8 + local_f8 + local_7b8 + local_108 + local_11f8 + local_1608 + local_15d8)
              - local_1778) + local_a78 + local_e8 + local_1948 + local_14b8 + local_13b8) -
            local_d8) - local_1808) + fVar19 + local_7a8 + local_c8;
      local_560 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                   *)CONCAT44(((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((
                                                  ((((((((((local_fc8 - local_e68) + local_e88) -
                                                         local_bb8) + local_5d8) - local_5f8) -
                                                      local_668) + local_1638) - local_5e8) +
                                                    local_bc8 + local_608) - local_bf8) + local_1748
                                                  + local_d88 + local_ec8) - local_eb8) + local_628
                                                  + local_cc8 + local_658 + local_cf8) - local_1728)
                                                  - local_1780) + local_ed8 + local_f68 + local_f08
                                                  + local_f58) - local_e78) + local_e98 + local_618
                                                  + local_15f8) - local_b88) - local_1208) +
                                                  local_f28 + local_598) - local_f88) + local_f38 +
                                                  local_5a8 + local_13a8 + local_fa8 + local_12a8) -
                                                  local_f48) - local_5b8) + local_678 + local_18cc +
                                                  local_648 + local_ce8) - local_f78) - local_177c)
                                                  + local_fb8 + local_578 + local_ef8 + local_f18 +
                                                  local_12d8 + fVar109 + local_588) - local_5c8) +
                                                  local_15e8 + local_638) - local_1118) - local_14f8
                                                  ) - local_10c8) + local_1188 + local_ab8 +
                                                  local_328 + local_a18 + local_998) - local_338) +
                                                  local_12f8) - local_a08) - local_348) + local_13d8
                                                  + local_358 + local_1078) - local_1088) -
                                                  local_10b8) + local_10a8) - local_1508) +
                                                  local_11b8 + local_1618 + local_318 + local_9f8) -
                                                  local_ae8) - local_308) - local_1098) + local_b98)
                                                  - local_14e8) + local_14d8 + local_1108) -
                                                  local_1228) + local_d78 + local_2e8) - local_9d8)
                                                  - local_968) + local_2f8 + local_488 + local_498 +
                                                  local_4b8 + local_4a8 + local_d68 + local_888 +
                                                  local_958 + local_2d8) - local_1498) + local_1068
                                                  + local_1428 + local_b08 + local_2c8 + local_cd8 +
                                                  local_10e8) - local_10f8) + local_b28 + local_2b8
                                                  + fVar86) - local_a68) + local_1418 + local_9c8 +
                                                 local_948 + local_1438) - local_1488) - local_1448)
                                              + local_938 + local_288 + local_1408 + local_b38 +
                                              local_298 + local_1308) - local_2a8) - local_1258) -
                                          local_1248) + local_11e8 + local_b48 + local_268 +
                                          local_928 + local_918 + fVar21 + local_278) - local_9a8) +
                                        local_9b8 + local_14c8) - local_14a8) + local_1388) -
                                    local_988) + local_ba8 + local_908 + fVar23) - local_478) +
                                 local_c28) - local_ee8) + local_c08 + local_1818 + local_1458 +
                                local_13c8 + local_978) - local_1538) + local_258 + local_1648 +
                              local_d08 + local_13f8 + fVar135 + local_cb8 + local_b68 + local_af8 +
                              fVar123 + local_c98 + local_c68 + fVar78 + local_11d8 + fVar22,
                              (local_b58 +
                              (local_b78 - local_17f8 * fStack_1910 * fStack_1920 * fStack_1210)) -
                              local_468);
      local_558 = (assign_op<float,_float> *)
                  CONCAT44(local_558._4_4_,
                           ((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((((
                                                  fVar40 - local_d58) + local_d18 + local_11a8 +
                                                  local_458) - local_ca8) + local_248 + local_878 +
                                                  local_448 + local_c88 + local_c78 + local_868) -
                                                  local_238) + local_858) - local_1838) + local_1128
                                                  ) - local_438) + local_c58 + local_218) -
                                                  local_848) + local_428 + local_838 + local_1318 +
                                                  local_228 + local_418 + local_c38 + local_d48) -
                                                  local_1018) + local_208 + local_828 + local_408 +
                                                  local_818 + local_3e8) - local_3f8) + local_1f8) -
                                                  local_808) + local_1348 + local_1328) - local_a48)
                                                  + local_1e8 + local_1828 + local_10d8) -
                                                  local_12c8) + local_1d8 + local_12e8 + local_1338
                                                  + local_7f8) - local_1c8) + local_3d8) - local_c18
                                                  ) + local_1008 + local_8f8 + local_3c8 + local_8e8
                                                  ) - local_1868) + local_1238) - local_3b8) +
                                                  local_be8 + local_a28) - local_8d8) + local_d38) -
                                                  local_1718) + local_1b8 + local_1a8 + local_bd8 +
                                                  local_3a8 + local_11c8 + local_7e8) - local_198) +
                                                  local_8c8 + local_1708 + local_188 + local_398 +
                                                  local_8b8 + local_d28 + local_388 + local_1478) -
                                                  local_15c8) + local_178 + local_8a8 + local_368) -
                                                  local_378) + local_ff8) - local_898) + local_1398
                                                  + local_1768) - local_a58) + local_168 +
                                                  local_18c8 + local_1528) - local_16f8) + local_158
                                                  + local_12b8 + local_1378 + local_7d8) - local_148
                                                  ) + local_a88 + local_1988 + local_1198) -
                                                local_fe8) + local_1358) - local_19b8) + local_1908
                                              + local_1518 + local_a98 + local_18f8 + local_1178 +
                                             local_7c8) - local_138) + local_1978 + local_1758) -
                                          local_128) + local_1628 + local_aa8) - local_a38) +
                                        (float)local_19c8._0_4_ + local_ea8) - local_ad8) +
                                     local_118) - local_18e8) - local_1138) + local_1148 +
                                  local_1158) - local_1168) + local_fd8 + local_f98 + local_ac8 +
                                 local_f8 + local_7b8 + local_108 + local_11f8 + local_1608) -
                               local_15d8) + local_1778 + local_a78 + local_e8 + local_1948) -
                             local_14b8) + local_13b8 + local_d8 + local_1808) - fVar19) + local_7a8
                           + local_c8);
      fStack_19d4 = local_19d8;
      fStack_19d0 = local_19d8;
      fStack_19cc = local_19d8;
      fStack_1994 = local_1998;
      fStack_1990 = local_1998;
      fStack_198c = local_1998;
      fStack_1984 = fStack_19b4;
      fStack_1980 = fStack_19b0;
      fStack_197c = fStack_19ac;
      fStack_1974 = fStack_19b4;
      fStack_1970 = fStack_19b4;
      fStack_196c = fStack_19b4;
      fStack_1964 = local_1968;
      fStack_1960 = local_1968;
      fStack_195c = local_1968;
      fStack_1934 = local_1938;
      fStack_1930 = local_1938;
      fStack_192c = local_1938;
      fStack_1924 = local_1968;
      fStack_1914 = local_1938;
      fStack_190c = local_19d8;
      fStack_18e4 = fStack_19ac;
      fStack_18e0 = fStack_19b0;
      fStack_18dc = fStack_19ac;
      fStack_1864 = fStack_19b4;
      fStack_1860 = fStack_19b0;
      fStack_185c = fStack_19ac;
      local_1848 = fStack_19ac;
      fStack_1844 = fStack_19ac;
      fStack_1840 = fStack_19ac;
      fStack_183c = fStack_19ac;
      fStack_1834 = fStack_19b4;
      fStack_1830 = fStack_19b0;
      fStack_182c = fStack_19ac;
      fStack_1824 = fStack_19ac;
      fStack_1820 = fStack_19ac;
      fStack_181c = fStack_19ac;
      fStack_17e4 = fStack_19b4;
      fStack_17e0 = fStack_19b4;
      fStack_17dc = fStack_19b4;
      local_17b8 = fStack_19b4;
      fStack_17b4 = fStack_19b4;
      fStack_17b0 = fStack_19b4;
      fStack_17ac = fStack_19b4;
      fStack_179c = local_1998;
      fStack_1774 = fStack_19ac;
      fStack_1770 = fStack_19b0;
      fStack_176c = fStack_19ac;
      fStack_1764 = fStack_19ac;
      fStack_1760 = fStack_19b0;
      fStack_175c = fStack_19ac;
      fStack_1754 = fStack_19b4;
      fStack_1750 = fStack_19b4;
      fStack_174c = fStack_19b4;
      fStack_1734 = fStack_19b4;
      fStack_1730 = fStack_19b0;
      fStack_172c = fStack_19ac;
      fStack_1714 = fStack_19b4;
      fStack_1710 = fStack_19b4;
      fStack_170c = fStack_19b4;
      fStack_1704 = fStack_19b4;
      fStack_1700 = fStack_19b4;
      fStack_16fc = fStack_19b4;
      fStack_1634 = local_1938;
      fStack_1630 = fStack_1910;
      fStack_162c = local_19d8;
      fStack_1624 = fStack_19ac;
      fStack_1620 = fStack_19b0;
      fStack_161c = fStack_19ac;
      fStack_15f4 = local_1968;
      fStack_15f0 = local_1968;
      fStack_15ec = local_1968;
      fStack_15e4 = local_1968;
      fStack_15e0 = fStack_1920;
      fStack_15dc = fStack_191c;
      fStack_15d4 = fStack_19ac;
      fStack_15d0 = fStack_19b0;
      fStack_15cc = fStack_19ac;
      fStack_15c4 = fStack_19b4;
      fStack_15c0 = fStack_19b0;
      fStack_15bc = fStack_19ac;
      fStack_1534 = local_1968;
      fStack_1530 = local_1968;
      fStack_152c = local_1968;
      fStack_1514 = fStack_19b4;
      fStack_1510 = fStack_19b0;
      fStack_150c = fStack_19ac;
      fStack_1504 = fStack_191c;
      fStack_1500 = fStack_1920;
      fStack_14fc = fStack_191c;
      fStack_14f4 = local_1968;
      fStack_14f0 = fStack_1920;
      fStack_14ec = fStack_191c;
      fStack_14e4 = fStack_191c;
      fStack_14e0 = fStack_1920;
      fStack_14dc = fStack_191c;
      fStack_14d4 = fStack_191c;
      fStack_14d0 = fStack_191c;
      fStack_14cc = fStack_191c;
      fStack_14c4 = local_19d8;
      fStack_14c0 = fStack_1910;
      fStack_14bc = local_19d8;
      fStack_14a4 = local_1968;
      fStack_14a0 = local_1968;
      fStack_149c = local_1968;
      fStack_1494 = local_1968;
      fStack_1490 = local_1968;
      fStack_148c = local_1968;
      fStack_1484 = local_1968;
      fStack_1480 = local_1968;
      fStack_147c = local_1968;
      fStack_1474 = fStack_19b4;
      fStack_1470 = fStack_19b4;
      fStack_146c = fStack_19b4;
      fStack_1454 = fStack_19ac;
      fStack_1450 = fStack_19b0;
      fStack_144c = fStack_19ac;
      fStack_1444 = fStack_19ac;
      fStack_1440 = fStack_19ac;
      fStack_143c = fStack_19ac;
      fStack_1434 = fStack_19ac;
      fStack_1430 = fStack_19ac;
      fStack_142c = fStack_19ac;
      fStack_1424 = fStack_19ac;
      fStack_1420 = fStack_19b0;
      fStack_141c = fStack_19ac;
      fStack_13e4 = fStack_19b4;
      fStack_13e0 = fStack_19b0;
      fStack_13dc = fStack_19ac;
      fStack_13c4 = fStack_19ac;
      fStack_13c0 = fStack_19b0;
      fStack_13bc = fStack_19ac;
      fStack_1384 = fStack_19b4;
      fStack_1380 = fStack_19b4;
      fStack_137c = fStack_19b4;
      fStack_1354 = fStack_19b4;
      fStack_1350 = fStack_19b0;
      fStack_134c = fStack_19ac;
      fStack_1324 = fStack_19ac;
      fStack_1320 = fStack_19b0;
      fStack_131c = fStack_19ac;
      fStack_1314 = fStack_19b4;
      fStack_1310 = fStack_19b4;
      fStack_130c = fStack_19b4;
      fStack_12f4 = fStack_19b4;
      fStack_12f0 = fStack_19b4;
      fStack_12ec = fStack_19b4;
      fStack_12e4 = fStack_19ac;
      fStack_12e0 = fStack_19ac;
      fStack_12dc = fStack_19ac;
      fStack_12c4 = fStack_19ac;
      fStack_12c0 = fStack_19ac;
      fStack_12bc = fStack_19ac;
      fStack_12a4 = fStack_19b4;
      fStack_12a0 = fStack_19b0;
      fStack_129c = fStack_19ac;
      fStack_1254 = local_1938;
      fStack_1250 = fStack_1910;
      fStack_124c = local_19d8;
      fStack_1244 = local_1968;
      fStack_1240 = fStack_1920;
      fStack_123c = fStack_191c;
      fStack_1234 = fStack_19b4;
      fStack_1230 = fStack_19b0;
      fStack_122c = fStack_19ac;
      fStack_1224 = fStack_191c;
      fStack_1220 = fStack_191c;
      fStack_121c = fStack_191c;
      fStack_1204 = fStack_19b4;
      fStack_1200 = fStack_19b0;
      fStack_11fc = fStack_19ac;
      fStack_11f4 = local_1938;
      fStack_11f0 = fStack_1910;
      fStack_11ec = local_19d8;
      fStack_11e4 = local_1938;
      fStack_11e0 = fStack_1910;
      fStack_11dc = local_19d8;
      fStack_11b4 = local_1938;
      fStack_11b0 = local_1938;
      fStack_11ac = local_1938;
      fStack_1184 = local_19d8;
      fStack_1180 = local_19d8;
      fStack_117c = local_19d8;
      fStack_1174 = local_19d8;
      fStack_1170 = fStack_1910;
      fStack_116c = local_19d8;
      fStack_1164 = fStack_19ac;
      fStack_1160 = fStack_19b0;
      fStack_115c = fStack_19ac;
      fStack_1154 = local_1938;
      fStack_1150 = fStack_1910;
      fStack_114c = local_19d8;
      fStack_1144 = fStack_19ac;
      fStack_1140 = fStack_19b0;
      fStack_113c = fStack_19ac;
      fStack_1134 = local_1938;
      fStack_1130 = local_1938;
      fStack_112c = local_1938;
      fStack_1124 = fStack_19b4;
      fStack_1120 = fStack_19b0;
      fStack_111c = fStack_19ac;
      fStack_1114 = local_19d8;
      fStack_1110 = local_19d8;
      fStack_110c = local_19d8;
      fStack_1104 = fStack_191c;
      fStack_1100 = fStack_1920;
      fStack_10fc = fStack_191c;
      fStack_10f4 = local_1968;
      fStack_10f0 = fStack_1920;
      fStack_10ec = fStack_191c;
      fStack_10e4 = local_1968;
      fStack_10e0 = fStack_1920;
      fStack_10dc = fStack_191c;
      fStack_10c4 = local_1968;
      fStack_10c0 = fStack_1920;
      fStack_10bc = fStack_191c;
      fStack_10b4 = fStack_191c;
      fStack_10b0 = fStack_1920;
      fStack_10ac = fStack_191c;
      fStack_10a4 = fStack_191c;
      fStack_10a0 = fStack_191c;
      fStack_109c = fStack_191c;
      fStack_1094 = fStack_191c;
      fStack_1090 = fStack_1920;
      fStack_108c = fStack_191c;
      fStack_1084 = local_1968;
      fStack_1080 = fStack_1920;
      fStack_107c = fStack_191c;
      fStack_1074 = fStack_191c;
      fStack_1070 = fStack_1920;
      fStack_106c = fStack_191c;
      fStack_1064 = local_1968;
      fStack_1060 = local_1968;
      fStack_105c = local_1968;
      fStack_1014 = local_1938;
      fStack_1010 = fStack_1910;
      fStack_100c = local_19d8;
      fStack_1004 = fStack_19ac;
      fStack_1000 = fStack_19b0;
      fStack_ffc = fStack_19ac;
      fStack_ff4 = local_1938;
      fStack_ff0 = fStack_1910;
      fStack_fec = local_19d8;
      fStack_fe4 = local_1968;
      fStack_fe0 = local_1968;
      fStack_fdc = local_1968;
      fStack_fd4 = local_1968;
      fStack_fd0 = local_1968;
      fStack_fcc = local_1968;
      fStack_fc4 = local_19d8;
      fStack_fc0 = local_19d8;
      fStack_fbc = local_19d8;
      fStack_fb4 = local_19d8;
      fStack_fb0 = local_19d8;
      fStack_fac = local_19d8;
      fStack_fa4 = fStack_19b4;
      fStack_fa0 = fStack_19b0;
      fStack_f9c = fStack_19ac;
      fStack_f84 = fStack_19b4;
      fStack_f80 = fStack_19b0;
      fStack_f7c = fStack_19ac;
      fStack_f74 = fStack_191c;
      fStack_f70 = fStack_191c;
      fStack_f6c = fStack_191c;
      fStack_f64 = fStack_19b4;
      fStack_f60 = fStack_19b0;
      fStack_f5c = fStack_19ac;
      fStack_f44 = local_1968;
      fStack_f40 = fStack_1920;
      fStack_f3c = fStack_191c;
      fStack_f34 = local_1968;
      fStack_f30 = fStack_1920;
      fStack_f2c = fStack_191c;
      fStack_f24 = local_1968;
      fStack_f20 = fStack_1920;
      fStack_f1c = fStack_191c;
      fStack_f14 = fStack_19b4;
      fStack_f10 = fStack_19b4;
      fStack_f0c = fStack_19b4;
      fStack_f04 = fStack_19b4;
      fStack_f00 = fStack_19b0;
      fStack_efc = fStack_19ac;
      fStack_ee4 = fStack_19ac;
      fStack_ee0 = fStack_19b0;
      fStack_edc = fStack_19ac;
      fStack_ed4 = local_19d8;
      fStack_ed0 = local_19d8;
      fStack_ecc = local_19d8;
      fStack_ec4 = local_19d8;
      fStack_ec0 = fStack_1910;
      fStack_ebc = local_19d8;
      fStack_eb4 = fStack_19b4;
      fStack_eb0 = fStack_19b0;
      fStack_eac = fStack_19ac;
      fStack_ea4 = fStack_1644;
      fStack_ea0 = fStack_1640;
      fStack_e9c = fStack_163c;
      fStack_e94 = fStack_19b4;
      fStack_e90 = fStack_19b0;
      fStack_e8c = fStack_19ac;
      fStack_e74 = local_19d8;
      fStack_e70 = fStack_1910;
      fStack_e6c = local_19d8;
      fStack_e64 = fStack_191c;
      fStack_e60 = fStack_191c;
      fStack_e5c = fStack_191c;
      fStack_d74 = local_1938;
      fStack_d70 = fStack_1910;
      fStack_d6c = local_19d8;
      fStack_d64 = local_1938;
      fStack_d60 = fStack_1910;
      fStack_d5c = local_19d8;
      fStack_d54 = local_19d8;
      fStack_d50 = fStack_1910;
      fStack_d4c = local_19d8;
      fStack_d44 = local_1938;
      fStack_d40 = fStack_1910;
      fStack_d3c = local_19d8;
      fStack_d34 = local_19d8;
      fStack_d30 = fStack_1910;
      fStack_d2c = local_19d8;
      fStack_d24 = local_1938;
      fStack_d20 = local_1938;
      fStack_d1c = local_1938;
      fStack_d14 = local_19d8;
      fStack_d10 = fStack_1910;
      fStack_d0c = local_19d8;
      fStack_d04 = local_1968;
      fStack_d00 = local_1968;
      fStack_cfc = local_1968;
      fStack_cf4 = fStack_191c;
      fStack_cf0 = fStack_191c;
      fStack_cec = fStack_191c;
      fStack_cd4 = local_1938;
      fStack_cd0 = fStack_1910;
      fStack_ccc = local_19d8;
      fStack_ca4 = fStack_19b4;
      fStack_ca0 = fStack_19b0;
      fStack_c9c = fStack_19ac;
      fStack_c94 = local_1938;
      fStack_c90 = local_1938;
      fStack_c8c = local_1938;
      fStack_c84 = local_19d8;
      fStack_c80 = local_19d8;
      fStack_c7c = local_19d8;
      fStack_c74 = local_19d8;
      fStack_c70 = local_19d8;
      fStack_c6c = local_19d8;
      fStack_c54 = fStack_19b4;
      fStack_c50 = fStack_19b4;
      fStack_c4c = fStack_19b4;
      fStack_c24 = fStack_19ac;
      fStack_c20 = fStack_19b0;
      fStack_c1c = fStack_19ac;
      fStack_c14 = fStack_19b4;
      fStack_c10 = fStack_19b0;
      fStack_c0c = fStack_19ac;
      fStack_c04 = local_1938;
      fStack_c00 = fStack_1910;
      fStack_bfc = local_19d8;
      fStack_bf4 = local_1968;
      fStack_bf0 = fStack_1920;
      fStack_bec = fStack_191c;
      fStack_be4 = fStack_19b4;
      fStack_be0 = fStack_19b4;
      fStack_bdc = fStack_19b4;
      fStack_bd4 = fStack_19b4;
      fStack_bd0 = fStack_19b4;
      fStack_bcc = fStack_19b4;
      fStack_bc4 = local_1938;
      fStack_bc0 = fStack_1910;
      fStack_bbc = local_19d8;
      fStack_bb4 = local_1968;
      fStack_bb0 = fStack_1920;
      fStack_bac = fStack_191c;
      fStack_b94 = local_1938;
      fStack_b90 = fStack_1910;
      fStack_b8c = local_19d8;
      fStack_b84 = local_1968;
      fStack_b80 = local_1968;
      fStack_b7c = local_1968;
      fStack_b54 = local_1968;
      fStack_b50 = fStack_1920;
      fStack_b4c = fStack_191c;
      fStack_b34 = local_1938;
      fStack_b30 = fStack_1910;
      fStack_b2c = local_19d8;
      fStack_b24 = local_1938;
      fStack_b20 = fStack_1910;
      fStack_b1c = local_19d8;
      fStack_b14 = fStack_19ac;
      fStack_b10 = fStack_19b0;
      fStack_b0c = fStack_19ac;
      fStack_af4 = fStack_19ac;
      fStack_af0 = fStack_19b0;
      fStack_aec = fStack_19ac;
      fStack_ae4 = local_1938;
      fStack_ae0 = fStack_1910;
      fStack_adc = local_19d8;
      fStack_ad4 = local_1938;
      fStack_ad0 = fStack_1910;
      fStack_acc = local_19d8;
      fStack_aa4 = local_1938;
      fStack_aa0 = local_1938;
      fStack_a9c = local_1938;
      fStack_a94 = local_19d8;
      fStack_a90 = fStack_1910;
      fStack_a8c = local_19d8;
      fStack_a84 = fStack_19b4;
      fStack_a80 = fStack_19b0;
      fStack_a7c = fStack_19ac;
      fStack_a64 = fStack_19ac;
      fStack_a60 = fStack_19ac;
      fStack_a5c = fStack_19ac;
      fStack_a54 = local_1938;
      fStack_a50 = fStack_1910;
      fStack_a4c = local_19d8;
      fStack_a44 = local_1938;
      fStack_a40 = fStack_1910;
      fStack_a3c = local_19d8;
      fStack_a34 = fStack_19ac;
      fStack_a30 = fStack_19b0;
      fStack_a2c = fStack_19ac;
      fStack_a14 = local_1968;
      fStack_a10 = fStack_1920;
      fStack_a0c = fStack_191c;
      fStack_a04 = local_1968;
      fStack_a00 = fStack_1920;
      fStack_9fc = fStack_191c;
      fStack_9f4 = fStack_19ac;
      fStack_9f0 = fStack_19b0;
      fStack_9ec = fStack_19ac;
      fStack_9e4 = fStack_19ac;
      fStack_9e0 = fStack_19ac;
      fStack_9dc = fStack_19ac;
      fStack_9d4 = local_1938;
      fStack_9d0 = fStack_1910;
      fStack_9cc = local_19d8;
      fStack_9c4 = local_1938;
      fStack_9c0 = fStack_1910;
      fStack_9bc = local_19d8;
      fStack_9b4 = fStack_19b4;
      fStack_9b0 = fStack_19b4;
      fStack_9ac = fStack_19b4;
      fStack_9a4 = local_19d8;
      fStack_9a0 = fStack_1910;
      fStack_99c = local_19d8;
      fStack_994 = fStack_19b4;
      fStack_990 = fStack_19b4;
      fStack_98c = fStack_19b4;
      fStack_984 = fStack_19b4;
      fStack_980 = fStack_19b4;
      fStack_97c = fStack_19b4;
      fStack_964 = fStack_19ac;
      fStack_960 = fStack_19b0;
      fStack_95c = fStack_19ac;
      fStack_944 = fStack_19ac;
      fStack_940 = fStack_19ac;
      fStack_93c = fStack_19ac;
      fStack_934 = local_1968;
      fStack_930 = fStack_1920;
      fStack_92c = fStack_191c;
      fStack_924 = local_1968;
      fStack_920 = fStack_1920;
      fStack_91c = fStack_191c;
      fStack_904 = fStack_19ac;
      fStack_900 = fStack_19b0;
      fStack_8fc = fStack_19ac;
      fStack_8f4 = fStack_19b4;
      fStack_8f0 = fStack_19b0;
      fStack_8ec = fStack_19ac;
      fStack_8d4 = fStack_19b4;
      fStack_8d0 = fStack_19b4;
      fStack_8cc = fStack_19b4;
      fStack_8c4 = fStack_19b4;
      fStack_8c0 = fStack_19b4;
      fStack_8bc = fStack_19b4;
      fStack_8b4 = fStack_19ac;
      fStack_8b0 = fStack_19b0;
      fStack_8ac = fStack_19ac;
      fStack_874 = fStack_19b4;
      fStack_870 = fStack_19b0;
      fStack_86c = fStack_19ac;
      fStack_864 = local_1968;
      fStack_860 = fStack_1920;
      fStack_85c = fStack_191c;
      fStack_854 = fStack_163c;
      fStack_850 = fStack_163c;
      fStack_84c = fStack_163c;
      fStack_844 = fStack_19b4;
      fStack_840 = fStack_19b4;
      fStack_83c = fStack_19b4;
      fStack_834 = fStack_19b4;
      fStack_830 = fStack_19b4;
      fStack_82c = fStack_19b4;
      fStack_824 = fStack_19ac;
      fStack_820 = fStack_19b0;
      fStack_81c = fStack_19ac;
      fStack_814 = fStack_163c;
      fStack_810 = fStack_163c;
      fStack_80c = fStack_163c;
      fStack_804 = fStack_19ac;
      fStack_800 = fStack_19b0;
      fStack_7fc = fStack_19ac;
      fStack_7f4 = local_1968;
      fStack_7f0 = fStack_1920;
      fStack_7ec = fStack_191c;
      fStack_7e4 = local_1968;
      fStack_7e0 = fStack_1920;
      fStack_7dc = fStack_191c;
      fStack_7d4 = local_1968;
      fStack_7d0 = fStack_1920;
      fStack_7cc = fStack_191c;
      fStack_7c4 = local_1968;
      fStack_7c0 = fStack_1920;
      fStack_7bc = fStack_191c;
      fStack_7b4 = local_1968;
      fStack_7b0 = fStack_1920;
      fStack_7ac = fStack_191c;
      fStack_7a4 = local_1968;
      fStack_7a0 = fStack_1920;
      fStack_79c = fStack_191c;
      fStack_684 = fStack_19ac;
      fStack_680 = fStack_19b0;
      fStack_67c = fStack_19ac;
      fStack_664 = fStack_191c;
      fStack_660 = fStack_1920;
      fStack_65c = fStack_191c;
      fStack_644 = local_19d8;
      fStack_640 = fStack_1910;
      fStack_63c = local_19d8;
      fStack_634 = local_1968;
      fStack_630 = local_1968;
      fStack_62c = local_1968;
      fStack_624 = local_19d8;
      fStack_620 = fStack_1910;
      fStack_61c = local_19d8;
      fStack_614 = local_1968;
      fStack_610 = fStack_1920;
      fStack_60c = fStack_191c;
      fStack_604 = local_1938;
      fStack_600 = fStack_1910;
      fStack_5fc = local_19d8;
      fStack_5f4 = local_1968;
      fStack_5f0 = fStack_1920;
      fStack_5ec = fStack_191c;
      fStack_5e4 = local_1938;
      fStack_5e0 = fStack_1910;
      fStack_5dc = local_19d8;
      fStack_5d4 = local_1968;
      fStack_5d0 = fStack_1920;
      fStack_5cc = fStack_191c;
      fStack_5c4 = local_19d8;
      fStack_5c0 = local_19d8;
      fStack_5bc = local_19d8;
      fStack_5b4 = fStack_19b4;
      fStack_5b0 = fStack_19b0;
      fStack_5ac = fStack_19ac;
      fStack_5a4 = fStack_19b4;
      fStack_5a0 = fStack_19b0;
      fStack_59c = fStack_19ac;
      fStack_584 = fStack_191c;
      fStack_580 = fStack_191c;
      fStack_57c = fStack_191c;
      fStack_574 = fStack_19b4;
      fStack_570 = fStack_19b4;
      fStack_56c = fStack_19b4;
      fStack_4b4 = local_1938;
      fStack_4b0 = fStack_1910;
      fStack_4ac = local_19d8;
      fStack_4a4 = local_1968;
      fStack_4a0 = fStack_1920;
      fStack_49c = fStack_191c;
      fStack_494 = local_1938;
      fStack_490 = local_1938;
      fStack_48c = local_1938;
      fStack_484 = local_1968;
      fStack_480 = local_1968;
      fStack_47c = local_1968;
      fStack_474 = fStack_191c;
      fStack_470 = fStack_1920;
      fStack_46c = fStack_191c;
      fStack_454 = local_19d8;
      fStack_450 = fStack_1910;
      fStack_44c = local_19d8;
      fStack_434 = fStack_191c;
      fStack_430 = fStack_1920;
      fStack_42c = fStack_191c;
      fStack_424 = local_1968;
      fStack_420 = fStack_1920;
      fStack_41c = fStack_191c;
      fStack_414 = fStack_191c;
      fStack_410 = fStack_1920;
      fStack_40c = fStack_191c;
      fStack_404 = local_1938;
      fStack_400 = fStack_1910;
      fStack_3fc = local_19d8;
      fStack_3f4 = local_1968;
      fStack_3f0 = fStack_1920;
      fStack_3ec = fStack_191c;
      fStack_3e4 = local_1938;
      fStack_3e0 = fStack_1910;
      fStack_3dc = local_19d8;
      fStack_3d4 = fStack_191c;
      fStack_3d0 = fStack_1920;
      fStack_3cc = fStack_191c;
      fStack_3c4 = local_1968;
      fStack_3c0 = local_1968;
      fStack_3bc = local_1968;
      fStack_3b4 = local_19d8;
      fStack_3b0 = fStack_1910;
      fStack_3ac = local_19d8;
      fStack_3a4 = local_19d8;
      fStack_3a0 = fStack_1910;
      fStack_39c = local_19d8;
      fStack_394 = local_1938;
      fStack_390 = local_1938;
      fStack_38c = local_1938;
      fStack_374 = local_1938;
      fStack_370 = local_1938;
      fStack_36c = local_1938;
      fStack_364 = local_1968;
      fStack_360 = local_1968;
      fStack_35c = local_1968;
      fStack_354 = local_1968;
      fStack_350 = fStack_1920;
      fStack_34c = fStack_191c;
      fStack_344 = fStack_19b4;
      fStack_340 = fStack_19b4;
      fStack_33c = fStack_19b4;
      fStack_334 = local_1968;
      fStack_330 = fStack_1920;
      fStack_32c = fStack_191c;
      fStack_324 = local_1968;
      fStack_320 = local_1968;
      fStack_31c = local_1968;
      fStack_314 = local_1938;
      fStack_310 = local_1938;
      fStack_30c = local_1938;
      fStack_304 = fStack_19ac;
      fStack_300 = fStack_19b0;
      fStack_2fc = fStack_19ac;
      fStack_2f4 = local_1938;
      fStack_2f0 = fStack_1910;
      fStack_2ec = local_19d8;
      fStack_2e4 = fStack_191c;
      fStack_2e0 = fStack_191c;
      fStack_2dc = fStack_191c;
      fStack_2d4 = local_1938;
      fStack_2d0 = local_1938;
      fStack_2cc = local_1938;
      fStack_2c4 = local_1938;
      fStack_2c0 = local_1938;
      fStack_2bc = local_1938;
      fStack_2a4 = local_1938;
      fStack_2a0 = fStack_1910;
      fStack_29c = local_19d8;
      fStack_274 = fStack_1614;
      fStack_270 = fStack_1610;
      fStack_26c = fStack_160c;
      fStack_264 = local_1968;
      fStack_260 = local_1968;
      fStack_25c = local_1968;
      fStack_244 = local_19d8;
      fStack_240 = local_19d8;
      fStack_23c = local_19d8;
      fStack_234 = local_19d8;
      fStack_230 = local_19d8;
      fStack_22c = local_19d8;
      fStack_214 = fStack_191c;
      fStack_210 = fStack_191c;
      fStack_20c = fStack_191c;
      fStack_204 = fStack_191c;
      fStack_200 = fStack_191c;
      fStack_1fc = fStack_191c;
      fStack_1f4 = local_1938;
      fStack_1f0 = fStack_1910;
      fStack_1ec = local_19d8;
      fStack_1e4 = fStack_19ac;
      fStack_1e0 = fStack_19b0;
      fStack_1dc = fStack_19ac;
      fStack_1d4 = fStack_19ac;
      fStack_1d0 = fStack_19ac;
      fStack_1cc = fStack_19ac;
      fStack_1c4 = fStack_19ac;
      fStack_1c0 = fStack_19ac;
      fStack_1bc = fStack_19ac;
      fStack_174 = local_1938;
      fStack_170 = local_1938;
      fStack_16c = local_1938;
      fStack_164 = fStack_19ac;
      fStack_160 = fStack_19b0;
      fStack_15c = fStack_19ac;
      fStack_134 = fStack_19b4;
      fStack_130 = fStack_19b4;
      fStack_12c = fStack_19b4;
      fStack_124 = fStack_19b4;
      fStack_120 = fStack_19b4;
      fStack_11c = fStack_19b4;
      fStack_114 = fStack_19ac;
      fStack_110 = fStack_19b0;
      fStack_10c = fStack_19ac;
      fStack_e4 = local_1938;
      fStack_e0 = local_1938;
      fStack_dc = local_1938;
      o4_roots<float>((vector<float,_std::allocator<float>_> *)local_16b8,
                      (Matrix<float,_5,_1,_0,_5,_1> *)local_568);
      *(undefined8 *)local_1788 = 0;
      *(pointer *)(local_1788 + 8) = (pointer)0x0;
      *(pointer *)(local_1788 + 0x10) = (pointer)0x0;
      uVar18 = (ulong)(local_16b8._8_8_ - local_16b8._0_8_) >> 2;
      if ((int)uVar18 != 0) {
        fVar40 = -local_1468;
        fStack_1774 = -fStack_e54;
        fStack_1770 = -fStack_e50;
        fStack_176c = -fStack_e4c;
        local_1778 = -local_e58 * (float)local_1888._0_4_ * local_1928 +
                     local_1918 * local_688 * (float)local_1858._0_4_ +
                     local_1918 * local_1468 * (float)local_18b8._0_4_ +
                     fVar40 * (float)local_18a8._0_4_ * local_1928;
        fVar19 = local_1468 * local_1938;
        local_1468 = local_1918 * local_1468 * local_1968 - local_1928 * fVar19;
        local_e58 = -local_e58 * (float)local_1888._0_4_ * local_1968 +
                    local_688 * local_1938 * (float)local_1858._0_4_ +
                    fVar19 * (float)local_18b8._0_4_ + fVar40 * (float)local_18a8._0_4_ * local_1968
        ;
        fStack_e54 = fStack_1774;
        fStack_e50 = fStack_1770;
        fStack_e4c = fStack_176c;
        do {
          fVar40 = *(float *)(local_16b8._8_8_ + -4);
          local_1264 = fVar40 * fVar40 + 1.0;
          local_1260 = (1.0 - fVar40 * fVar40) / local_1264;
          local_1264 = (fVar40 + fVar40) / local_1264;
          fStack_19b4 = -fStack_1734;
          fStack_19b0 = -fStack_1730;
          fStack_19ac = -fStack_172c;
          fVar86 = -(local_1738 * local_1260) * (float)local_17c8._0_4_;
          local_1948 = local_19d8 * fVar86;
          local_1758 = (float)local_16e8._0_4_ * local_1260;
          local_1308 = local_17a8 * local_1758;
          local_17d8 = local_1998 * local_1758;
          local_17e8 = local_17b8 * local_1260;
          local_17f8 = local_1848 * -local_1260 * (float)local_17c8._0_4_ * local_1918;
          local_12a8 = (float)local_17c8._0_4_ * local_17e8;
          fStack_12a4 = (float)local_17c8._4_4_;
          fStack_12a0 = fStack_17c0;
          fStack_129c = fStack_17bc;
          fStack_1804 = -(float)local_17c8._4_4_;
          fStack_1800 = -fStack_17c0;
          fStack_17fc = -fStack_17bc;
          local_1808 = -local_12a8 * (float)local_1898._0_4_;
          local_1748 = local_1958 * local_1758;
          local_12c8 = local_1918 * local_1748;
          local_1758 = local_1758 * local_1878;
          local_1768 = -local_1260 * (float)local_1798._0_4_ * (float)local_17c8._0_4_ * local_1938;
          fStack_1764 = -0.0;
          fStack_1760 = -0.0;
          fStack_175c = -0.0;
          fVar86 = fVar86 * (float)local_1888._0_4_;
          local_1708 = (float)local_1298._0_4_ * local_1260;
          fStack_1704 = (float)local_1298._4_4_;
          fStack_1700 = fStack_1290;
          fStack_16fc = fStack_128c;
          local_16f8 = local_1738 * local_1264;
          fStack_1714 = -(float)local_17c8._4_4_;
          fStack_1710 = -fStack_17c0;
          fStack_170c = -fStack_17bc;
          local_1718 = -((float)local_17c8._0_4_ * local_16f8) * (float)local_1898._0_4_;
          local_1438 = (float)local_17c8._0_4_ * local_17b8 * local_1264;
          local_12b8 = local_19d8 * local_1438;
          fVar40 = (float)local_16e8._0_4_ * local_1264;
          local_12d8 = local_17a8 * fVar40;
          local_1318 = local_1918 * local_12d8;
          local_12e8 = local_1998 * fVar40;
          fStack_12f4 = -(float)local_16e8._4_4_;
          fStack_12f0 = -fStack_16e0;
          fStack_12ec = -fStack_16dc;
          local_18e8 = local_1958 * -fVar40;
          local_12f8 = -fVar40 * local_1878;
          fStack_1320 = -0.0;
          fStack_131c = -0.0;
          local_798 = (undefined1  [8])(CONCAT44(local_798._4_4_,local_1264) ^ 0x80000000);
          local_1328 = -local_1264 * local_1848 * (float)local_17c8._0_4_ * local_1938;
          fStack_1324 = -0.0;
          local_1338 = (float)local_1798._0_4_ * local_1264 * (float)local_17c8._0_4_ * local_1918;
          fStack_1334 = (float)local_1798._4_4_;
          fStack_1330 = fStack_1790;
          fStack_132c = fStack_178c;
          local_1438 = local_1438 * (float)local_1888._0_4_;
          local_1348 = (float)local_1298._0_4_ * local_1264;
          fStack_1344 = (float)local_1298._4_4_;
          fStack_1340 = fStack_1290;
          fStack_133c = fStack_128c;
          fVar40 = local_1264 * local_1260;
          local_1688._0_4_ = local_1260;
          local_1838 = local_1260 * local_1260;
          fVar19 = local_1738 * local_1838;
          local_1358 = local_1848 * local_1838;
          local_1388 = local_1958 * fVar19;
          local_1818 = (float)local_1888._0_4_ * local_1388;
          local_18f8 = local_17b8 * local_1838;
          fStack_18f4 = fStack_17b4;
          fStack_18f0 = fStack_17b0;
          fStack_18ec = fStack_17ac;
          local_1828 = local_17a8 * local_18f8;
          local_1838 = local_1838 * (float)local_1798._0_4_;
          fStack_1834 = 0.0;
          fStack_1830 = 0.0;
          fStack_182c = 0.0;
          local_13a8 = local_1264 * local_1264;
          local_1378 = local_1738 * local_13a8;
          fVar78 = local_17b8 * local_13a8;
          local_1368 = local_17a8 * fVar78;
          local_1398 = local_1848 * local_13a8;
          local_13a8 = local_13a8 * (float)local_1798._0_4_;
          fStack_13a4 = 0.0;
          fStack_13a0 = 0.0;
          fStack_139c = 0.0;
          fVar109 = local_1738 * fVar40;
          local_13d8 = local_17a8 * fVar109;
          fStack_13d4 = fStack_17a4;
          fStack_13d0 = fStack_17a0;
          fStack_13cc = fStack_179c;
          fStack_13b4 = -fStack_17a4;
          fStack_13b0 = -fStack_17a0;
          fStack_13ac = -fStack_179c;
          local_13b8 = -local_13d8 * (float)local_1888._0_4_;
          local_13e8 = local_1958 * fVar109;
          local_13c8 = (float)local_1888._0_4_ * local_13e8;
          fVar21 = -fVar109 * local_1998 * (float)local_1888._0_4_;
          local_13f8 = local_1878 * fVar109 * (float)local_1888._0_4_;
          fVar109 = local_17b8 * fVar40;
          local_1428 = local_17a8 * fVar109;
          local_1418 = (float)local_1888._0_4_ * local_1428;
          local_1408 = local_1998 * fVar109 * (float)local_1888._0_4_;
          local_1908 = local_17a8 * local_1848 * fVar40;
          local_1448 = local_1848 * fVar40 * local_1958;
          local_1458 = local_17a8 * fVar40 * (float)local_1798._0_4_;
          local_1868 = local_1958 * fVar109;
          local_18c8 = (float)local_1888._0_4_ * local_1868;
          fVar22 = fVar109 * local_1878 * (float)local_1888._0_4_;
          fVar123 = -(fVar40 * (float)local_1798._0_4_) * local_1958;
          local_1978 = (float)local_17c8._0_4_ * local_16f8 * (float)local_1888._0_4_;
          fStack_1974 = (float)local_17c8._4_4_;
          fStack_1970 = fStack_17c0;
          fStack_196c = fStack_17bc;
          fVar40 = ((((local_1308 * local_1938 * (float)local_1858._0_4_ +
                      local_12a8 * (float)local_1888._0_4_ * local_1928 +
                      fVar86 * local_1968 + local_1468) - local_12c8 * (float)local_1858._0_4_) +
                    local_1978 * local_1928) - local_1318 * (float)local_1858._0_4_) +
                   local_1438 * local_1968 + local_18e8 * local_1938 * (float)local_1858._0_4_ +
                   local_1818 * (float)local_1858._0_4_;
          fVar135 = -local_18f8 * local_17a8 * (float)local_1888._0_4_;
          fVar109 = local_1958 * local_1378 * (float)local_1888._0_4_;
          _local_19c8 = ZEXT416((uint)fVar109);
          local_19b8 = fVar109 * (float)local_1858._0_4_;
          local_1988 = (float)local_1888._0_4_ * local_1368 * (float)local_1858._0_4_;
          local_19ec = -(local_1938 * fVar123 * (float)local_1858._0_4_ +
                        fVar22 * local_1968 +
                        ((local_18c8 * local_19a8 +
                         (((local_1938 * local_1908 * (float)local_1858._0_4_ +
                           local_1408 * local_1928 +
                           ((local_1418 * local_19e8 +
                            local_13f8 * local_1928 +
                            fVar21 * local_1968 +
                            ((local_13c8 * local_19e8 +
                             (float)local_1898._0_4_ * local_13d8 * (float)local_1858._0_4_ +
                             local_13b8 * local_19a8 +
                             local_1958 * local_13a8 * local_1918 * (float)local_1858._0_4_ +
                             (((local_1998 * fVar78 * (float)local_1888._0_4_ * local_1968 +
                               local_1958 * fVar78 * local_19d8 * (float)local_1858._0_4_ +
                               (((float)local_1888._0_4_ * local_1368 * local_19a8 +
                                ((local_17a8 * local_1838 * local_1938 * (float)local_1858._0_4_ +
                                 (float)local_1898._0_4_ * local_1828 * (float)local_1858._0_4_ +
                                 (((local_17a8 * local_1358 * local_1918 * (float)local_1858._0_4_ +
                                   ((local_17a8 * fVar19 * local_19d8 * (float)local_1858._0_4_ +
                                    ((((float)local_18a8._0_4_ * local_18e8 *
                                       (float)local_1858._0_4_ +
                                      local_17b8 * local_1264 * (float)local_16d8._0_4_ *
                                      (float)local_1888._0_4_ * (float)local_1858._0_4_ +
                                      local_1438 * (float)local_18b8._0_4_ +
                                      local_1338 * local_1928 +
                                      local_1328 * local_1928 +
                                      local_1918 * local_12f8 * local_1928 +
                                      local_1918 * local_12e8 * local_1968 +
                                      local_1918 * local_18e8 * local_19e8 +
                                      local_1318 * local_19a8 +
                                      local_12b8 * local_1928 +
                                      local_1718 * local_1928 +
                                      local_17a8 * local_1708 * (float)local_1888._0_4_ *
                                      (float)local_1858._0_4_ +
                                      (float)local_18a8._0_4_ * local_1308 * (float)local_1858._0_4_
                                      + ((fVar86 * (float)local_18b8._0_4_ +
                                         local_1768 * local_1928 +
                                         local_1918 * local_1758 * local_1968 +
                                         local_12c8 * local_19a8 +
                                         local_1808 * local_1928 +
                                         local_17f8 * local_1928 +
                                         local_1918 * local_17d8 * local_1928 +
                                         local_1918 * local_1308 * local_19e8 +
                                         local_1948 * local_1928 + local_1778) -
                                        local_1738 * local_1260 * (float)local_16d8._0_4_ *
                                        (float)local_1888._0_4_ * (float)local_1858._0_4_)) -
                                     local_1958 * local_1348 * (float)local_1888._0_4_ *
                                     (float)local_1858._0_4_) -
                                    (float)local_1888._0_4_ * local_17a8 * fVar19 * local_19e8)) -
                                   local_1998 * fVar19 * (float)local_1888._0_4_ * local_1928)) -
                                  local_1818 * local_19a8) -
                                 fVar19 * local_1878 * (float)local_1888._0_4_ * local_1968)) -
                                (float)local_1898._0_4_ * local_1958 * local_1378 *
                                (float)local_1858._0_4_)) -
                               (float)local_1888._0_4_ * local_1958 * fVar78 * local_19e8)) -
                              fVar78 * local_1878 * (float)local_1888._0_4_ * local_1928) -
                             local_1958 * local_1398 * local_1938 * (float)local_1858._0_4_)) -
                            local_19d8 * local_13e8 * (float)local_1858._0_4_)) -
                           local_19d8 * local_1428 * (float)local_1858._0_4_)) -
                          local_1918 * local_1448 * (float)local_1858._0_4_) -
                         local_1918 * local_1458 * (float)local_1858._0_4_)) -
                        (float)local_1898._0_4_ * local_1868 * (float)local_1858._0_4_)) /
                       (((fVar40 - local_1828 * (float)local_1888._0_4_ * (float)local_1858._0_4_) +
                        local_19b8) - local_1988);
          local_125c = -(fVar123 * local_1918 * (float)local_1858._0_4_ +
                        local_1458 * local_1938 * (float)local_1858._0_4_ +
                        local_1448 * local_1938 * (float)local_1858._0_4_ +
                        fVar22 * local_1928 +
                        (((local_18c8 * local_19e8 +
                          local_1428 * (float)local_1898._0_4_ * (float)local_1858._0_4_ +
                          (((local_13e8 * (float)local_1898._0_4_ * (float)local_1858._0_4_ +
                            ((local_1908 * local_1918 * (float)local_1858._0_4_ +
                             fVar21 * local_1928 +
                             local_13d8 * local_19d8 * (float)local_1858._0_4_ +
                             local_13b8 * local_19e8 +
                             ((local_1398 * local_17a8 * local_1938 * (float)local_1858._0_4_ +
                              ((local_1378 * local_1878 * (float)local_1888._0_4_ * local_1928 +
                               ((fVar109 * local_19e8 +
                                local_17a8 * local_1378 * (float)local_1898._0_4_ *
                                (float)local_1858._0_4_ +
                                ((local_1838 * local_1958 * local_1938 * (float)local_1858._0_4_ +
                                 ((local_1958 * local_18f8 * (float)local_1898._0_4_ *
                                   (float)local_1858._0_4_ +
                                  ((local_1358 * local_1958 * local_1918 * (float)local_1858._0_4_ +
                                   ((fVar135 * local_19e8 +
                                    local_1388 * local_19d8 * (float)local_1858._0_4_ +
                                    local_1348 * local_17a8 * (float)local_1888._0_4_ *
                                    (float)local_1858._0_4_ +
                                    local_12d8 * (float)local_18a8._0_4_ * (float)local_1858._0_4_ +
                                    (((local_1338 * local_1968 +
                                      local_1328 * local_1968 +
                                      local_12f8 * local_1938 * local_1928 +
                                      local_12e8 * local_1938 * local_1968 +
                                      local_18e8 * local_1938 * local_19e8 +
                                      local_1938 * local_12d8 * local_19a8 +
                                      local_12b8 * local_1968 +
                                      local_1718 * local_1968 +
                                      local_1708 * local_1958 * (float)local_1888._0_4_ *
                                      (float)local_1858._0_4_ +
                                      local_1748 * (float)local_18a8._0_4_ * (float)local_1858._0_4_
                                      + (((local_1768 * local_1968 +
                                          local_1758 * local_1938 * local_1968 +
                                          local_1938 * local_1748 * local_19a8 +
                                          local_1808 * local_1968 +
                                          local_17f8 * local_1968 +
                                          local_17d8 * local_1938 * local_1928 +
                                          local_1308 * local_1938 * local_19e8 +
                                          local_1948 * local_1968 + local_e58) -
                                         local_12a8 * (float)local_1888._0_4_ *
                                         (float)local_18b8._0_4_) -
                                        local_17e8 * (float)local_16d8._0_4_ *
                                        (float)local_1888._0_4_ * (float)local_1858._0_4_)) -
                                     local_1978 * (float)local_18b8._0_4_) -
                                    local_16f8 * (float)local_16d8._0_4_ * (float)local_1888._0_4_ *
                                    (float)local_1858._0_4_)) -
                                   local_1998 * local_18f8 * (float)local_1888._0_4_ * local_1928))
                                  - (float)local_1888._0_4_ * local_1958 * local_18f8 * local_19a8))
                                 - local_18f8 * local_1878 * (float)local_1888._0_4_ * local_1968))
                                - (float)local_1888._0_4_ * local_17a8 * local_1378 * local_19a8)) -
                               local_1998 * local_1378 * (float)local_1888._0_4_ * local_1968)) -
                              local_1368 * local_19d8 * (float)local_1858._0_4_)) -
                             local_13a8 * local_17a8 * local_1918 * (float)local_1858._0_4_)) -
                            local_13c8 * local_19a8)) - local_13f8 * local_1968) -
                          local_1418 * local_19a8)) -
                         local_1868 * local_19d8 * (float)local_1858._0_4_) -
                        local_1408 * local_1968)) /
                       ((fVar135 * (float)local_1858._0_4_ + fVar40 + local_19b8) - local_1988);
          local_16b8._8_8_ = local_16b8._8_8_ + -4;
          local_15b8 = (undefined1  [8])local_1688;
          uStack_15b0 = (plainobjectbase_evaluator_data<float,_3> *)0x0;
          local_15a8 = (assign_op<float,_float> *)0x1;
          uStack_15a0 = (XprTypeNested)0x1;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_15b8,
                               (Scalar *)local_798);
          local_16c8.data = local_16c8.data & 0xffffffff00000000;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,(Scalar *)&local_16c8);
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_19ec);
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1264);
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1260);
          local_1268 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1268);
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_125c);
          local_126c = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_126c);
          local_1270 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1270);
          local_1274 = 1.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1274);
          local_1278 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1278);
          local_127c = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_127c);
          local_1280 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1280);
          local_1284 = 0.0;
          pCVar15 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                              (pCVar15,&local_1284);
          local_1288 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::operator_
                    (pCVar15,&local_1288);
          if (((undefined1 *)
               ((long)&uStack_15b0->data +
               (long)&((DstXprType *)uStack_15a0)->
                      super_BlockImpl<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
               ) != (undefined1 *)0x4) || (local_15a8 != (assign_op<float,_float> *)0x4)) {
            __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                          ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                          "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 4, 4>>::finished() [MatrixType = Eigen::Matrix<float, 4, 4>]"
                         );
          }
          local_16c8.data = (float *)&local_b8;
          local_16c0 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
                        *)local_1688;
          Eigen::internal::
          Assignment<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<float,_4,_4,_0,_4,_4> *)local_15b8,(SrcXprType *)&local_16c8,
                (assign_op<float,_float> *)local_798);
          local_1578 = local_16c0;
          pgStack_1568 = local_16c0;
          local_1560 = 4;
          fVar40 = *(float *)&local_16c0->m_dst;
          fVar19 = *(float *)((long)&local_16c0->m_dst + 4);
          fVar78 = *(float *)&local_16c0->m_src;
          fVar86 = *(float *)((long)&local_16c0->m_src + 4);
          local_798._0_4_ =
               fVar86 * (float)local_1588 +
               fVar78 * (float)local_1598 +
               fVar19 * (float)local_15a8 + fVar40 * (float)local_15b8._0_4_;
          local_798._4_4_ =
               fVar86 * local_1588._4_4_ +
               fVar78 * local_1598._4_4_ +
               fVar19 * local_15a8._4_4_ + fVar40 * (float)local_15b8._4_4_;
          fVar109 = fVar86 * (float)uStack_1580 +
                    fVar78 * (float)uStack_1590 +
                    fVar19 * (float)uStack_15a0 + fVar40 * (float)uStack_15b0;
          fVar123 = fVar86 * uStack_1580._4_4_ +
                    fVar78 * uStack_1590._4_4_ +
                    fVar19 * uStack_15a0._4_4_ + fVar40 * uStack_15b0._4_4_;
          uStack_790 = (DstXprType *)CONCAT44(fVar123,fVar109);
          fVar40 = *(float *)&local_16c0->m_functor;
          fVar19 = *(float *)((long)&local_16c0->m_functor + 4);
          fVar78 = *(float *)&local_16c0->m_dstExpr;
          fVar86 = *(float *)((long)&local_16c0->m_dstExpr + 4);
          fVar135 = fVar86 * (float)local_1588 +
                    fVar78 * (float)local_1598 +
                    fVar19 * (float)local_15a8 + fVar40 * (float)local_15b8._0_4_;
          fVar21 = fVar86 * local_1588._4_4_ +
                   fVar78 * local_1598._4_4_ +
                   fVar19 * local_15a8._4_4_ + fVar40 * (float)local_15b8._4_4_;
          fVar22 = fVar86 * (float)uStack_1580 +
                   fVar78 * (float)uStack_1590 +
                   fVar19 * (float)uStack_15a0 + fVar40 * (float)uStack_15b0;
          fVar23 = fVar86 * uStack_1580._4_4_ +
                   fVar78 * uStack_1590._4_4_ +
                   fVar19 * uStack_15a0._4_4_ + fVar40 * uStack_15b0._4_4_;
          local_788 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
                       *)CONCAT44(fVar21,fVar135);
          uStack_780 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                        *)CONCAT44(fVar23,fVar22);
          fVar40 = *(float *)&local_16c0[1].m_dst;
          fVar19 = *(float *)((long)&local_16c0[1].m_dst + 4);
          fVar78 = *(float *)&local_16c0[1].m_src;
          fVar86 = *(float *)((long)&local_16c0[1].m_src + 4);
          local_778 = fVar86 * (float)local_1588 +
                      fVar78 * (float)local_1598 +
                      fVar19 * (float)local_15a8 + fVar40 * (float)local_15b8._0_4_;
          fStack_774 = fVar86 * local_1588._4_4_ +
                       fVar78 * local_1598._4_4_ +
                       fVar19 * local_15a8._4_4_ + fVar40 * (float)local_15b8._4_4_;
          fStack_770 = fVar86 * (float)uStack_1580 +
                       fVar78 * (float)uStack_1590 +
                       fVar19 * (float)uStack_15a0 + fVar40 * (float)uStack_15b0;
          fStack_76c = fVar86 * uStack_1580._4_4_ +
                       fVar78 * uStack_1590._4_4_ +
                       fVar19 * uStack_15a0._4_4_ + fVar40 * uStack_15b0._4_4_;
          fVar40 = *(float *)&local_16c0[1].m_functor;
          fVar19 = *(float *)((long)&local_16c0[1].m_functor + 4);
          fVar78 = *(float *)&local_16c0[1].m_dstExpr;
          fVar86 = *(float *)((long)&local_16c0[1].m_dstExpr + 4);
          fVar94 = fVar86 * (float)local_1588 +
                   fVar78 * (float)local_1598 +
                   fVar19 * (float)local_15a8 + fVar40 * (float)local_15b8._0_4_;
          fVar24 = fVar86 * local_1588._4_4_ +
                   fVar78 * local_1598._4_4_ +
                   fVar19 * local_15a8._4_4_ + fVar40 * (float)local_15b8._4_4_;
          fStack_760 = fVar86 * (float)uStack_1580 +
                       fVar78 * (float)uStack_1590 +
                       fVar19 * (float)uStack_15a0 + fVar40 * (float)uStack_15b0;
          fStack_75c = fVar86 * uStack_1580._4_4_ +
                       fVar78 * uStack_1590._4_4_ +
                       fVar19 * uStack_15a0._4_4_ + fVar40 * uStack_15b0._4_4_;
          local_768 = CONCAT44(fVar24,fVar94);
          local_758 = local_1058;
          local_740 = 4;
          fStack_1650 = fStack_101c * fStack_760 +
                        fStack_1020 * fStack_770 + fStack_1024 * fVar22 + local_1028 * fVar109;
          fStack_164c = fStack_101c * fStack_75c +
                        fStack_1020 * fStack_76c + fStack_1024 * fVar23 + local_1028 * fVar123;
          local_1688._4_4_ =
               uStack_1050._4_4_ * fVar24 +
               (float)uStack_1050 * fStack_774 +
               (float)local_1058._4_4_ * fVar21 + (float)local_1058._0_4_ * (float)local_798._4_4_;
          local_1688._0_4_ =
               uStack_1050._4_4_ * fVar94 +
               (float)uStack_1050 * local_778 +
               (float)local_1058._4_4_ * fVar135 + (float)local_1058._0_4_ * (float)local_798._0_4_;
          uStack_1680._4_4_ =
               uStack_1050._4_4_ * fStack_75c +
               (float)uStack_1050 * fStack_76c +
               (float)local_1058._4_4_ * fVar23 + (float)local_1058._0_4_ * fVar123;
          uStack_1680._0_4_ =
               uStack_1050._4_4_ * fStack_760 +
               (float)uStack_1050 * fStack_770 +
               (float)local_1058._4_4_ * fVar22 + (float)local_1058._0_4_ * fVar109;
          local_1678._4_4_ =
               uStack_1040._4_4_ * fVar24 +
               (float)uStack_1040 * fStack_774 +
               local_1048._4_4_ * fVar21 + (float)local_1048 * (float)local_798._4_4_;
          local_1678._0_4_ =
               uStack_1040._4_4_ * fVar94 +
               (float)uStack_1040 * local_778 +
               local_1048._4_4_ * fVar135 + (float)local_1048 * (float)local_798._0_4_;
          uStack_1670 = (XprTypeNested)
                        CONCAT44(uStack_1040._4_4_ * fStack_75c +
                                 (float)uStack_1040 * fStack_76c +
                                 local_1048._4_4_ * fVar23 + (float)local_1048 * fVar123,
                                 uStack_1040._4_4_ * fStack_760 +
                                 (float)uStack_1040 * fStack_770 +
                                 local_1048._4_4_ * fVar22 + (float)local_1048 * fVar109);
          local_1668._4_4_ =
               uStack_1030._4_4_ * fVar24 +
               (float)uStack_1030 * fStack_774 +
               local_1038._4_4_ * fVar21 + (float)local_1038 * (float)local_798._4_4_;
          local_1668._0_4_ =
               uStack_1030._4_4_ * fVar94 +
               (float)uStack_1030 * local_778 +
               local_1038._4_4_ * fVar135 + (float)local_1038 * (float)local_798._0_4_;
          uStack_1660._4_4_ =
               uStack_1030._4_4_ * fStack_75c +
               (float)uStack_1030 * fStack_76c +
               local_1038._4_4_ * fVar23 + (float)local_1038 * fVar123;
          uStack_1660._0_4_ =
               uStack_1030._4_4_ * fStack_760 +
               (float)uStack_1030 * fStack_770 +
               local_1038._4_4_ * fVar22 + (float)local_1038 * fVar109;
          local_1658 = CONCAT44(fStack_101c * fVar24 +
                                fStack_1020 * fStack_774 +
                                fStack_1024 * fVar21 + local_1028 * (float)local_798._4_4_,
                                fStack_101c * fVar94 +
                                fStack_1020 * local_778 +
                                fStack_1024 * fVar135 + local_1028 * (float)local_798._0_4_);
          __position._M_current = *(Matrix<float,_4,_4,_0,_4,_4> **)(local_1788 + 8);
          local_1570 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<float,_3,__1,_0,_3,_4>_>,_Eigen::internal::assign_op<float,_float>,_0>
                        *)local_15b8;
          local_750 = (assign_op<float,_float> *)local_798;
          local_748 = local_758;
          if (__position._M_current == *(Matrix<float,_4,_4,_0,_4,_4> **)(local_1788 + 0x10)) {
            std::
            vector<Eigen::Matrix<float,4,4,0,4,4>,std::allocator<Eigen::Matrix<float,4,4,0,4,4>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,4,0,4,4>const&>
                      (local_1788,__position,(Matrix<float,_4,_4,_0,_4,_4> *)local_1688);
          }
          else {
            *(Index *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xc) = local_1658;
            *(ulong *)(((__position._M_current)->
                       super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data
                       .array + 0xe) = CONCAT44(fStack_164c,fStack_1650);
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 8) = local_1668;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 10) = uStack_1660;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 4) = local_1678;
            *(XprTypeNested *)
             (((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>)
              .m_storage.m_data.array + 6) = uStack_1670;
            *(undefined1 (*) [8])
             ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
             m_storage.m_data.array = local_1688;
            *(long *)(((__position._M_current)->
                      super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                      array + 2) = uStack_1680;
            *(Matrix<float,_4,_4,_0,_4,_4> **)(local_1788 + 8) = __position._M_current + 1;
          }
          uVar17 = (int)uVar18 - 1;
          uVar18 = (ulong)uVar17;
        } while (uVar17 != 0);
      }
      if ((DstEvaluatorType *)local_16b8._0_8_ != (DstEvaluatorType *)0x0) {
        operator_delete((void *)local_16b8._0_8_,CONCAT44(fStack_16a4,local_16a8) - local_16b8._0_8_
                       );
      }
      if (local_730.
          super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_730.
                        super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_730.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_730.
                              super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)local_1788;
    }
  }
  local_16c8.data = (float *)local_798;
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float, 6, 6>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 6, 6>>]"
               );
}

Assistant:

vector<Matrix<floatPrec, 4, 4>> solver1P3L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair)
{

	// check input vectors size
	if(plPair.size() < 1 || lPair.size() < 3){
		std::cerr << "Solver 3L1Q requires at least 1 plane, and 3 line pairs!" << std::endl;
		exit(-1);
	}

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu, P11, P12, Q11, Q12, P21, P22, Q21, Q22, P31, P32, Q31, Q32;
	Pi = plPair[0].first; Nu = plPair[0].second;

	P11 = lPair[0].first.first; P12 = lPair[0].first.second;
	Q11 = lPair[0].second.first; Q12 = lPair[0].second.second;
	P21 = lPair[1].first.first; P22 = lPair[1].first.second;
	Q21 = lPair[1].second.first; Q22 = lPair[1].second.second;
	P31 = lPair[2].first.first; P32 = lPair[2].first.second;
	Q31 = lPair[2].second.first; Q32 = lPair[2].second.second;

	bool verbose = false;

	Matrix<floatPrec, 3, 1> tP11, tP12, tQ11, tQ12;
	Matrix<floatPrec, 3, 1> tP21, tP22, tQ21, tQ22;
	Matrix<floatPrec, 3, 1> tP31, tP32, tQ31, tQ32;
	tP11 = P11.head(3) / P11(3);
	tP12 = P12.head(3) / P12(3);
	tQ11 = Q11.head(3) / Q11(3);
	tQ12 = Q12.head(3) / Q12(3);
	tP21 = P21.head(3) / P21(3);
	tP22 = P22.head(3) / P22(3);
	tQ21 = Q21.head(3) / Q21(3);
	tQ22 = Q22.head(3) / Q22(3);
	tP31 = P31.head(3) / P31(3);
	tP32 = P32.head(3) / P32(3);
	tQ31 = Q31.head(3) / Q31(3);
	tQ32 = Q32.head(3) / Q32(3);

	// computing the plucker coordinates of the lines
	// starting from line 1
	Matrix<floatPrec, 3, 1> D1;
	Matrix<floatPrec, 6, 1> L11;
	Matrix<floatPrec, 6, 1> L21;
	Matrix<floatPrec, 6, 1> L31;

	D1 = tP12 - tP11;
	L11.head(3) = D1;
	L11.tail(3) = tP12.cross(tP11);
	L11 /= L11.head(3).norm();
	D1 = tP22 - tP21;
	L21.head(3) = D1;
	L21.tail(3) = tP22.cross(tP21);
	L21 /= L21.head(3).norm();
	D1 = tP32 - tP31;
	L31.head(3) = D1;
	L31.tail(3) = tP32.cross(tP31);
	L31 /= L31.head(3).norm();

	// starting from line 2
	Matrix<floatPrec, 6, 1> L12;
	Matrix<floatPrec, 6, 1> L22;
	Matrix<floatPrec, 6, 1> L32;
	D1 = tQ12 - tQ11;
	L12.head(3) = D1;
	L12.tail(3) = tQ12.cross(tQ11);
	L12 /= L12.head(3).norm();
	D1 = tQ22 - tQ21;
	L22.head(3) = D1;
	L22.tail(3) = tQ22.cross(tQ21);
	L22 /= L22.head(3).norm();
	D1 = tQ32 - tQ31;
	L32.head(3) = D1;
	L32.tail(3) = tQ32.cross(tQ31);
	L32 /= L32.head(3).norm();

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TV = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU = predTrans.back();
	predTrans.pop_back();

	if (verbose)
		cout << "[VERBOSE] Matrix TU" << endl
			 << TU << endl;
	if (verbose)
		cout << "[VERBOSE] Matrix TV" << endl
			 << TV << endl;

	// define the transformation to the lines
	Matrix<floatPrec, 6, 6> TL, TK;
	TL = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TL.topLeftCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomRightCorner(3, 3) = TU.topLeftCorner(3, 3);
	TL.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TU.col(3).head(3)) * TU.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TL" << endl
			 << TL << endl;

	TK = Matrix<floatPrec, 6, 6>::Zero(6, 6);
	TK.topLeftCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomRightCorner(3, 3) = TV.topLeftCorner(3, 3);
	TK.bottomLeftCorner(3, 3) = -1 * getSkew<floatPrec>(TV.col(3).head(3)) * TV.topLeftCorner(3, 3);
	if (verbose)
		cout << "[VERBOSE] Matrix TK" << endl
			 << TK << endl;

	// apply predefined transformations to the lines
	// get the coefficients
	// get parameters of the first line correspondence
	Matrix<floatPrec, 6, 1> u1;
	floatPrec u11, u12, u13, u14, u15, u16;
	u1 = TL * L11;
	u11 = u1(0);
	u12 = u1(1);
	u13 = u1(2);
	u14 = u1(3);
	u15 = u1(4);
	u16 = u1(5);
	Matrix<floatPrec, 6, 1> v1;
	floatPrec v11, v12, v13, v14, v15, v16;
	v1 = TK * L12;
	v11 = v1(0);
	v12 = v1(1);
	v13 = v1(2);
	v14 = v1(3);
	v15 = v1(4);
	v16 = v1(5);

	// get the parameters of the secod line correspondence
	Matrix<floatPrec, 6, 1> u2;
	floatPrec u21, u22, u23, u24, u25, u26;
	u2 = TL * L21;
	u21 = u2(0);
	u22 = u2(1);
	u23 = u2(2);
	u24 = u2(3);
	u25 = u2(4);
	u26 = u2(5);

	Matrix<floatPrec, 6, 1> v2;
	floatPrec v21, v22, v23, v24, v25, v26;
	v2 = TK * L22;
	v21 = v2(0);
	v22 = v2(1);
	v23 = v2(2);
	v24 = v2(3);
	v25 = v2(4);
	v26 = v2(5);

	// get the parameters of the third line correspondence
	Matrix<floatPrec, 6, 1> u3;
	floatPrec u31, u32, u33, u34, u35, u36;
	u3 = TL * L31;
	u31 = u3(0);
	u32 = u3(1);
	u33 = u3(2);
	u34 = u3(3);
	u35 = u3(4);
	u36 = u3(5);

	Matrix<floatPrec, 6, 1> v3;
	floatPrec v31, v32, v33, v34, v35, v36;
	v3 = TK * L32;
	v31 = v3(0);
	v32 = v3(1);
	v33 = v3(2);
	v34 = v3(3);
	v35 = v3(4);
	v36 = v3(5);

	// compute the coefficients
	floatPrec c1, c2, c3, c4, c5;
	c1 = u11*u21*u32*v13*v24*v33 - u11*u21*u32*v14*v23*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 - u11*u22*u31*v13*v23*v34 + u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 - u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 - u11*u23*u33*v14*v21*v32 + u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 + u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 + u12*u21*u31*v13*v23*v34 - u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 + u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 - u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 + u13*u21*u33*v11*v24*v32 - u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 - u13*u23*u31*v11*v22*v34 + u13*u23*u31*v12*v21*v34 - u13*u23*u34*v11*v22*v31 + u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 + u13*u24*u33*v11*v21*v32 - u13*u24*u33*v12*v21*v31 - u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 + u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 - u14*u23*u33*v11*v21*v32 + u14*u23*u33*v11*v22*v31 - u11*u22*u32*v13*v23*v35 + u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 - u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 + u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 + u12*u21*u32*v13*v23*v35 - u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 + u12*u21*u35*v13*v23*v32 - u12*u22*u31*v13*v25*v33 + u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 - u12*u23*u33*v15*v21*v32 + u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 - u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 + u13*u22*u33*v11*v25*v32 - u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 - u13*u23*u32*v11*v22*v35 + u13*u23*u32*v12*v21*v35 - u13*u23*u35*v11*v22*v32 + u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 + u13*u25*u33*v11*v22*v32 - u13*u25*u33*v12*v22*v31 - u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 + u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 - u15*u23*u33*v12*v21*v32 + u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 + u11*u23*u33*v13*v22*v36 - u11*u23*u33*v13*v26*v32 + u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 - u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 - u12*u23*u33*v13*v21*v36 + u12*u23*u33*v13*v26*v31 - u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 + u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 - u13*u21*u33*v12*v23*v36 + u13*u21*u33*v16*v23*v32 - u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 + u13*u22*u33*v11*v23*v36 - u13*u22*u33*v16*v23*v31 + u13*u22*u36*v11*v23*v33 + u13*u23*u31*v12*v26*v33 - u13*u23*u31*v16*v22*v33 - u13*u23*u32*v11*v26*v33 + u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 + u13*u26*u31*v12*v23*v33 - u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 + u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 - u16*u22*u33*v13*v23*v31 - u16*u23*u31*v13*v22*v33 + u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;
	c2 = 2*u11*u21*u33*v13*v24*v31 - 2*u11*u21*u33*v14*v23*v31 - 2*u11*u23*u31*v13*v21*v34 + 2*u11*u23*u31*v14*v21*v33 - 2*u11*u23*u34*v13*v21*v31 + 2*u11*u24*u33*v13*v21*v31 + 2*u13*u21*u31*v11*v23*v34 - 2*u13*u21*u31*v11*v24*v33 + 2*u13*u21*u34*v11*v23*v31 - 2*u13*u24*u31*v11*v21*v33 - 2*u14*u21*u33*v11*v23*v31 + 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 - 2*u11*u21*u33*v13*v25*v32 + 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 + 2*u11*u22*u33*v13*v24*v32 + 2*u11*u22*u33*v13*v25*v31 - 2*u11*u22*u33*v14*v23*v32 - 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 + 2*u11*u23*u31*v13*v22*v35 - 2*u11*u23*u31*v15*v22*v33 - 2*u11*u23*u32*v13*v21*v35 - 2*u11*u23*u32*v13*v22*v34 + 2*u11*u23*u32*v14*v22*v33 + 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 + 2*u11*u23*u34*v13*v22*v32 - 2*u11*u23*u35*v13*v21*v32 - 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 - 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 + 2*u11*u25*u33*v13*v21*v32 + 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 + 2*u12*u21*u33*v13*v24*v32 + 2*u12*u21*u33*v13*v25*v31 - 2*u12*u21*u33*v14*v23*v32 - 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 - 2*u12*u22*u33*v13*v24*v31 + 2*u12*u22*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v35 - 2*u12*u23*u31*v13*v22*v34 + 2*u12*u23*u31*v14*v22*v33 + 2*u12*u23*u31*v15*v21*v33 + 2*u12*u23*u32*v13*v21*v34 - 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 - 2*u12*u23*u34*v13*v21*v32 - 2*u12*u23*u34*v13*v22*v31 + 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 + 2*u12*u24*u33*v13*v21*v32 + 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 - 2*u12*u25*u33*v13*v21*v31 - 2*u13*u21*u31*v12*v23*v35 + 2*u13*u21*u31*v12*v25*v33 + 2*u13*u21*u32*v11*v23*v35 - 2*u13*u21*u32*v11*v25*v33 + 2*u13*u21*u32*v12*v23*v34 - 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 - 2*u13*u21*u34*v12*v23*v32 + 2*u13*u21*u35*v11*v23*v32 + 2*u13*u21*u35*v12*v23*v31 + 2*u13*u22*u31*v11*v23*v35 - 2*u13*u22*u31*v11*v25*v33 + 2*u13*u22*u31*v12*v23*v34 - 2*u13*u22*u31*v12*v24*v33 - 2*u13*u22*u32*v11*v23*v34 + 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 + 2*u13*u22*u34*v11*v23*v32 + 2*u13*u22*u34*v12*v23*v31 - 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 + 2*u13*u24*u31*v12*v22*v33 - 2*u13*u24*u32*v11*v22*v33 - 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 - 2*u13*u25*u31*v11*v22*v33 - 2*u13*u25*u31*v12*v21*v33 + 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 + 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 - 2*u14*u22*u33*v11*v23*v32 - 2*u14*u22*u33*v12*v23*v31 - 2*u14*u23*u31*v12*v22*v33 + 2*u14*u23*u32*v11*v22*v33 + 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 - 2*u15*u21*u33*v11*v23*v32 - 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 + 2*u15*u22*u33*v11*v23*v31 + 2*u15*u23*u31*v11*v22*v33 + 2*u15*u23*u31*v12*v21*v33 - 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 + 2*u12*u22*u33*v13*v25*v32 - 2*u12*u22*u33*v15*v23*v32 - 2*u12*u23*u32*v13*v22*v35 + 2*u12*u23*u32*v15*v22*v33 - 2*u12*u23*u35*v13*v22*v32 + 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 + 2*u13*u22*u32*v12*v23*v35 - 2*u13*u22*u32*v12*v25*v33 + 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 - 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 - 2*u15*u22*u33*v12*v23*v32 + 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c3 = 2*u11*u21*u33*v14*v23*v32 - 4*u11*u21*u33*v13*v25*v31 - 2*u11*u21*u33*v13*v24*v32 + 4*u11*u21*u33*v15*v23*v31 + 4*u11*u22*u33*v13*v24*v31 - 2*u11*u22*u33*v14*v23*v31 + 4*u11*u23*u31*v13*v21*v35 + 2*u11*u23*u31*v13*v22*v34 - 2*u11*u23*u31*v14*v22*v33 - 4*u11*u23*u31*v15*v21*v33 - 4*u11*u23*u32*v13*v21*v34 + 2*u11*u23*u32*v14*v21*v33 + 4*u11*u23*u34*v13*v21*v32 + 2*u11*u23*u34*v13*v22*v31 - 4*u11*u23*u35*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v32 - 4*u11*u24*u33*v13*v22*v31 + 4*u11*u25*u33*v13*v21*v31 + 2*u12*u21*u33*v13*v24*v31 - 4*u12*u21*u33*v14*v23*v31 - 2*u12*u23*u31*v13*v21*v34 + 4*u12*u23*u31*v14*v21*v33 - 2*u12*u23*u34*v13*v21*v31 + 2*u12*u24*u33*v13*v21*v31 - 4*u13*u21*u31*v11*v23*v35 + 4*u13*u21*u31*v11*v25*v33 - 2*u13*u21*u31*v12*v23*v34 + 2*u13*u21*u31*v12*v24*v33 + 4*u13*u21*u32*v11*v23*v34 - 2*u13*u21*u32*v11*v24*v33 - 4*u13*u21*u34*v11*v23*v32 - 2*u13*u21*u34*v12*v23*v31 + 4*u13*u21*u35*v11*v23*v31 + 2*u13*u22*u31*v11*v23*v34 - 4*u13*u22*u31*v11*v24*v33 + 2*u13*u22*u34*v11*v23*v31 + 4*u13*u24*u31*v11*v22*v33 + 2*u13*u24*u31*v12*v21*v33 - 2*u13*u24*u32*v11*v21*v33 - 4*u13*u25*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v32 + 4*u14*u21*u33*v12*v23*v31 - 2*u14*u22*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v22*v33 - 4*u14*u23*u31*v12*v21*v33 + 2*u14*u23*u32*v11*v21*v33 - 4*u15*u21*u33*v11*v23*v31 + 4*u15*u23*u31*v11*v21*v33 - 2*u11*u22*u33*v13*v25*v32 + 4*u11*u22*u33*v15*v23*v32 + 2*u11*u23*u32*v13*v22*v35 - 4*u11*u23*u32*v15*v22*v33 + 2*u11*u23*u35*v13*v22*v32 - 2*u11*u25*u33*v13*v22*v32 - 4*u12*u21*u33*v13*v25*v32 + 2*u12*u21*u33*v15*v23*v32 + 4*u12*u22*u33*v13*v24*v32 + 2*u12*u22*u33*v13*v25*v31 - 4*u12*u22*u33*v14*v23*v32 - 2*u12*u22*u33*v15*v23*v31 + 4*u12*u23*u31*v13*v22*v35 - 2*u12*u23*u31*v15*v22*v33 - 2*u12*u23*u32*v13*v21*v35 - 4*u12*u23*u32*v13*v22*v34 + 4*u12*u23*u32*v14*v22*v33 + 2*u12*u23*u32*v15*v21*v33 + 4*u12*u23*u34*v13*v22*v32 - 2*u12*u23*u35*v13*v21*v32 - 4*u12*u23*u35*v13*v22*v31 - 4*u12*u24*u33*v13*v22*v32 + 4*u12*u25*u33*v13*v21*v32 + 2*u12*u25*u33*v13*v22*v31 - 2*u13*u21*u32*v12*v23*v35 + 4*u13*u21*u32*v12*v25*v33 - 2*u13*u21*u35*v12*v23*v32 - 4*u13*u22*u31*v12*v23*v35 + 2*u13*u22*u31*v12*v25*v33 + 2*u13*u22*u32*v11*v23*v35 - 2*u13*u22*u32*v11*v25*v33 + 4*u13*u22*u32*v12*v23*v34 - 4*u13*u22*u32*v12*v24*v33 - 4*u13*u22*u34*v12*v23*v32 + 2*u13*u22*u35*v11*v23*v32 + 4*u13*u22*u35*v12*v23*v31 + 4*u13*u24*u32*v12*v22*v33 + 2*u13*u25*u31*v12*v22*v33 - 2*u13*u25*u32*v11*v22*v33 - 4*u13*u25*u32*v12*v21*v33 + 4*u14*u22*u33*v12*v23*v32 - 4*u14*u23*u32*v12*v22*v33 + 2*u15*u21*u33*v12*v23*v32 - 4*u15*u22*u33*v11*v23*v32 - 2*u15*u22*u33*v12*v23*v31 - 2*u15*u23*u31*v12*v22*v33 + 4*u15*u23*u32*v11*v22*v33 + 2*u15*u23*u32*v12*v21*v33 + 2*u11*u22*u33*v13*v23*v36 + 2*u11*u22*u36*v13*v23*v33 - 2*u11*u23*u32*v13*v26*v33 - 2*u11*u26*u32*v13*v23*v33 - 2*u12*u21*u33*v13*v23*v36 - 2*u12*u21*u36*v13*v23*v33 + 2*u12*u23*u31*v13*v26*v33 + 2*u12*u26*u31*v13*v23*v33 + 2*u13*u21*u32*v16*v23*v33 - 2*u13*u22*u31*v16*v23*v33 + 2*u13*u23*u33*v11*v22*v36 - 2*u13*u23*u33*v11*v26*v32 - 2*u13*u23*u33*v12*v21*v36 + 2*u13*u23*u33*v12*v26*v31 + 2*u13*u23*u33*v16*v21*v32 - 2*u13*u23*u33*v16*v22*v31 + 2*u13*u23*u36*v11*v22*v33 - 2*u13*u23*u36*v12*v21*v33 - 2*u13*u26*u33*v11*v23*v32 + 2*u13*u26*u33*v12*v23*v31 + 2*u16*u21*u32*v13*v23*v33 - 2*u16*u22*u31*v13*v23*v33 + 2*u16*u23*u33*v13*v21*v32 - 2*u16*u23*u33*v13*v22*v31;
	c4 = 2*u11*u21*u33*v14*v23*v31 - 2*u11*u21*u33*v13*v24*v31 + 2*u11*u23*u31*v13*v21*v34 - 2*u11*u23*u31*v14*v21*v33 + 2*u11*u23*u34*v13*v21*v31 - 2*u11*u24*u33*v13*v21*v31 - 2*u13*u21*u31*v11*v23*v34 + 2*u13*u21*u31*v11*v24*v33 - 2*u13*u21*u34*v11*v23*v31 + 2*u13*u24*u31*v11*v21*v33 + 2*u14*u21*u33*v11*v23*v31 - 2*u14*u23*u31*v11*v21*v33 - 2*u11*u21*u32*v13*v25*v33 + 2*u11*u21*u32*v15*v23*v33 + 2*u11*u21*u33*v13*v25*v32 - 2*u11*u21*u33*v15*v23*v32 + 2*u11*u22*u31*v13*v23*v35 - 2*u11*u22*u31*v15*v23*v33 - 2*u11*u22*u32*v13*v23*v34 + 2*u11*u22*u32*v13*v24*v33 - 2*u11*u22*u33*v13*v24*v32 - 2*u11*u22*u33*v13*v25*v31 + 2*u11*u22*u33*v14*v23*v32 + 2*u11*u22*u33*v15*v23*v31 + 2*u11*u22*u34*v13*v23*v32 - 2*u11*u22*u35*v13*v23*v31 - 2*u11*u23*u31*v13*v22*v35 + 2*u11*u23*u31*v15*v22*v33 + 2*u11*u23*u32*v13*v21*v35 + 2*u11*u23*u32*v13*v22*v34 - 2*u11*u23*u32*v14*v22*v33 - 2*u11*u23*u32*v15*v21*v33 + 2*u11*u23*u33*v15*v21*v32 - 2*u11*u23*u33*v15*v22*v31 - 2*u11*u23*u34*v13*v22*v32 + 2*u11*u23*u35*v13*v21*v32 + 2*u11*u23*u35*v13*v22*v31 - 2*u11*u24*u32*v13*v22*v33 + 2*u11*u24*u33*v13*v22*v32 + 2*u11*u25*u32*v13*v21*v33 - 2*u11*u25*u33*v13*v21*v32 - 2*u11*u25*u33*v13*v22*v31 - 2*u12*u21*u31*v13*v23*v35 + 2*u12*u21*u31*v13*v25*v33 + 2*u12*u21*u32*v13*v23*v34 - 2*u12*u21*u32*v14*v23*v33 - 2*u12*u21*u33*v13*v24*v32 - 2*u12*u21*u33*v13*v25*v31 + 2*u12*u21*u33*v14*v23*v32 + 2*u12*u21*u33*v15*v23*v31 - 2*u12*u21*u34*v13*v23*v32 + 2*u12*u21*u35*v13*v23*v31 - 2*u12*u22*u31*v13*v24*v33 + 2*u12*u22*u31*v14*v23*v33 + 2*u12*u22*u33*v13*v24*v31 - 2*u12*u22*u33*v14*v23*v31 + 2*u12*u23*u31*v13*v21*v35 + 2*u12*u23*u31*v13*v22*v34 - 2*u12*u23*u31*v14*v22*v33 - 2*u12*u23*u31*v15*v21*v33 - 2*u12*u23*u32*v13*v21*v34 + 2*u12*u23*u32*v14*v21*v33 - 2*u12*u23*u33*v14*v21*v32 + 2*u12*u23*u33*v14*v22*v31 + 2*u12*u23*u34*v13*v21*v32 + 2*u12*u23*u34*v13*v22*v31 - 2*u12*u23*u35*v13*v21*v31 + 2*u12*u24*u31*v13*v22*v33 - 2*u12*u24*u33*v13*v21*v32 - 2*u12*u24*u33*v13*v22*v31 - 2*u12*u25*u31*v13*v21*v33 + 2*u12*u25*u33*v13*v21*v31 + 2*u13*u21*u31*v12*v23*v35 - 2*u13*u21*u31*v12*v25*v33 - 2*u13*u21*u32*v11*v23*v35 + 2*u13*u21*u32*v11*v25*v33 - 2*u13*u21*u32*v12*v23*v34 + 2*u13*u21*u32*v12*v24*v33 - 2*u13*u21*u33*v11*v25*v32 + 2*u13*u21*u33*v12*v25*v31 + 2*u13*u21*u34*v12*v23*v32 - 2*u13*u21*u35*v11*v23*v32 - 2*u13*u21*u35*v12*v23*v31 - 2*u13*u22*u31*v11*v23*v35 + 2*u13*u22*u31*v11*v25*v33 - 2*u13*u22*u31*v12*v23*v34 + 2*u13*u22*u31*v12*v24*v33 + 2*u13*u22*u32*v11*v23*v34 - 2*u13*u22*u32*v11*v24*v33 + 2*u13*u22*u33*v11*v24*v32 - 2*u13*u22*u33*v12*v24*v31 - 2*u13*u22*u34*v11*v23*v32 - 2*u13*u22*u34*v12*v23*v31 + 2*u13*u22*u35*v11*v23*v31 + 2*u13*u23*u31*v11*v22*v35 - 2*u13*u23*u31*v12*v21*v35 - 2*u13*u23*u32*v11*v22*v34 + 2*u13*u23*u32*v12*v21*v34 + 2*u13*u23*u34*v11*v22*v32 - 2*u13*u23*u34*v12*v21*v32 - 2*u13*u23*u35*v11*v22*v31 + 2*u13*u23*u35*v12*v21*v31 - 2*u13*u24*u31*v12*v22*v33 + 2*u13*u24*u32*v11*v22*v33 + 2*u13*u24*u32*v12*v21*v33 - 2*u13*u24*u33*v11*v22*v32 + 2*u13*u24*u33*v12*v22*v31 + 2*u13*u25*u31*v11*v22*v33 + 2*u13*u25*u31*v12*v21*v33 - 2*u13*u25*u32*v11*v21*v33 + 2*u13*u25*u33*v11*v21*v32 - 2*u13*u25*u33*v12*v21*v31 + 2*u14*u21*u32*v12*v23*v33 - 2*u14*u21*u33*v12*v23*v32 - 2*u14*u22*u31*v12*v23*v33 + 2*u14*u22*u33*v11*v23*v32 + 2*u14*u22*u33*v12*v23*v31 + 2*u14*u23*u31*v12*v22*v33 - 2*u14*u23*u32*v11*v22*v33 - 2*u14*u23*u32*v12*v21*v33 + 2*u14*u23*u33*v12*v21*v32 - 2*u14*u23*u33*v12*v22*v31 - 2*u15*u21*u32*v11*v23*v33 + 2*u15*u21*u33*v11*v23*v32 + 2*u15*u21*u33*v12*v23*v31 + 2*u15*u22*u31*v11*v23*v33 - 2*u15*u22*u33*v11*v23*v31 - 2*u15*u23*u31*v11*v22*v33 - 2*u15*u23*u31*v12*v21*v33 + 2*u15*u23*u32*v11*v21*v33 - 2*u15*u23*u33*v11*v21*v32 + 2*u15*u23*u33*v11*v22*v31 + 2*u11*u23*u33*v13*v21*v36 - 2*u11*u23*u33*v13*v26*v31 + 2*u11*u23*u36*v13*v21*v33 - 2*u11*u26*u33*v13*v23*v31 - 2*u12*u22*u33*v13*v25*v32 + 2*u12*u22*u33*v15*v23*v32 + 2*u12*u23*u32*v13*v22*v35 - 2*u12*u23*u32*v15*v22*v33 + 2*u12*u23*u35*v13*v22*v32 - 2*u12*u25*u33*v13*v22*v32 - 2*u13*u21*u33*v11*v23*v36 + 2*u13*u21*u33*v16*v23*v31 - 2*u13*u21*u36*v11*v23*v33 - 2*u13*u22*u32*v12*v23*v35 + 2*u13*u22*u32*v12*v25*v33 - 2*u13*u22*u35*v12*v23*v32 + 2*u13*u23*u31*v11*v26*v33 - 2*u13*u23*u31*v16*v21*v33 + 2*u13*u25*u32*v12*v22*v33 + 2*u13*u26*u31*v11*v23*v33 + 2*u15*u22*u33*v12*v23*v32 - 2*u15*u23*u32*v12*v22*v33 + 2*u16*u21*u33*v13*v23*v31 - 2*u16*u23*u31*v13*v21*v33 + 2*u12*u23*u33*v13*v22*v36 - 2*u12*u23*u33*v13*v26*v32 + 2*u12*u23*u36*v13*v22*v33 - 2*u12*u26*u33*v13*v23*v32 - 2*u13*u22*u33*v12*v23*v36 + 2*u13*u22*u33*v16*v23*v32 - 2*u13*u22*u36*v12*v23*v33 + 2*u13*u23*u32*v12*v26*v33 - 2*u13*u23*u32*v16*v22*v33 + 2*u13*u26*u32*v12*v23*v33 + 2*u16*u22*u33*v13*v23*v32 - 2*u16*u23*u32*v13*v22*v33;
	c5 = u11*u21*u32*v14*v23*v33 - u11*u21*u32*v13*v24*v33 + u11*u21*u33*v13*v24*v32 - u11*u21*u33*v14*v23*v32 + u11*u22*u31*v13*v23*v34 - u11*u22*u31*v14*v23*v33 + u11*u22*u33*v14*v23*v31 + u11*u22*u34*v13*v23*v31 - u11*u23*u31*v13*v22*v34 + u11*u23*u31*v14*v22*v33 - u11*u23*u32*v14*v21*v33 + u11*u23*u33*v14*v21*v32 - u11*u23*u33*v14*v22*v31 - u11*u23*u34*v13*v22*v31 - u11*u24*u32*v13*v21*v33 + u11*u24*u33*v13*v21*v32 - u12*u21*u31*v13*v23*v34 + u12*u21*u31*v13*v24*v33 - u12*u21*u33*v13*v24*v31 - u12*u21*u34*v13*v23*v31 + u12*u23*u31*v13*v21*v34 + u12*u23*u34*v13*v21*v31 + u12*u24*u31*v13*v21*v33 - u12*u24*u33*v13*v21*v31 + u13*u21*u31*v12*v23*v34 - u13*u21*u31*v12*v24*v33 + u13*u21*u32*v11*v24*v33 - u13*u21*u33*v11*v24*v32 + u13*u21*u33*v12*v24*v31 + u13*u21*u34*v12*v23*v31 - u13*u22*u31*v11*v23*v34 - u13*u22*u34*v11*v23*v31 + u13*u23*u31*v11*v22*v34 - u13*u23*u31*v12*v21*v34 + u13*u23*u34*v11*v22*v31 - u13*u23*u34*v12*v21*v31 - u13*u24*u31*v12*v21*v33 + u13*u24*u32*v11*v21*v33 - u13*u24*u33*v11*v21*v32 + u13*u24*u33*v12*v21*v31 + u14*u21*u32*v11*v23*v33 - u14*u21*u33*v11*v23*v32 - u14*u22*u31*v11*v23*v33 + u14*u22*u33*v11*v23*v31 + u14*u23*u31*v11*v22*v33 - u14*u23*u32*v11*v21*v33 + u14*u23*u33*v11*v21*v32 - u14*u23*u33*v11*v22*v31 + u11*u22*u32*v13*v23*v35 - u11*u22*u32*v13*v25*v33 + u11*u22*u33*v13*v25*v32 + u11*u22*u35*v13*v23*v32 - u11*u23*u32*v13*v22*v35 - u11*u23*u35*v13*v22*v32 - u11*u25*u32*v13*v22*v33 + u11*u25*u33*v13*v22*v32 - u12*u21*u32*v13*v23*v35 + u12*u21*u32*v15*v23*v33 - u12*u21*u33*v15*v23*v32 - u12*u21*u35*v13*v23*v32 + u12*u22*u31*v13*v25*v33 - u12*u22*u31*v15*v23*v33 - u12*u22*u33*v13*v25*v31 + u12*u22*u33*v15*v23*v31 + u12*u23*u31*v15*v22*v33 + u12*u23*u32*v13*v21*v35 - u12*u23*u32*v15*v21*v33 + u12*u23*u33*v15*v21*v32 - u12*u23*u33*v15*v22*v31 + u12*u23*u35*v13*v21*v32 + u12*u25*u31*v13*v22*v33 - u12*u25*u33*v13*v22*v31 + u13*u21*u32*v12*v23*v35 + u13*u21*u35*v12*v23*v32 - u13*u22*u31*v12*v25*v33 - u13*u22*u32*v11*v23*v35 + u13*u22*u32*v11*v25*v33 - u13*u22*u33*v11*v25*v32 + u13*u22*u33*v12*v25*v31 - u13*u22*u35*v11*v23*v32 + u13*u23*u32*v11*v22*v35 - u13*u23*u32*v12*v21*v35 + u13*u23*u35*v11*v22*v32 - u13*u23*u35*v12*v21*v32 - u13*u25*u31*v12*v22*v33 + u13*u25*u32*v11*v22*v33 - u13*u25*u33*v11*v22*v32 + u13*u25*u33*v12*v22*v31 + u15*u21*u32*v12*v23*v33 - u15*u21*u33*v12*v23*v32 - u15*u22*u31*v12*v23*v33 + u15*u22*u33*v12*v23*v31 + u15*u23*u31*v12*v22*v33 - u15*u23*u32*v12*v21*v33 + u15*u23*u33*v12*v21*v32 - u15*u23*u33*v12*v22*v31 + u11*u22*u33*v13*v23*v36 + u11*u22*u36*v13*v23*v33 - u11*u23*u32*v13*v26*v33 - u11*u23*u33*v13*v22*v36 + u11*u23*u33*v13*v26*v32 - u11*u23*u36*v13*v22*v33 - u11*u26*u32*v13*v23*v33 + u11*u26*u33*v13*v23*v32 - u12*u21*u33*v13*v23*v36 - u12*u21*u36*v13*v23*v33 + u12*u23*u31*v13*v26*v33 + u12*u23*u33*v13*v21*v36 - u12*u23*u33*v13*v26*v31 + u12*u23*u36*v13*v21*v33 + u12*u26*u31*v13*v23*v33 - u12*u26*u33*v13*v23*v31 + u13*u21*u32*v16*v23*v33 + u13*u21*u33*v12*v23*v36 - u13*u21*u33*v16*v23*v32 + u13*u21*u36*v12*v23*v33 - u13*u22*u31*v16*v23*v33 - u13*u22*u33*v11*v23*v36 + u13*u22*u33*v16*v23*v31 - u13*u22*u36*v11*v23*v33 - u13*u23*u31*v12*v26*v33 + u13*u23*u31*v16*v22*v33 + u13*u23*u32*v11*v26*v33 - u13*u23*u32*v16*v21*v33 + u13*u23*u33*v11*v22*v36 - u13*u23*u33*v11*v26*v32 - u13*u23*u33*v12*v21*v36 + u13*u23*u33*v12*v26*v31 + u13*u23*u33*v16*v21*v32 - u13*u23*u33*v16*v22*v31 + u13*u23*u36*v11*v22*v33 - u13*u23*u36*v12*v21*v33 - u13*u26*u31*v12*v23*v33 + u13*u26*u32*v11*v23*v33 - u13*u26*u33*v11*v23*v32 + u13*u26*u33*v12*v23*v31 + u16*u21*u32*v13*v23*v33 - u16*u21*u33*v13*v23*v32 - u16*u22*u31*v13*v23*v33 + u16*u22*u33*v13*v23*v31 + u16*u23*u31*v13*v22*v33 - u16*u23*u32*v13*v21*v33 + u16*u23*u33*v13*v21*v32 - u16*u23*u33*v13*v22*v31;

	//	std::cerr << "[ERR]: new version working" << std::endl;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = c1;
	factors(1, 0) = c2;
	factors(2, 0) = c3;
	factors(3, 0) = c4;
	factors(4, 0) = c5;
	vector<floatPrec> realRoots = o4_roots(factors);
	if (verbose)
		cout << "[VERBOSE] The number of valid solutions is: " << realRoots.size() << endl;

	// estimate the resulting transformations for each of the roots
	floatPrec s, sTheta1, sTheta2, tx, ty;
	floatPrec a, b, shouldBeZero1, shouldBeZero2;
	Matrix<floatPrec, 4, 4> transOut;
	vector<Matrix<floatPrec, 4, 4>> out;
	unsigned int numSolutions = realRoots.size();
	for (unsigned int iter = 0; iter < numSolutions; iter++)
	{

		// get the cTheta
		s = realRoots.back();
		realRoots.pop_back();

		// get the transformation for sTheta1
        a = (1-s*s) / (1+s*s);
        b = 2*s / (1+s*s);
		
		tx = -(u13 * u23 * v11 * v26 - u13 * u23 * v16 * v21 + u13 * u26 * v11 * v23 - u16 * u23 * v13 * v21 - a * u11 * u23 * v14 * v21 + a * u13 * u21 * v11 * v24 + a * u13 * u24 * v11 * v21 - a * u14 * u23 * v11 * v21 - a * u12 * u23 * v15 * v21 + a * u13 * u22 * v11 * v25 + a * u13 * u25 * v11 * v22 - a * u15 * u23 * v12 * v21 - a * u11 * u23 * v13 * v26 - a * u11 * u26 * v13 * v23 + a * u13 * u21 * v16 * v23 + a * u16 * u21 * v13 * v23 - b * u11 * u23 * v15 * v21 + b * u12 * u23 * v14 * v21 + b * u13 * u21 * v11 * v25 - b * u13 * u22 * v11 * v24 + b * u13 * u24 * v11 * v22 - b * u13 * u25 * v11 * v21 - b * u14 * u23 * v12 * v21 + b * u15 * u23 * v11 * v21 + b * u12 * u23 * v13 * v26 + b * u12 * u26 * v13 * v23 - b * u13 * u22 * v16 * v23 - b * u16 * u22 * v13 * v23 - (a * a) * u11 * u21 * v13 * v24 + (a * a) * u11 * u21 * v14 * v23 - (a * a) * u11 * u24 * v13 * v21 + (a * a) * u14 * u21 * v11 * v23 - (a * a) * u11 * u22 * v13 * v25 - (a * a) * u11 * u25 * v13 * v22 + (a * a) * u12 * u21 * v15 * v23 + (a * a) * u15 * u21 * v12 * v23 - (b * b) * u11 * u22 * v15 * v23 + (b * b) * u12 * u21 * v13 * v25 - (b * b) * u12 * u22 * v13 * v24 + (b * b) * u12 * u22 * v14 * v23 + (b * b) * u12 * u24 * v13 * v22 - (b * b) * u12 * u25 * v13 * v21 - (b * b) * u14 * u22 * v12 * v23 + (b * b) * u15 * u22 * v11 * v23 - a * b * u11 * u21 * v13 * v25 + a * b * u11 * u21 * v15 * v23 + a * b * u11 * u22 * v13 * v24 - a * b * u11 * u22 * v14 * v23 - a * b * u11 * u24 * v13 * v22 + a * b * u11 * u25 * v13 * v21 + a * b * u12 * u21 * v13 * v24 - a * b * u12 * u21 * v14 * v23 + a * b * u12 * u24 * v13 * v21 + a * b * u14 * u21 * v12 * v23 - a * b * u14 * u22 * v11 * v23 - a * b * u15 * u21 * v11 * v23 + a * b * u12 * u22 * v13 * v25 - a * b * u12 * u22 * v15 * v23 + a * b * u12 * u25 * v13 * v22 - a * b * u15 * u22 * v12 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		ty = -(u13 * u23 * v12 * v26 - u13 * u23 * v16 * v22 + u13 * u26 * v12 * v23 - u16 * u23 * v13 * v22 - a * u11 * u23 * v14 * v22 + a * u13 * u21 * v12 * v24 + a * u13 * u24 * v12 * v21 - a * u14 * u23 * v11 * v22 - a * u12 * u23 * v15 * v22 + a * u13 * u22 * v12 * v25 + a * u13 * u25 * v12 * v22 - a * u15 * u23 * v12 * v22 - a * u12 * u23 * v13 * v26 - a * u12 * u26 * v13 * v23 + a * u13 * u22 * v16 * v23 + a * u16 * u22 * v13 * v23 - b * u11 * u23 * v15 * v22 + b * u12 * u23 * v14 * v22 + b * u13 * u21 * v12 * v25 - b * u13 * u22 * v12 * v24 + b * u13 * u24 * v12 * v22 - b * u13 * u25 * v12 * v21 - b * u14 * u23 * v12 * v22 + b * u15 * u23 * v11 * v22 - b * u11 * u23 * v13 * v26 - b * u11 * u26 * v13 * v23 + b * u13 * u21 * v16 * v23 + b * u16 * u21 * v13 * v23 + (a * a) * u11 * u22 * v14 * v23 - (a * a) * u12 * u21 * v13 * v24 - (a * a) * u12 * u24 * v13 * v21 + (a * a) * u14 * u22 * v11 * v23 - (a * a) * u12 * u22 * v13 * v25 + (a * a) * u12 * u22 * v15 * v23 - (a * a) * u12 * u25 * v13 * v22 + (a * a) * u15 * u22 * v12 * v23 - (b * b) * u11 * u21 * v13 * v25 + (b * b) * u11 * u21 * v15 * v23 + (b * b) * u11 * u22 * v13 * v24 - (b * b) * u11 * u24 * v13 * v22 + (b * b) * u11 * u25 * v13 * v21 - (b * b) * u12 * u21 * v14 * v23 + (b * b) * u14 * u21 * v12 * v23 - (b * b) * u15 * u21 * v11 * v23 - a * b * u11 * u21 * v13 * v24 + a * b * u11 * u21 * v14 * v23 - a * b * u11 * u24 * v13 * v21 + a * b * u14 * u21 * v11 * v23 - a * b * u11 * u22 * v13 * v25 + a * b * u11 * u22 * v15 * v23 - a * b * u11 * u25 * v13 * v22 - a * b * u12 * u21 * v13 * v25 + a * b * u12 * u21 * v15 * v23 + a * b * u12 * u22 * v13 * v24 - a * b * u12 * u22 * v14 * v23 - a * b * u12 * u24 * v13 * v22 + a * b * u12 * u25 * v13 * v21 + a * b * u14 * u22 * v12 * v23 + a * b * u15 * u21 * v12 * v23 - a * b * u15 * u22 * v11 * v23) / (u13 * u23 * v11 * v22 - u13 * u23 * v12 * v21 - a * u11 * u23 * v13 * v22 + a * u12 * u23 * v13 * v21 + a * u13 * u21 * v12 * v23 - a * u13 * u22 * v11 * v23 + b * u11 * u23 * v13 * v21 - b * u13 * u21 * v11 * v23 + b * u12 * u23 * v13 * v22 - b * u13 * u22 * v12 * v23 + (a * a) * u11 * u22 * v13 * v23 - (a * a) * u12 * u21 * v13 * v23 + (b * b) * u11 * u22 * v13 * v23 - (b * b) * u12 * u21 * v13 * v23);
		
		transOut << a, -b, 0, tx,
			b, a, 0, ty,
			0, 0, 1, 0,
			0, 0, 0, 1;
		transOut = TV.inverse() * transOut * TU;
		
		// push the valid transformation to the Output
		out.push_back(transOut);
		if (verbose)
			cout << "[VERBOSE] The estimated " << iter + 1 << " solution is:" << endl
				 << transOut << endl;
	}

	return out;
}